

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_bolelli_2019.h
# Opt level: O1

void __thiscall
Spaghetti<RemSP>::PerformLabelingMem
          (Spaghetti<RemSP> *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *accesses)

{
  char cVar1;
  int iVar2;
  int iVar3;
  Mat1b *pMVar4;
  pointer puVar5;
  pointer puVar6;
  pointer puVar7;
  Spaghetti<RemSP> *pSVar8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  undefined4 *puVar13;
  long lVar14;
  char cVar15;
  int iVar16;
  int iVar17;
  undefined4 uVar18;
  pointer piVar19;
  int *piVar20;
  ulong uVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  pointer piVar25;
  ulong uVar26;
  long lVar27;
  long lVar28;
  int iVar29;
  long lVar30;
  pointer piVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  pointer piVar36;
  long lVar37;
  pointer piVar38;
  pointer piVar39;
  long lVar40;
  ulong uVar41;
  long *plVar42;
  long *plVar43;
  double dVar44;
  MemMat<int> img_labels;
  MemMat<unsigned_char> img;
  undefined1 local_330 [80];
  long *local_2e0;
  Mat local_2c8 [16];
  pointer local_2b8;
  long *local_280;
  long *local_268;
  undefined1 local_260 [80];
  long *local_210;
  Mat local_1f8 [16];
  long *local_1e8;
  long *local_1b0;
  pointer local_198;
  pointer local_190;
  pointer local_188;
  pointer local_180;
  pointer local_178;
  Spaghetti<RemSP> *local_170;
  undefined8 local_168;
  long *local_160;
  long *local_158;
  pointer local_150;
  pointer local_148;
  long local_140;
  pointer local_138;
  pointer local_130;
  long local_128;
  pointer local_120;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_118;
  Size local_110;
  undefined1 local_108 [8];
  void *pvStack_100;
  Size local_f8;
  undefined4 local_a8;
  Mat *local_a0;
  undefined8 local_98;
  Mat local_90 [96];
  
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar2 = *(int *)&pMVar4->field_0x8;
  uVar26 = (ulong)iVar2;
  iVar3 = *(int *)&pMVar4->field_0xc;
  lVar22 = (long)iVar3;
  local_118 = accesses;
  RemSP::MemAlloc(((iVar3 - (iVar3 + 1 >> 0x1f)) + 1 >> 1) *
                  ((iVar2 - (iVar2 + 1 >> 0x1f)) + 1 >> 1) + 1);
  *RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
   super__Vector_impl_data._M_start =
       *RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start + 1;
  *RemSP::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
   super__Vector_impl_data._M_start = 0;
  RemSP::length_ = 1;
  cv::Mat::Mat(local_90,&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat);
  MemMat<unsigned_char>::MemMat((MemMat<unsigned_char> *)local_260,(Mat_<unsigned_char> *)local_90);
  cv::Mat::~Mat(local_90);
  uVar41 = **(ulong **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x40;
  local_110 = (Size)(uVar41 << 0x20 | uVar41 >> 0x20);
  MemMat<int>::MemMat((MemMat<int> *)local_330,&local_110,0);
  piVar25 = RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  puVar6 = RemSP::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  plVar43 = (long *)(lVar22 + -2);
  iVar17 = (int)plVar43;
  local_268 = plVar43;
  local_170 = this;
  if (iVar2 != 1) {
    uVar12 = 0;
    piVar36 = local_168;
    if (2 < iVar3) {
      local_178 = RemSP::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      local_188 = RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
      local_160 = local_1e8 + 1;
      local_198 = (pointer)(local_260._24_8_ + 2);
      local_150 = local_2b8 + 2;
      local_148 = (pointer)(local_330._24_8_ + 8);
      uVar41 = 0;
      local_158 = local_1e8;
      local_180 = (pointer)local_260._24_8_;
      local_190 = (pointer)local_330._24_8_;
      local_168 = local_2b8;
      piVar36 = local_168;
      local_168._4_4_ = (undefined4)((ulong)local_2b8 >> 0x20);
      do {
        lVar27 = (long)(int)uVar41;
        piVar20 = (int *)((long)local_1e8 + lVar27 * 4);
        *piVar20 = *piVar20 + 1;
        if (*(char *)(local_260._24_8_ + lVar27) != '\0') goto LAB_00156c9f;
        piVar20 = (int *)((long)local_1e8 + lVar27 * 4 + *local_1b0);
        *piVar20 = *piVar20 + 1;
        if (*(char *)(local_260._24_8_ + lVar27 + *local_210) != '\0') goto LAB_00156c9f;
LAB_00156954:
        lVar27 = (long)(int)uVar41;
        piVar20 = (int *)((long)local_1e8 + lVar27 * 4 + 4);
        *piVar20 = *piVar20 + 1;
        if ((*(char *)(local_260._24_8_ + lVar27 + 1) != '\0') ||
           (piVar20 = (int *)((long)local_1e8 + lVar27 * 4 + *local_1b0 + 4),
           *piVar20 = *piVar20 + 1, *(char *)(local_260._24_8_ + lVar27 + 1 + *local_210) != '\0'))
        {
          uVar12 = RemSP::length_;
          lVar30 = (long)(int)RemSP::length_;
          piVar25[lVar30] = piVar25[lVar30] + 1;
          puVar6[lVar30] = uVar12;
          uVar12 = RemSP::length_;
          RemSP::length_ = RemSP::length_ + 1;
          local_2b8[lVar27] = local_2b8[lVar27] + 1;
          *(uint *)(local_330._24_8_ + lVar27 * 4) = uVar12;
LAB_001569d9:
          lVar27 = (long)(int)uVar41;
          uVar12 = (int)uVar41 + 2;
          uVar41 = (ulong)uVar12;
          if (iVar17 <= (int)uVar12) {
            piVar20 = (int *)((long)local_1e8 + lVar27 * 4 + 8);
            *piVar20 = *piVar20 + 1;
            cVar15 = *(char *)(local_260._24_8_ + lVar27 + 2);
            if (iVar17 < (int)uVar12) {
              if (cVar15 == '\0') {
                piVar20 = (int *)((long)local_1e8 + lVar27 * 4 + *local_1b0 + 8);
                *piVar20 = *piVar20 + 1;
                if (*(char *)(local_260._24_8_ + lVar27 + 2 + *local_210) == '\0') {
                  local_2b8[lVar27 + 2] = local_2b8[lVar27 + 2] + 1;
                  *(int *)(local_330._24_8_ + (lVar27 + 2) * 4) = 0;
                }
                else {
                  local_2b8[lVar27] = local_2b8[lVar27] + 1;
                  iVar10 = *(pointer)(local_330._24_8_ + lVar27 * 4);
                  local_2b8[lVar27 + 2] = local_2b8[lVar27 + 2] + 1;
                  *(int *)(local_330._24_8_ + (lVar27 + 2) * 4) = iVar10;
                }
              }
              else {
                local_2b8[lVar27] = local_2b8[lVar27] + 1;
                iVar10 = *(pointer)(local_330._24_8_ + lVar27 * 4);
                local_2b8[lVar27 + 2] = local_2b8[lVar27 + 2] + 1;
                *(int *)(local_330._24_8_ + (lVar27 + 2) * 4) = iVar10;
              }
            }
            else {
              if ((cVar15 == '\0') &&
                 (piVar20 = (int *)((long)local_1e8 + lVar27 * 4 + *local_1b0 + 8),
                 *piVar20 = *piVar20 + 1,
                 *(char *)(local_260._24_8_ + lVar27 + 2 + *local_210) == '\0')) goto LAB_0015717b;
LAB_00157156:
              lVar27 = (long)(int)uVar12;
              piVar20 = (int *)((long)local_1e8 + lVar27 * 4 + 4);
              *piVar20 = *piVar20 + 1;
              local_2b8[lVar27 + -2] = local_2b8[lVar27 + -2] + 1;
              iVar10 = *(pointer)(local_330._24_8_ + (lVar27 + -2) * 4);
              local_2b8[lVar27] = local_2b8[lVar27] + 1;
              *(int *)(local_330._24_8_ + lVar27 * 4) = iVar10;
            }
            goto LAB_001571da;
          }
          piVar20 = (int *)((long)local_1e8 + lVar27 * 4 + 8);
          *piVar20 = *piVar20 + 1;
          if ((*(char *)(local_260._24_8_ + lVar27 + 2) != '\0') ||
             (piVar20 = (int *)((long)local_1e8 + lVar27 * 4 + *local_1b0 + 8),
             *piVar20 = *piVar20 + 1, *(char *)(local_260._24_8_ + lVar27 + 2 + *local_210) != '\0')
             ) {
LAB_00156a1b:
            lVar27 = (long)(int)uVar41;
            piVar20 = (int *)((long)local_1e8 + lVar27 * 4 + 4);
            *piVar20 = *piVar20 + 1;
            cVar15 = *(char *)(local_260._24_8_ + lVar27 + 1);
            local_2b8[lVar27 + -2] = local_2b8[lVar27 + -2] + 1;
            iVar10 = *(pointer)(local_330._24_8_ + (lVar27 + -2) * 4);
            local_2b8[lVar27] = local_2b8[lVar27] + 1;
            *(int *)(local_330._24_8_ + lVar27 * 4) = iVar10;
            do {
              piVar19 = RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              puVar7 = RemSP::mem_P_.vec_.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start;
              iVar10 = (int)uVar41;
              if (cVar15 != '\0') goto LAB_001569d9;
              uVar12 = iVar10 + 2;
              if (iVar17 <= (int)uVar12) {
LAB_00156e6d:
                lVar27 = (long)(int)uVar12;
                piVar20 = (int *)((long)local_1e8 + lVar27 * 4);
                *piVar20 = *piVar20 + 1;
                if (iVar17 < (int)uVar12) {
                  if ((*(char *)(local_260._24_8_ + lVar27) == '\0') &&
                     (piVar20 = (int *)((long)local_1e8 + lVar27 * 4 + *local_1b0),
                     *piVar20 = *piVar20 + 1,
                     *(char *)(local_260._24_8_ + lVar27 + *local_210) == '\0')) {
                    local_2b8[lVar27] = local_2b8[lVar27] + 1;
                    *(int *)(local_330._24_8_ + lVar27 * 4) = 0;
                    goto LAB_001571da;
                  }
                }
                else {
                  if (*(char *)(local_260._24_8_ + lVar27) != '\0') {
                    piVar20 = (int *)((long)local_1e8 + (long)iVar10 * 4 + *local_1b0 + 4);
                    *piVar20 = *piVar20 + 1;
                    if (*(char *)(local_260._24_8_ + (long)iVar10 + 1 + *local_210) != '\0')
                    goto LAB_00157156;
                    goto LAB_00156f73;
                  }
                  piVar20 = (int *)((long)local_1e8 + lVar27 * 4 + *local_1b0);
                  *piVar20 = *piVar20 + 1;
                  if (*(char *)(local_260._24_8_ + lVar27 + *local_210) == '\0') goto LAB_0015717b;
                  piVar20 = (int *)((long)local_1e8 + (long)iVar10 * 4 + 0xc);
                  *piVar20 = *piVar20 + 1;
                }
                lVar30 = (long)iVar10;
                piVar20 = (int *)((long)local_1e8 + lVar30 * 4 + *local_1b0 + 4);
                *piVar20 = *piVar20 + 1;
                uVar12 = RemSP::length_;
                if (*(char *)(local_260._24_8_ + lVar30 + 1 + *local_210) == '\0') {
                  lVar30 = (long)(int)RemSP::length_;
                  RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar30] =
                       RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl
                       .super__Vector_impl_data._M_start[lVar30] + 1;
                  RemSP::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar30] = uVar12;
                  uVar12 = RemSP::length_;
                  RemSP::length_ = RemSP::length_ + 1;
                  local_2b8[lVar27] = local_2b8[lVar27] + 1;
                  *(uint *)(local_330._24_8_ + lVar27 * 4) = uVar12;
                }
                else {
                  local_2b8[lVar30] = local_2b8[lVar30] + 1;
                  iVar10 = *(pointer)(local_330._24_8_ + lVar30 * 4);
                  local_2b8[lVar27] = local_2b8[lVar27] + 1;
                  *(int *)(local_330._24_8_ + lVar27 * 4) = iVar10;
                }
                goto LAB_001571da;
              }
              lVar14 = (long)iVar10;
              lVar27 = lVar14 + 2;
              lVar35 = lVar14 << 0x20;
              lVar30 = 0;
              while (piVar20 = (int *)((long)local_160 + lVar30 * 4 + lVar14 * 4),
                    *piVar20 = *piVar20 + 1, *(char *)((long)local_198 + lVar30 + lVar14) == '\0') {
                lVar37 = *local_1b0;
                lVar40 = lVar37 + lVar14 * 4;
                piVar20 = (int *)((long)local_1e8 + lVar30 * 4 + lVar40 + 8);
                *piVar20 = *piVar20 + 1;
                lVar34 = *local_210;
                lVar24 = lVar34 + lVar14;
                if (*(char *)(local_260._24_8_ + lVar30 + 2 + lVar24) == '\0') {
                  uVar41 = (ulong)(uint)((int)lVar27 + (int)lVar30);
                  goto LAB_00156954;
                }
                piVar20 = (int *)((long)local_160 + lVar30 * 4 + lVar14 * 4 + 4);
                *piVar20 = *piVar20 + 1;
                if (*(char *)((long)local_198 + lVar30 + lVar14 + 1) != '\0') {
                  piVar20 = (int *)((long)local_1e8 + (lVar35 + 0x100000000 >> 0x1e) + lVar37);
                  *piVar20 = *piVar20 + 1;
                  uVar12 = RemSP::length_;
                  if (*(char *)(local_260._24_8_ + (lVar35 + 0x100000000 >> 0x20) + lVar34) == '\0')
                  {
                    lVar35 = (long)(int)RemSP::length_;
                    piVar25[lVar35] = piVar25[lVar35] + 1;
                    puVar6[lVar35] = uVar12;
                    uVar12 = RemSP::length_;
                    RemSP::length_ = RemSP::length_ + 1;
                    local_150[lVar14 + lVar30] = local_150[lVar14 + lVar30] + 1;
                    local_148[lVar14 + lVar30] = uVar12;
                    uVar41 = lVar27 + lVar30 & 0xffffffff;
                  }
                  else {
                    piVar20 = (int *)((long)local_2b8 + (lVar35 >> 0x1e));
                    *piVar20 = *piVar20 + 1;
                    iVar10 = *(int *)(local_330._24_8_ + (lVar35 >> 0x1e));
                    local_150[lVar14 + lVar30] = local_150[lVar14 + lVar30] + 1;
                    local_148[lVar14 + lVar30] = iVar10;
                    uVar41 = lVar27 + lVar30 & 0xffffffff;
                  }
                  goto LAB_001569d9;
                }
                piVar20 = (int *)((long)local_1e8 + lVar30 * 4 + lVar40 + 4);
                *piVar20 = *piVar20 + 1;
                uVar12 = RemSP::length_;
                if (*(char *)(local_260._24_8_ + lVar30 + 1 + lVar24) == '\0') {
                  lVar37 = (long)(int)RemSP::length_;
                  piVar19[lVar37] = piVar19[lVar37] + 1;
                  puVar7[lVar37] = uVar12;
                  uVar12 = RemSP::length_;
                  RemSP::length_ = RemSP::length_ + 1;
                }
                else {
                  local_2b8[lVar14 + lVar30] = local_2b8[lVar14 + lVar30] + 1;
                  uVar12 = *(uint *)(local_330._24_8_ + (lVar14 + lVar30) * 4);
                }
                local_2b8[lVar14 + lVar30 + 2] = local_2b8[lVar14 + lVar30 + 2] + 1;
                *(uint *)(local_330._24_8_ + (lVar14 + lVar30 + 2) * 4) = uVar12;
                lVar35 = lVar35 + 0x200000000;
                lVar37 = lVar27 + lVar30;
                lVar30 = lVar30 + 2;
                if ((long)plVar43 <= lVar37 + 2) {
                  uVar12 = iVar10 + (int)lVar30 + 2;
                  iVar10 = iVar10 + (int)lVar30;
                  goto LAB_00156e6d;
                }
              }
              piVar20 = (int *)((long)local_1e8 + (lVar35 + 0x100000000 >> 0x1e) + *local_1b0);
              *piVar20 = *piVar20 + 1;
              uVar41 = lVar27 + lVar30 & 0xffffffff;
              if (*(char *)(local_260._24_8_ + (lVar35 + 0x100000000 >> 0x20) + *local_210) != '\0')
              goto LAB_00156a1b;
LAB_00156c9f:
              lVar27 = (long)(int)uVar41;
              piVar20 = (int *)((long)local_1e8 + lVar27 * 4 + 4);
              *piVar20 = *piVar20 + 1;
              uVar12 = RemSP::length_;
              cVar15 = *(char *)(local_260._24_8_ + lVar27 + 1);
              lVar30 = (long)(int)RemSP::length_;
              piVar25[lVar30] = piVar25[lVar30] + 1;
              puVar6[lVar30] = uVar12;
              uVar12 = RemSP::length_;
              RemSP::length_ = RemSP::length_ + 1;
              local_2b8[lVar27] = local_2b8[lVar27] + 1;
              *(uint *)(local_330._24_8_ + lVar27 * 4) = uVar12;
            } while( true );
          }
          goto LAB_00156954;
        }
        local_2b8[lVar27] = local_2b8[lVar27] + 1;
        *(int *)(local_330._24_8_ + lVar27 * 4) = 0;
        uVar12 = (int)uVar41 + 2;
        uVar41 = (ulong)uVar12;
      } while ((int)uVar12 < iVar17);
    }
    local_168 = piVar36;
    lVar27 = (long)(int)uVar12;
    piVar20 = (int *)((long)local_1e8 + lVar27 * 4);
    *piVar20 = *piVar20 + 1;
    if (iVar17 < (int)uVar12) {
      if ((*(char *)(local_260._24_8_ + lVar27) == '\0') &&
         (piVar20 = (int *)((long)local_1e8 + lVar27 * 4 + *local_1b0), *piVar20 = *piVar20 + 1,
         *(char *)(local_260._24_8_ + lVar27 + *local_210) == '\0')) {
        local_2b8[lVar27] = local_2b8[lVar27] + 1;
        *(int *)(local_330._24_8_ + lVar27 * 4) = 0;
        goto LAB_001571da;
      }
    }
    else {
      if ((*(char *)(local_260._24_8_ + lVar27) != '\0') ||
         (piVar20 = (int *)((long)local_1e8 + lVar27 * 4 + *local_1b0), *piVar20 = *piVar20 + 1,
         *(char *)(local_260._24_8_ + lVar27 + *local_210) != '\0')) {
LAB_00156f73:
        lVar30 = (long)(int)uVar12;
        piVar20 = (int *)((long)local_1e8 + lVar30 * 4 + 4);
        *piVar20 = *piVar20 + 1;
        uVar12 = RemSP::length_;
        lVar27 = (long)(int)RemSP::length_;
        RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[lVar27] =
             RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[lVar27] + 1;
        RemSP::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[lVar27] = uVar12;
        uVar12 = RemSP::length_;
        RemSP::length_ = RemSP::length_ + 1;
        local_2b8[lVar30] = local_2b8[lVar30] + 1;
        *(uint *)(local_330._24_8_ + lVar30 * 4) = uVar12;
        goto LAB_001571da;
      }
LAB_0015717b:
      lVar27 = (long)(int)uVar12;
      piVar20 = (int *)((long)local_1e8 + lVar27 * 4 + 4);
      *piVar20 = *piVar20 + 1;
      if (*(char *)(local_260._24_8_ + lVar27 + 1) == '\0') {
        piVar20 = (int *)((long)local_1e8 + lVar27 * 4 + *local_1b0 + 4);
        *piVar20 = *piVar20 + 1;
        uVar12 = RemSP::length_;
        if (*(char *)(local_260._24_8_ + lVar27 + 1 + *local_210) == '\0') {
          local_2b8[lVar27] = local_2b8[lVar27] + 1;
          *(int *)(local_330._24_8_ + lVar27 * 4) = 0;
        }
        else {
          lVar30 = (long)(int)RemSP::length_;
          RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[lVar30] =
               RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[lVar30] + 1;
          RemSP::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
          .super__Vector_impl_data._M_start[lVar30] = uVar12;
          uVar12 = RemSP::length_;
          RemSP::length_ = RemSP::length_ + 1;
          local_2b8[lVar27] = local_2b8[lVar27] + 1;
          *(uint *)(local_330._24_8_ + lVar27 * 4) = uVar12;
        }
        goto LAB_001571da;
      }
    }
    uVar12 = RemSP::length_;
    lVar30 = (long)(int)RemSP::length_;
    RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start[lVar30] =
         RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_start[lVar30] + 1;
    RemSP::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start[lVar30] = uVar12;
    uVar12 = RemSP::length_;
    RemSP::length_ = RemSP::length_ + 1;
    local_2b8[lVar27] = local_2b8[lVar27] + 1;
    *(uint *)(local_330._24_8_ + lVar27 * 4) = uVar12;
LAB_001571da:
    iVar10 = iVar2 - (((uint)(uVar26 >> 0x1f) & 1) + iVar2 & 0xfffffffe);
    local_168 = (pointer)CONCAT44(local_168._4_4_,iVar10);
    uVar12 = iVar2 - iVar10;
    if (2 < (int)uVar12) {
      local_178 = (pointer)(long)iVar17;
      piVar25 = (pointer)(ulong)uVar12;
      piVar36 = (pointer)0x2;
      lVar30 = 1;
      lVar14 = 3;
      lVar27 = 0;
      local_198 = piVar25;
      do {
        if (2 < iVar3) {
          plVar42 = (long *)((long)local_1e8 + *local_1b0 * (long)piVar36);
          *(int *)plVar42 = (int)*plVar42 + 1;
          piVar31 = (pointer)0x0;
          piVar19 = (pointer)0x0;
          if ((char)*(pointer)(local_260._24_8_ + *local_210 * (long)piVar36) == '\0')
          goto LAB_0015751a;
LAB_00157318:
          lVar35 = (long)piVar36 + -1;
          piVar39 = (pointer)(long)(int)piVar19;
          piVar20 = (int *)((long)local_1e8 + (long)piVar39 * 4 + *local_1b0 * lVar35 + 4);
          *piVar20 = *piVar20 + 1;
          if (*(char *)(local_260._24_8_ + (long)piVar39 + *local_210 * lVar35 + 1) == '\0') {
            piVar20 = (int *)((long)local_1e8 + (long)piVar39 * 4 + *local_1b0 * (long)piVar36 + 4);
            *piVar20 = *piVar20 + 1;
            if (*(char *)(local_260._24_8_ + (long)piVar39 + *local_210 * (long)piVar36 + 1) == '\0'
               ) {
              piVar39 = (pointer)(long)(int)piVar19;
              piVar20 = (int *)((long)local_1e8 + (long)piVar39 * 4 + *local_1b0 * lVar35);
              *piVar20 = *piVar20 + 1;
              uVar12 = RemSP::length_;
              if (*(char *)((long)piVar39 + (long)(lVar35 * *local_210 + local_260._24_8_)) != '\0')
              goto LAB_001574bb;
              lVar35 = (long)(int)RemSP::length_;
              RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar35] =
                   RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar35] + 1;
              RemSP::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar35] = uVar12;
              uVar12 = RemSP::length_;
              RemSP::length_ = RemSP::length_ + 1;
              goto LAB_001585f3;
            }
            piVar31 = (pointer)((ulong)piVar19 & 0xffffffff);
            goto LAB_0015767e;
          }
LAB_0015e2c2:
          piVar20 = (int *)((long)local_2b8 + (long)piVar39 * 4 + *local_280 * ((long)piVar36 + -2))
          ;
          *piVar20 = *piVar20 + 1;
          uVar12 = *(uint *)(local_330._24_8_ +
                            (long)piVar39 * 4 + ((long)piVar36 + -2) * *local_2e0);
LAB_0015e2f2:
          piVar20 = (int *)((long)local_2b8 + (long)piVar39 * 4 + *local_280 * (long)piVar36);
          *piVar20 = *piVar20 + 1;
          *(uint *)(local_330._24_8_ + (long)piVar39 * 4 + *local_2e0 * (long)piVar36) = uVar12;
          iVar17 = (int)piVar19;
          uVar12 = iVar17 + 2;
          if ((int)uVar12 < (int)plVar43) {
            local_160 = (long *)((long)piVar36 + -1);
            local_158 = (long *)(long)iVar17;
            local_190 = (pointer)((long)local_158 + 2);
            lVar24 = (long)local_158 << 0x20;
            local_188 = (pointer)((long)local_1e8 +
                                 *local_1b0 * (long)piVar36 + (long)local_158 * 4 + 8);
            lVar35 = *local_210;
            lVar32 = local_260._24_8_ + (long)local_158;
            lVar37 = (long)local_158 * 4 + 8;
            lVar34 = (long)local_158 * 4 + 8;
            lVar28 = 8;
            lVar40 = 0;
            do {
              local_188[lVar40] = local_188[lVar40] + 1;
              lVar33 = lVar24 >> 0x1e;
              piVar25 = local_198;
              plVar43 = local_268;
              local_180 = piVar19;
              if (*(char *)(local_260._24_8_ + (long)(lVar35 * (long)piVar36 + (long)local_158) + 2
                           + lVar40) == '\0') {
                piVar20 = (int *)((long)local_1e8 +
                                 lVar40 * 4 + (long)local_158 * 4 + *local_1b0 * lVar14 + 8);
                *piVar20 = *piVar20 + 1;
                piVar31 = (pointer)((long)local_190 + lVar40);
                local_190 = piVar31;
                if (*(char *)(local_260._24_8_ + (long)local_158 + *local_210 * lVar14 + lVar40 + 2)
                    == '\0') goto LAB_001575fb;
                uVar41 = (ulong)piVar36 | 1;
                lVar35 = lVar24 + 0x300000000 >> 0x20;
                piVar20 = (int *)((long)local_1e8 +
                                 (lVar24 + 0x300000000 >> 0x1e) + *local_1b0 * (long)piVar36);
                *piVar20 = *piVar20 + 1;
                lVar37 = lVar24 + 0x100000000 >> 0x20;
                if (*(char *)(local_260._24_8_ + lVar35 + *local_210 * (long)piVar36) != '\0') {
                  piVar20 = (int *)((long)local_1e8 + lVar37 * 4 + *local_1b0 * (long)piVar36);
                  *piVar20 = *piVar20 + 1;
                  if (*(char *)(local_260._24_8_ + lVar37 + *local_210 * (long)piVar36) != '\0')
                  goto LAB_0015ec8d;
                  piVar20 = (int *)((long)local_1e8 + lVar37 * 4 + *local_1b0 * uVar41);
                  *piVar20 = *piVar20 + 1;
                  if (*(char *)(local_260._24_8_ + lVar37 + uVar41 * *local_210) == '\0')
                  goto LAB_0015763b;
                  piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + *local_1b0 * (long)local_160);
                  *piVar20 = *piVar20 + 1;
                  if (*(char *)(local_260._24_8_ + lVar35 + *local_210 * (long)local_160) != '\0')
                  goto LAB_0015ecce;
                  piVar20 = (int *)((long)local_1e8 +
                                   (lVar24 + 0x400000000 >> 0x1e) + *local_1b0 * (long)local_160);
                  *piVar20 = *piVar20 + 1;
                  if (*(char *)(local_260._24_8_ +
                               (lVar24 + 0x400000000 >> 0x20) + (long)local_160 * *local_210) !=
                      '\0') goto LAB_0015cf13;
                  piVar20 = (int *)((long)local_1e8 +
                                   lVar40 * 4 + (long)local_158 * 4 + *local_1b0 * lVar30 + 8);
                  *piVar20 = *piVar20 + 1;
                  piVar39 = (pointer)((long)local_158 + lVar40 + 2);
                  if (*(char *)(lVar40 + 2 +
                               (long)(*local_210 * lVar30 + local_260._24_8_) + (long)local_158) ==
                      '\0') {
                    piVar20 = (int *)((long)local_2b8 + lVar33 + *local_280 * (long)piVar36);
                    *piVar20 = *piVar20 + 1;
                    uVar12 = *(uint *)(local_330._24_8_ + lVar33 + *local_2e0 * (long)piVar36);
                    piVar20 = (int *)((long)local_2b8 +
                                     lVar28 + (long)local_158 * 4 + *local_280 * (long)piVar36);
                    goto LAB_0015a984;
                  }
                  piVar20 = (int *)((long)local_2b8 +
                                   lVar40 * 4 + (long)local_158 * 4 + *local_280 * lVar27 + 8);
                  *piVar20 = *piVar20 + 1;
                  uVar12 = *(uint *)(local_330._24_8_ +
                                    lVar40 * 4 + (long)local_158 * 4 + *local_2e0 * lVar27 + 8);
                  goto LAB_001577e7;
                }
                piVar20 = (int *)((long)local_1e8 + lVar37 * 4 + *local_1b0 * uVar41);
                *piVar20 = *piVar20 + 1;
                if (*(char *)(local_260._24_8_ + lVar37 + uVar41 * *local_210) != '\0') {
                  piVar20 = (int *)((long)local_2b8 + lVar33 + *local_280 * (long)piVar36);
                  *piVar20 = *piVar20 + 1;
                  uVar18 = *(undefined4 *)(local_330._24_8_ + lVar33 + *local_2e0 * (long)piVar36);
                  piVar20 = (int *)((long)local_2b8 +
                                   lVar40 * 4 + (long)local_158 * 4 + *local_280 * (long)piVar36 + 8
                                   );
                  *piVar20 = *piVar20 + 1;
                  *(undefined4 *)
                   (local_330._24_8_ +
                   lVar40 * 4 + (long)local_158 * 4 + *local_2e0 * (long)piVar36 + 8) = uVar18;
                  goto LAB_00158e98;
                }
                piVar20 = (int *)((long)local_1e8 + lVar37 * 4 + *local_1b0 * (long)piVar36);
                *piVar20 = *piVar20 + 1;
                uVar12 = RemSP::length_;
                if (*(char *)(local_260._24_8_ + lVar37 + *local_210 * (long)piVar36) != '\0') {
                  piVar20 = (int *)((long)local_2b8 + lVar33 + *local_280 * (long)piVar36);
                  *piVar20 = *piVar20 + 1;
                  uVar18 = *(undefined4 *)(local_330._24_8_ + lVar33 + *local_2e0 * (long)piVar36);
                  piVar20 = (int *)((long)local_2b8 +
                                   lVar40 * 4 + (long)local_158 * 4 + *local_280 * (long)piVar36 + 8
                                   );
                  *piVar20 = *piVar20 + 1;
                  *(undefined4 *)
                   (local_330._24_8_ +
                   lVar40 * 4 + (long)local_158 * 4 + *local_2e0 * (long)piVar36 + 8) = uVar18;
                  goto LAB_00158e98;
                }
                lVar35 = (long)(int)RemSP::length_;
                RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar35] =
                     RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar35] + 1;
                RemSP::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start[lVar35] = uVar12;
                uVar12 = RemSP::length_;
                RemSP::length_ = RemSP::length_ + 1;
                piVar20 = (int *)((long)local_2b8 +
                                 lVar40 * 4 + (long)local_158 * 4 + *local_280 * (long)piVar36 + 8);
                *piVar20 = *piVar20 + 1;
                *(uint *)(local_330._24_8_ +
                         lVar40 * 4 + (long)local_158 * 4 + *local_2e0 * (long)piVar36 + 8) = uVar12
                ;
                goto LAB_00158e98;
              }
              piVar20 = (int *)((long)local_1e8 +
                               lVar40 * 4 + *local_1b0 * (long)piVar36 + (long)local_158 * 4 + 4);
              *piVar20 = *piVar20 + 1;
              iVar10 = (int)local_190;
              if ((*(char *)(lVar40 + 1 + *local_210 * (long)piVar36 + lVar32) != '\0') ||
                 (piVar20 = (int *)((long)local_1e8 +
                                   lVar40 * 4 + *local_1b0 * lVar14 + (long)local_158 * 4 + 4),
                 *piVar20 = *piVar20 + 1,
                 *(char *)(lVar40 + 1 + *local_210 * lVar14 + lVar32) != '\0')) {
                piVar31 = (pointer)(ulong)(uint)(iVar10 + (int)lVar40);
                goto LAB_0015cdc3;
              }
              piVar20 = (int *)((long)local_1e8 +
                               lVar40 * 4 + *local_1b0 * lVar30 + (long)local_158 * 4 + 0xc);
              *piVar20 = *piVar20 + 1;
              if (*(char *)(lVar40 + 3 + *local_210 * lVar30 + lVar32) == '\0') {
                piVar31 = (pointer)((long)local_190 + lVar40);
                piVar20 = (int *)((long)local_1e8 +
                                 lVar40 * 4 + (long)local_158 * 4 + *local_1b0 * (long)piVar36 + 0xc
                                 );
                *piVar20 = *piVar20 + 1;
                piVar39 = (pointer)((long)local_158 + lVar40 + 2);
                local_190 = piVar31;
                if (*(char *)(local_260._24_8_ +
                             (long)local_158 + *local_210 * (long)piVar36 + lVar40 + 3) == '\0') {
                  piVar20 = (int *)((long)local_1e8 +
                                   lVar40 * 4 + (long)local_158 * 4 + *local_1b0 * lVar30 + 8);
                  *piVar20 = *piVar20 + 1;
                  if (*(char *)(lVar40 + 2 +
                               (long)(*local_210 * lVar30 + local_260._24_8_) + (long)local_158) ==
                      '\0') {
                    piVar20 = (int *)((long)local_2b8 + lVar33 + *local_280 * ((long)piVar36 + -2));
                    *piVar20 = *piVar20 + 1;
                    piVar19 = (pointer)((ulong)piVar31 & 0xffffffff);
                    uVar12 = *(uint *)(local_330._24_8_ + lVar33 + ((long)piVar36 + -2) * *local_2e0
                                      );
                    goto LAB_001585f3;
                  }
                  piVar20 = (int *)((long)local_2b8 +
                                   lVar40 * 4 + (long)local_158 * 4 + *local_280 * lVar27 + 8);
                  *piVar20 = *piVar20 + 1;
                  uVar12 = *(uint *)(local_330._24_8_ +
                                    lVar40 * 4 + (long)local_158 * 4 + *local_2e0 * lVar27 + 8);
                  piVar19 = (pointer)((ulong)piVar31 & 0xffffffff);
                  goto LAB_0015a27d;
                }
                piVar20 = (int *)((long)local_1e8 +
                                 (lVar24 + 0x400000000 >> 0x1e) + *local_1b0 * (long)local_160);
                *piVar20 = *piVar20 + 1;
                cVar15 = *(char *)(local_260._24_8_ +
                                  (lVar24 + 0x400000000 >> 0x20) + (long)local_160 * *local_210);
                piVar20 = (int *)((long)local_1e8 +
                                 lVar40 * 4 + (long)local_158 * 4 + *local_1b0 * lVar30 + 8);
                *piVar20 = *piVar20 + 1;
                cVar1 = *(char *)(lVar40 + 2 +
                                 (long)(*local_210 * lVar30 + local_260._24_8_) + (long)local_158);
                if (cVar15 == '\0') {
                  if (cVar1 == '\0') {
                    piVar20 = (int *)((long)local_2b8 + lVar33 + *local_280 * ((long)piVar36 + -2));
                    *piVar20 = *piVar20 + 1;
                    uVar12 = *(uint *)(local_330._24_8_ + lVar33 + ((long)piVar36 + -2) * *local_2e0
                                      );
                    piVar20 = (int *)((long)local_2b8 +
                                     lVar28 + (long)local_158 * 4 + *local_280 * (long)piVar36);
                    goto LAB_0015a984;
                  }
                  piVar20 = (int *)((long)local_2b8 +
                                   lVar40 * 4 + (long)local_158 * 4 + *local_280 * lVar27 + 8);
                  *piVar20 = *piVar20 + 1;
                  uVar12 = *(uint *)(local_330._24_8_ +
                                    lVar40 * 4 + (long)local_158 * 4 + *local_2e0 * lVar27 + 8);
                  goto LAB_001577e7;
                }
                if (cVar1 == '\0') goto LAB_0015f425;
LAB_001576fd:
                lVar35 = (long)piVar36 + -2;
                piVar39 = (pointer)(long)(int)piVar31;
                piVar20 = (int *)((long)local_1e8 + (long)piVar39 * 4 + *local_1b0 * lVar35 + 4);
                *piVar20 = *piVar20 + 1;
                piVar19 = piVar31;
                if (*(char *)(local_260._24_8_ + (long)piVar39 + *local_210 * lVar35 + 1) != '\0')
                goto LAB_0015b3f0;
                piVar39 = (pointer)(long)(int)piVar31;
                piVar20 = (int *)((long)local_2b8 + (long)piVar39 * 4 + *local_280 * lVar35);
                *piVar20 = *piVar20 + 1;
                uVar12 = *(uint *)(local_330._24_8_ + (long)piVar39 * 4 + *local_2e0 * lVar35);
                piVar20 = (int *)((long)local_2b8 + (long)piVar39 * 4 + *local_280 * lVar35 + 8);
                *piVar20 = *piVar20 + 1;
                uVar11 = *(uint *)(local_330._24_8_ + (long)piVar39 * 4 + lVar35 * *local_2e0 + 8);
LAB_0015dca9:
                uVar12 = RemSP::MemMerge(uVar12,uVar11);
                lVar35 = *local_280;
LAB_0015b42b:
                piVar20 = (int *)((long)local_2b8 + (long)piVar39 * 4 + lVar35 * (long)piVar36);
                piVar31 = piVar19;
LAB_0015b43b:
                *piVar20 = *piVar20 + 1;
                *(uint *)(local_330._24_8_ + (long)piVar39 * 4 + *local_2e0 * (long)piVar36) =
                     uVar12;
                iVar17 = (int)piVar31;
                uVar12 = iVar17 + 2;
                if ((int)uVar12 < (int)plVar43) {
                  piVar31 = (pointer)(long)iVar17;
                  lVar35 = (long)piVar31 + 2;
                  lVar40 = (long)piVar31 << 0x20;
                  lVar37 = (long)piVar31 * 4;
                  lVar34 = 8;
                  lVar24 = 0;
                  local_188 = piVar31;
                  while( true ) {
                    piVar20 = (int *)((long)local_1e8 +
                                     lVar24 * 4 + lVar37 + *local_1b0 * (long)piVar36 + 8);
                    *piVar20 = *piVar20 + 1;
                    lVar28 = lVar40 >> 0x1e;
                    iVar10 = (int)lVar35;
                    iVar16 = (int)lVar24;
                    piVar25 = local_198;
                    plVar43 = local_268;
                    if (*(char *)(lVar24 + 2 +
                                 (long)(*local_210 * (long)piVar36 + local_260._24_8_) +
                                 (long)piVar31) == '\0') {
                      piVar20 = (int *)((long)local_1e8 +
                                       lVar24 * 4 + lVar37 + *local_1b0 * lVar14 + 8);
                      *piVar20 = *piVar20 + 1;
                      if (*(char *)(lVar24 + 2 +
                                   (long)(*local_210 * lVar14 + local_260._24_8_) + (long)piVar31)
                          == '\0') {
                        uVar41 = lVar35 + lVar24;
                        piVar20 = (int *)((long)local_1e8 +
                                         (lVar40 + 0x300000000 >> 0x1e) + *local_1b0 * (long)piVar36
                                         );
                        *piVar20 = *piVar20 + 1;
                        lVar35 = lVar40 + 0x300000000 >> 0x20;
                        if (*(char *)(local_260._24_8_ + lVar35 + *local_210 * (long)piVar36) ==
                            '\0') {
                          piVar31 = (pointer)(uVar41 & 0xffffffff);
                          goto LAB_00157d4b;
                        }
                        lVar37 = (long)piVar36 + -1;
                        piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + *local_1b0 * lVar37);
                        *piVar20 = *piVar20 + 1;
                        piVar39 = (pointer)((long)piVar31 + lVar24 + 2);
                        if (*(char *)(local_260._24_8_ + lVar35 + *local_210 * lVar37) != '\0') {
                          piVar20 = (int *)((long)local_2b8 +
                                           lVar24 * 4 + (long)piVar31 * 4 + *local_280 * lVar27 + 8)
                          ;
                          *piVar20 = *piVar20 + 1;
                          uVar12 = *(uint *)(local_330._24_8_ +
                                            lVar24 * 4 + (long)piVar31 * 4 + *local_2e0 * lVar27 + 8
                                            );
                          piVar31 = (pointer)(uVar41 & 0xffffffff);
                          goto LAB_0015b11f;
                        }
                        piVar20 = (int *)((long)local_1e8 +
                                         (lVar40 + 0x400000000 >> 0x1e) + *local_1b0 * lVar37);
                        *piVar20 = *piVar20 + 1;
                        if (*(char *)(local_260._24_8_ +
                                     (lVar40 + 0x400000000 >> 0x20) + lVar37 * *local_210) == '\0')
                        {
                          piVar20 = (int *)((long)local_2b8 +
                                           lVar24 * 4 + (long)piVar31 * 4 + *local_280 * lVar27 + 8)
                          ;
                          *piVar20 = *piVar20 + 1;
                          uVar12 = *(uint *)(local_330._24_8_ +
                                            lVar24 * 4 + (long)piVar31 * 4 + *local_2e0 * lVar27 + 8
                                            );
                          piVar31 = (pointer)(uVar41 & 0xffffffff);
                          goto LAB_001577e7;
                        }
                        piVar31 = (pointer)(uVar41 & 0xffffffff);
                        goto LAB_001576fd;
                      }
                      piVar20 = (int *)((long)local_1e8 +
                                       lVar24 * 4 + *local_1b0 * (long)piVar36 + lVar37 + 0xc);
                      *piVar20 = *piVar20 + 1;
                      if (*(char *)(lVar24 + 3 +
                                   (long)(*local_210 * (long)piVar36 + local_260._24_8_) +
                                   (long)piVar31) == '\0') {
                        piVar20 = (int *)((long)local_2b8 + lVar28 + *local_280 * (long)piVar36);
                        *piVar20 = *piVar20 + 1;
                        uVar18 = *(undefined4 *)
                                  (local_330._24_8_ + lVar28 + *local_2e0 * (long)piVar36);
                        piVar20 = (int *)((long)local_2b8 +
                                         lVar24 * 4 +
                                         (long)piVar31 * 4 + *local_280 * (long)piVar36 + 8);
                        *piVar20 = *piVar20 + 1;
                        *(undefined4 *)
                         (local_330._24_8_ +
                         lVar24 * 4 + (long)piVar31 * 4 + *local_2e0 * (long)piVar36 + 8) = uVar18;
                        piVar31 = (pointer)(ulong)(uint)(iVar10 + iVar16);
                        goto LAB_00158e98;
                      }
                      piVar20 = (int *)((long)local_1e8 +
                                       lVar24 * 4 + lVar37 + *local_1b0 * lVar30 + 0xc);
                      *piVar20 = *piVar20 + 1;
                      if (*(char *)(lVar24 + 3 +
                                   (long)(*local_210 * lVar30 + local_260._24_8_) + (long)piVar31)
                          != '\0') {
                        piVar20 = (int *)((long)local_2b8 +
                                         lVar24 * 4 + (long)piVar31 * 4 + *local_280 * lVar27 + 8);
                        *piVar20 = *piVar20 + 1;
                        uVar12 = *(uint *)(local_330._24_8_ +
                                          lVar24 * 4 + (long)piVar31 * 4 + *local_2e0 * lVar27 + 8);
                        piVar39 = (pointer)((long)piVar31 + lVar24 + 2);
                        piVar31 = (pointer)(ulong)(uint)(iVar10 + iVar16);
                        goto LAB_0015b11f;
                      }
                    }
                    else {
                      piVar20 = (int *)((long)local_1e8 +
                                       lVar24 * 4 + lVar37 + *local_1b0 * lVar30 + 0xc);
                      *piVar20 = *piVar20 + 1;
                      if (*(char *)(lVar24 + 3 +
                                   (long)(*local_210 * lVar30 + local_260._24_8_) + (long)piVar31)
                          != '\0') {
                        piVar20 = (int *)((long)local_2b8 +
                                         lVar24 * 4 + (long)piVar31 * 4 + *local_280 * lVar27 + 8);
                        *piVar20 = *piVar20 + 1;
                        piVar19 = (pointer)(ulong)(uint)(iVar10 + iVar16);
                        uVar12 = *(uint *)(local_330._24_8_ +
                                          lVar24 * 4 + (long)piVar31 * 4 + *local_2e0 * lVar27 + 8);
                        piVar39 = (pointer)((long)piVar31 + lVar24 + 2);
                        goto LAB_0015e2f2;
                      }
                      piVar20 = (int *)((long)local_1e8 +
                                       lVar24 * 4 + lVar37 + *local_1b0 * (long)piVar36 + 0xc);
                      *piVar20 = *piVar20 + 1;
                      if (*(char *)(lVar24 + 3 +
                                   (long)(*local_210 * (long)piVar36 + local_260._24_8_) +
                                   (long)piVar31) == '\0') {
                        piVar20 = (int *)((long)local_2b8 + lVar28 + *local_280 * (long)piVar36);
                        *piVar20 = *piVar20 + 1;
                        uVar12 = *(uint *)(local_330._24_8_ + lVar28 + *local_2e0 * (long)piVar36);
                        piVar39 = (pointer)((long)piVar31 + lVar24 + 2);
                        piVar20 = (int *)((long)local_2b8 +
                                         lVar34 + (long)piVar31 * 4 + *local_280 * (long)piVar36);
                        piVar31 = (pointer)(ulong)(uint)(iVar10 + iVar16);
                        goto LAB_0015d070;
                      }
                    }
                    piVar20 = (int *)((long)local_1e8 +
                                     lVar24 * 4 + lVar37 + *local_1b0 * lVar30 + 0x10);
                    *piVar20 = *piVar20 + 1;
                    if (*(char *)(lVar24 + 4 +
                                 (long)(*local_210 * lVar30 + local_260._24_8_) + (long)piVar31) ==
                        '\0') break;
                    piVar20 = (int *)((long)local_1e8 +
                                     lVar24 * 4 + lVar37 + *local_1b0 * lVar27 + 0xc);
                    *piVar20 = *piVar20 + 1;
                    if (*(char *)(lVar24 + 3 +
                                 (long)(*local_210 * lVar27 + local_260._24_8_) + (long)piVar31) ==
                        '\0') {
                      piVar20 = (int *)((long)local_2b8 +
                                       lVar24 * 4 + lVar37 + *local_280 * lVar27 + 0x10);
                      *piVar20 = *piVar20 + 1;
                      uVar12 = *(uint *)(local_330._24_8_ +
                                        lVar24 * 4 + lVar37 + *local_2e0 * lVar27 + 0x10);
                      piVar20 = (int *)((long)local_2b8 +
                                       lVar24 * 4 + lVar37 + *local_280 * (long)piVar36);
                      *piVar20 = *piVar20 + 1;
                      uVar12 = RemSP::MemMerge(uVar12,*(uint *)(local_330._24_8_ +
                                                               lVar24 * 4 +
                                                               lVar37 + *local_2e0 * (long)piVar36))
                      ;
                      piVar31 = local_188;
                    }
                    else {
                      piVar20 = (int *)((long)local_2b8 +
                                       lVar24 * 4 + lVar37 + *local_280 * lVar27 + 0x10);
                      *piVar20 = *piVar20 + 1;
                      uVar12 = *(uint *)(local_330._24_8_ +
                                        lVar24 * 4 + lVar37 + *local_2e0 * lVar27 + 0x10);
                    }
                    piVar20 = (int *)((long)local_2b8 +
                                     lVar24 * 4 + lVar37 + *local_280 * (long)piVar36 + 8);
                    *piVar20 = *piVar20 + 1;
                    *(uint *)(local_330._24_8_ +
                             lVar24 * 4 + lVar37 + *local_2e0 * (long)piVar36 + 8) = uVar12;
                    lVar40 = lVar40 + 0x200000000;
                    lVar28 = lVar24 + 4;
                    lVar24 = lVar24 + 2;
                    lVar34 = lVar34 + 8;
                    if ((long)local_178 <= (long)piVar31 + lVar28) {
                      iVar17 = iVar17 + (int)lVar24;
                      uVar12 = iVar10 + (int)lVar24;
                      piVar25 = local_198;
                      plVar43 = local_268;
                      goto LAB_0015b82a;
                    }
                  }
                  piVar20 = (int *)((long)local_2b8 + lVar28 + *local_280 * (long)piVar36);
                  *piVar20 = *piVar20 + 1;
                  uVar12 = *(uint *)(local_330._24_8_ + lVar28 + *local_2e0 * (long)piVar36);
                  piVar39 = (pointer)((long)piVar31 + lVar24 + 2);
                  piVar20 = (int *)((long)local_2b8 +
                                   lVar34 + (long)piVar31 * 4 + *local_280 * (long)piVar36);
                  local_190 = (pointer)(ulong)(uint)(iVar10 + iVar16);
LAB_0015bdae:
                  piVar19 = local_198;
                  plVar42 = local_268;
                  *piVar20 = *piVar20 + 1;
                  *(uint *)(local_330._24_8_ + (long)piVar39 * 4 + *local_2e0 * (long)piVar36) =
                       uVar12;
                  iVar17 = (int)local_190;
                  uVar12 = iVar17 + 2;
                  piVar31 = local_190;
                  if ((int)uVar12 < (int)plVar43) {
                    local_150 = (pointer)((long)piVar36 - 1);
                    piVar31 = (pointer)(long)iVar17;
                    lVar35 = (long)piVar31 + 2;
                    lVar34 = (long)piVar31 << 0x20;
                    lVar37 = (long)piVar31 * 4;
                    local_160 = (long *)((long)local_1e8 + (long)piVar31 * 4 + 0x10);
                    local_188 = (pointer)((long)local_1e8 +
                                         *local_1b0 * (long)piVar36 + (long)piVar31 * 4 + 8);
                    local_158 = (long *)((long)(*local_210 * (long)piVar36 + (long)piVar31) +
                                         local_260._24_8_ + 2);
                    lVar24 = local_260._24_8_ + (long)piVar31;
                    lVar28 = 8;
                    lVar40 = 0;
                    do {
                      local_188[lVar40] = local_188[lVar40] + 1;
                      lVar32 = lVar34 >> 0x1e;
                      iVar16 = (int)lVar35;
                      iVar10 = (int)lVar40;
                      lVar33 = lVar34 >> 0x20;
                      piVar25 = local_198;
                      plVar43 = local_268;
                      local_180 = piVar31;
                      if (*(char *)((long)local_158 + lVar40) == '\0') {
                        piVar20 = (int *)((long)local_1e8 +
                                         lVar40 * 4 + *local_1b0 * lVar14 + (long)piVar31 * 4 + 8);
                        *piVar20 = *piVar20 + 1;
                        if (*(char *)(lVar40 + 2 + *local_210 * lVar14 + lVar24) == '\0') {
                          piVar31 = (pointer)(ulong)(uint)(iVar16 + iVar10);
                          goto LAB_0015b066;
                        }
                        piVar20 = (int *)((long)local_1e8 +
                                         lVar40 * 4 +
                                         *local_1b0 * (long)piVar36 + (long)piVar31 * 4 + 0xc);
                        *piVar20 = *piVar20 + 1;
                        if (*(char *)(lVar40 + 3 + *local_210 * (long)piVar36 + lVar24) == '\0') {
                          piVar20 = (int *)((long)local_2b8 + lVar32 + *local_280 * (long)piVar36);
                          *piVar20 = *piVar20 + 1;
                          uVar18 = *(undefined4 *)
                                    (local_330._24_8_ + lVar32 + *local_2e0 * (long)piVar36);
                          piVar20 = (int *)((long)local_2b8 +
                                           lVar40 * 4 +
                                           (long)piVar31 * 4 + *local_280 * (long)piVar36 + 8);
                          *piVar20 = *piVar20 + 1;
                          *(undefined4 *)
                           (local_330._24_8_ +
                           lVar40 * 4 + (long)piVar31 * 4 + *local_2e0 * (long)piVar36 + 8) = uVar18
                          ;
                          piVar31 = (pointer)(ulong)(uint)(iVar16 + iVar10);
                          goto LAB_00158e98;
                        }
                        piVar20 = (int *)((long)local_1e8 +
                                         lVar40 * 4 + *local_1b0 * lVar30 + (long)piVar31 * 4 + 0xc)
                        ;
                        *piVar20 = *piVar20 + 1;
                        if (*(char *)(lVar40 + 3 + *local_210 * lVar30 + lVar24) != '\0') {
                          piVar20 = (int *)((long)local_1e8 +
                                           lVar40 * 4 + (long)piVar31 * 4 + *local_1b0 * lVar27 + 8)
                          ;
                          *piVar20 = *piVar20 + 1;
                          piVar39 = (pointer)((long)piVar31 + lVar40 + 2);
                          if (*(char *)(local_260._24_8_ +
                                       (long)piVar31 + *local_210 * lVar27 + lVar40 + 2) == '\0') {
                            piVar20 = (int *)((long)local_2b8 +
                                             lVar40 * 4 +
                                             (long)piVar31 * 4 + *local_280 * lVar27 + 8);
                            *piVar20 = *piVar20 + 1;
                            uVar12 = *(uint *)(local_330._24_8_ +
                                              lVar40 * 4 +
                                              (long)piVar31 * 4 + *local_2e0 * lVar27 + 8);
                            piVar20 = (int *)((long)local_2b8 + lVar32 + *local_280 * (long)piVar36)
                            ;
                            *piVar20 = *piVar20 + 1;
                            uVar12 = RemSP::MemMerge(uVar12,*(uint *)(local_330._24_8_ +
                                                                     lVar32 + *local_2e0 *
                                                                              (long)piVar36));
                            piVar19 = local_198;
                            plVar42 = local_268;
                          }
                          else {
                            piVar20 = (int *)((long)local_1e8 +
                                             lVar32 + *local_1b0 * (long)local_150);
                            *piVar20 = *piVar20 + 1;
                            piVar38 = (pointer)(lVar35 + lVar40);
                            if (*(char *)(local_260._24_8_ + lVar33 + *local_210 * (long)local_150)
                                != '\0') goto LAB_0015c8db;
                            piVar20 = (int *)((long)local_2b8 +
                                             lVar40 * 4 +
                                             (long)piVar31 * 4 + *local_280 * lVar27 + 8);
                            *piVar20 = *piVar20 + 1;
                            uVar12 = *(uint *)(local_330._24_8_ +
                                              lVar40 * 4 +
                                              (long)piVar31 * 4 + *local_2e0 * lVar27 + 8);
                            piVar20 = (int *)((long)local_2b8 +
                                             lVar33 * 4 + *local_280 * (long)piVar36);
                            *piVar20 = *piVar20 + 1;
                            uVar12 = RemSP::MemMerge(uVar12,*(uint *)(local_330._24_8_ +
                                                                     lVar33 * 4 +
                                                                     *local_2e0 * (long)piVar36));
                          }
                          piVar31 = (pointer)((ulong)(lVar35 + lVar40) & 0xffffffff);
                          piVar25 = piVar19;
                          plVar43 = plVar42;
                          goto LAB_0015b11f;
                        }
                      }
                      else {
                        piVar20 = (int *)((long)local_1e8 +
                                         lVar40 * 4 + *local_1b0 * lVar30 + (long)piVar31 * 4 + 0xc)
                        ;
                        *piVar20 = *piVar20 + 1;
                        if (*(char *)(lVar40 + 3 + *local_210 * lVar30 + lVar24) != '\0') {
                          piVar19 = (pointer)(lVar35 + lVar40);
                          piVar20 = (int *)((long)local_1e8 +
                                           lVar40 * 4 + (long)piVar31 * 4 + *local_1b0 * lVar27 + 8)
                          ;
                          *piVar20 = *piVar20 + 1;
                          piVar39 = (pointer)((long)piVar31 + lVar40 + 2);
                          if (*(char *)(local_260._24_8_ +
                                       (long)piVar31 + *local_210 * lVar27 + lVar40 + 2) == '\0') {
                            piVar20 = (int *)((long)local_2b8 +
                                             lVar40 * 4 +
                                             (long)piVar31 * 4 + *local_280 * lVar27 + 8);
                            *piVar20 = *piVar20 + 1;
                            uVar12 = *(uint *)(local_330._24_8_ +
                                              lVar40 * 4 +
                                              (long)piVar31 * 4 + *local_2e0 * lVar27 + 8);
                            piVar20 = (int *)((long)local_2b8 + lVar32 + *local_280 * (long)piVar36)
                            ;
                            *piVar20 = *piVar20 + 1;
                            uVar12 = RemSP::MemMerge(uVar12,*(uint *)(local_330._24_8_ +
                                                                     lVar32 + *local_2e0 *
                                                                              (long)piVar36));
                            piVar25 = local_198;
                            plVar43 = local_268;
                          }
                          else {
                            piVar20 = (int *)((long)local_1e8 +
                                             lVar32 + *local_1b0 * (long)local_150);
                            *piVar20 = *piVar20 + 1;
                            if (*(char *)(local_260._24_8_ + lVar33 + *local_210 * (long)local_150)
                                != '\0') goto LAB_001578f2;
                            piVar20 = (int *)((long)local_2b8 +
                                             lVar40 * 4 +
                                             (long)piVar31 * 4 + *local_280 * lVar27 + 8);
                            *piVar20 = *piVar20 + 1;
                            uVar12 = *(uint *)(local_330._24_8_ +
                                              lVar40 * 4 +
                                              (long)piVar31 * 4 + *local_2e0 * lVar27 + 8);
                            piVar20 = (int *)((long)local_2b8 +
                                             lVar33 * 4 + *local_280 * (long)piVar36);
                            *piVar20 = *piVar20 + 1;
                            uVar12 = RemSP::MemMerge(uVar12,*(uint *)(local_330._24_8_ +
                                                                     lVar33 * 4 +
                                                                     *local_2e0 * (long)piVar36));
                            plVar43 = plVar42;
                          }
                          goto LAB_0015e2f2;
                        }
                        piVar20 = (int *)((long)local_1e8 +
                                         lVar40 * 4 +
                                         *local_1b0 * (long)piVar36 + (long)piVar31 * 4 + 0xc);
                        *piVar20 = *piVar20 + 1;
                        if (*(char *)(lVar40 + 3 + *local_210 * (long)piVar36 + lVar24) == '\0')
                        goto LAB_0015c5b0;
                      }
                      piVar20 = (int *)((long)local_160 + lVar40 * 4 + *local_1b0 * lVar30);
                      *piVar20 = *piVar20 + 1;
                      if (*(char *)(lVar40 + 4 + *local_210 * lVar30 + lVar24) != '\0') {
                        piVar39 = (pointer)(lVar35 + lVar40);
                        piVar20 = (int *)((long)local_1e8 +
                                         (lVar34 + 0x300000000 >> 0x1e) +
                                         *local_1b0 * ((long)piVar36 + -2));
                        *piVar20 = *piVar20 + 1;
                        local_188 = (pointer)((long)piVar31 + lVar40 + 2);
                        if (*(char *)(local_260._24_8_ +
                                     (lVar34 + 0x300000000 >> 0x20) +
                                     ((long)piVar36 + -2) * *local_210) == '\0') {
                          piVar20 = (int *)((long)local_2b8 +
                                           lVar40 * 4 +
                                           (long)piVar31 * 4 + *local_280 * lVar27 + 0x10);
                          *piVar20 = *piVar20 + 1;
                          uVar12 = *(uint *)(local_330._24_8_ +
                                            lVar40 * 4 +
                                            (long)piVar31 * 4 + *local_2e0 * lVar27 + 0x10);
                          piVar20 = (int *)((long)local_2b8 + lVar32 + *local_280 * (long)piVar36);
                          *piVar20 = *piVar20 + 1;
                          uVar12 = RemSP::MemMerge(uVar12,*(uint *)(local_330._24_8_ +
                                                                   lVar32 + *local_2e0 *
                                                                            (long)piVar36));
                          lVar35 = (long)local_2b8 + (long)piVar31 * 4 + *local_280 * (long)piVar36;
                          piVar25 = local_198;
                        }
                        else {
                          piVar20 = (int *)((long)local_1e8 +
                                           lVar40 * 4 + (long)piVar31 * 4 + *local_1b0 * lVar27 + 8)
                          ;
                          *piVar20 = *piVar20 + 1;
                          if (*(char *)(lVar40 + 2 +
                                       (long)(*local_210 * lVar27 + local_260._24_8_) +
                                       (long)piVar31) == '\0') {
                            piVar20 = (int *)((long)local_2b8 +
                                             lVar40 * 4 +
                                             (long)piVar31 * 4 + *local_280 * lVar27 + 0x10);
                            *piVar20 = *piVar20 + 1;
                            uVar12 = *(uint *)(local_330._24_8_ +
                                              lVar40 * 4 +
                                              (long)piVar31 * 4 + *local_2e0 * lVar27 + 0x10);
                            piVar20 = (int *)((long)local_2b8 + lVar32 + *local_280 * (long)piVar36)
                            ;
                            *piVar20 = *piVar20 + 1;
                            uVar11 = *(uint *)(local_330._24_8_ +
                                              lVar32 + *local_2e0 * (long)piVar36);
                          }
                          else {
                            piVar20 = (int *)((long)local_1e8 +
                                             lVar32 + *local_1b0 * (long)local_150);
                            *piVar20 = *piVar20 + 1;
                            if (*(char *)(local_260._24_8_ + lVar33 + (long)local_150 * *local_210)
                                != '\0') goto LAB_0015c43c;
                            piVar20 = (int *)((long)local_2b8 +
                                             lVar40 * 4 +
                                             (long)piVar31 * 4 + *local_280 * lVar27 + 0x10);
                            *piVar20 = *piVar20 + 1;
                            uVar12 = *(uint *)(local_330._24_8_ +
                                              lVar40 * 4 +
                                              (long)piVar31 * 4 + *local_2e0 * lVar27 + 0x10);
                            piVar20 = (int *)((long)local_2b8 +
                                             lVar33 * 4 + *local_280 * (long)piVar36);
                            *piVar20 = *piVar20 + 1;
                            uVar11 = *(uint *)(local_330._24_8_ +
                                              lVar33 * 4 + *local_2e0 * (long)piVar36);
                          }
                          uVar12 = RemSP::MemMerge(uVar12,uVar11);
                          lVar35 = (long)local_2b8 + (long)piVar31 * 4 + *local_280 * (long)piVar36;
                        }
                        piVar31 = (pointer)((ulong)piVar39 & 0xffffffff);
                        piVar20 = (int *)(lVar35 + lVar28);
                        piVar39 = local_188;
                        plVar43 = local_268;
                        goto LAB_0015b43b;
                      }
                      piVar20 = (int *)((long)local_2b8 +
                                       lVar40 * 4 + *local_280 * (long)piVar36 + lVar37);
                      *piVar20 = *piVar20 + 1;
                      uVar18 = *(undefined4 *)
                                (local_330._24_8_ + lVar40 * 4 + *local_2e0 * (long)piVar36 + lVar37
                                );
                      piVar20 = (int *)((long)local_2b8 +
                                       lVar40 * 4 + *local_280 * (long)piVar36 + lVar37 + 8);
                      *piVar20 = *piVar20 + 1;
                      *(undefined4 *)
                       (local_330._24_8_ + lVar40 * 4 + *local_2e0 * (long)piVar36 + lVar37 + 8) =
                           uVar18;
                      lVar34 = lVar34 + 0x200000000;
                      lVar32 = lVar40 + 4;
                      lVar40 = lVar40 + 2;
                      lVar28 = lVar28 + 8;
                      if ((long)local_178 <= (long)piVar31 + lVar32) {
                        piVar31 = (pointer)(ulong)(uint)(iVar17 + (int)lVar40);
                        uVar12 = iVar16 + (int)lVar40;
                        break;
                      }
                    } while( true );
                  }
                  piVar39 = (pointer)(ulong)uVar12;
                  if ((int)plVar43 < (int)uVar12) goto LAB_0015c07b;
                  piVar38 = (pointer)(long)(int)uVar12;
                  piVar20 = (int *)((long)local_1e8 + (long)piVar38 * 4 + *local_1b0 * (long)piVar36
                                   );
                  *piVar20 = *piVar20 + 1;
                  lVar35 = (long)(int)piVar31;
                  if (*(char *)((long)piVar38 +
                               (long)(*local_210 * (long)piVar36 + local_260._24_8_)) == '\0') {
                    piVar20 = (int *)((long)local_1e8 +
                                     (long)piVar38 * 4 + *local_1b0 * ((ulong)piVar36 | 1));
                    *piVar20 = *piVar20 + 1;
                    if (*(char *)((long)piVar38 +
                                 (long)(((ulong)piVar36 | 1) * *local_210 + local_260._24_8_)) ==
                        '\0') {
LAB_0015c721:
                      uVar12 = (uint)piVar39;
                      piVar38 = (pointer)(long)(int)uVar12;
                      piVar20 = (int *)((long)local_1e8 +
                                       (long)piVar38 * 4 + *local_1b0 * (long)piVar36 + 4);
                      *piVar20 = *piVar20 + 1;
                      if (*(char *)(local_260._24_8_ +
                                   (long)piVar38 + *local_210 * (long)piVar36 + 1) == '\0')
                      goto LAB_001580ce;
                      piVar20 = (int *)((long)local_1e8 +
                                       (long)piVar38 * 4 + *local_1b0 * ((long)piVar36 + -1) + 4);
                      *piVar20 = *piVar20 + 1;
                      uVar11 = RemSP::length_;
                      if (*(char *)(local_260._24_8_ +
                                   (long)piVar38 + ((long)piVar36 + -1) * *local_210 + 1) == '\0') {
                        lVar35 = (long)(int)RemSP::length_;
                        RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_start[lVar35] =
                             RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_start[lVar35] + 1;
                        RemSP::mem_P_.vec_.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar35] = uVar11;
                        piVar19 = (pointer)(*local_280 * (long)piVar36 + (long)local_2b8);
                        piVar38 = (pointer)(long)(int)uVar12;
                        uVar11 = RemSP::length_;
                        RemSP::length_ = RemSP::length_ + 1;
                        goto LAB_0015f01b;
                      }
                      piVar20 = (int *)((long)local_2b8 +
                                       (long)piVar38 * 4 + *local_280 * ((long)piVar36 + -2));
                      *piVar20 = *piVar20 + 1;
                      uVar11 = *(uint *)(local_330._24_8_ +
                                        (long)piVar38 * 4 + ((long)piVar36 + -2) * *local_2e0);
                      piVar20 = (int *)((long)local_2b8 +
                                       (long)piVar38 * 4 + *local_280 * (long)piVar36);
                      *piVar20 = *piVar20 + 1;
                      lVar35 = *local_2e0;
                      goto LAB_0015f02f;
                    }
                    piVar20 = (int *)((long)local_1e8 +
                                     lVar35 * 4 + *local_1b0 * (long)piVar36 + 0xc);
                    *piVar20 = *piVar20 + 1;
                    if (*(char *)(local_260._24_8_ + lVar35 + 3 + *local_210 * (long)piVar36) !=
                        '\0') goto LAB_0015c14a;
                  }
                  else {
LAB_0015c14a:
                    piVar20 = (int *)((long)local_1e8 +
                                     lVar35 * 4 + *local_1b0 * ((long)piVar36 + -1) + 0xc);
                    *piVar20 = *piVar20 + 1;
                    if (*(char *)(local_260._24_8_ + lVar35 + 3 + ((long)piVar36 + -1) * *local_210)
                        != '\0') {
                      lVar37 = (long)piVar36 + -2;
                      piVar20 = (int *)((long)local_1e8 + (long)piVar38 * 4 + *local_1b0 * lVar37);
                      *piVar20 = *piVar20 + 1;
                      if (*(char *)((long)piVar38 + (long)(*local_210 * lVar37 + local_260._24_8_))
                          == '\0') {
                        piVar20 = (int *)((long)local_2b8 + (long)piVar38 * 4 + *local_280 * lVar37)
                        ;
                        *piVar20 = *piVar20 + 1;
                        uVar11 = *(uint *)(local_330._24_8_ +
                                          (long)piVar38 * 4 + lVar37 * *local_2e0);
                        piVar20 = (int *)((long)local_2b8 + lVar35 * 4 + *local_280 * (long)piVar36)
                        ;
                        *piVar20 = *piVar20 + 1;
                        uVar12 = *(uint *)(local_330._24_8_ +
                                          lVar35 * 4 + *local_2e0 * (long)piVar36);
                      }
                      else {
LAB_0015d68e:
                        piVar38 = (pointer)(long)(int)piVar39;
                        piVar20 = (int *)((long)local_1e8 +
                                         (long)piVar38 * 4 + *local_1b0 * ((long)piVar36 + -1) + -8)
                        ;
                        *piVar20 = *piVar20 + 1;
                        if (*(char *)(local_260._24_8_ +
                                     (long)piVar38 + ((long)piVar36 + -1) * *local_210 + -2) != '\0'
                           ) {
LAB_0015d6cf:
                          lVar35 = (long)piVar36 + -2;
                          piVar38 = (pointer)(long)(int)piVar39;
                          piVar20 = (int *)((long)local_1e8 +
                                           (long)piVar38 * 4 + *local_1b0 * lVar35 + -4);
                          *piVar20 = *piVar20 + 1;
                          if (*(char *)(local_260._24_8_ + (long)piVar38 + *local_210 * lVar35 + -1)
                              == '\0') {
                            piVar20 = (int *)((long)local_2b8 +
                                             (long)piVar38 * 4 + *local_280 * lVar35);
                            *piVar20 = *piVar20 + 1;
                            uVar12 = *(uint *)(local_330._24_8_ +
                                              (long)piVar38 * 4 + lVar35 * *local_2e0);
                            piVar20 = (int *)((long)local_2b8 +
                                             (long)piVar38 * 4 + *local_280 * (long)piVar36 + -8);
                            *piVar20 = *piVar20 + 1;
                            uVar11 = RemSP::MemMerge(uVar12,*(uint *)(local_330._24_8_ +
                                                                     (long)piVar38 * 4 +
                                                                     *local_2e0 * (long)piVar36 + -8
                                                                     ));
                            piVar20 = (int *)((long)local_2b8 +
                                             (long)piVar38 * 4 + *local_280 * (long)piVar36);
                            *piVar20 = *piVar20 + 1;
                          }
                          else {
                            piVar20 = (int *)((long)local_2b8 +
                                             (long)piVar38 * 4 + *local_280 * lVar35);
                            *piVar20 = *piVar20 + 1;
                            uVar11 = *(uint *)(local_330._24_8_ +
                                              (long)piVar38 * 4 + lVar35 * *local_2e0);
                            piVar20 = (int *)((long)local_2b8 +
                                             (long)piVar38 * 4 + *local_280 * (long)piVar36);
                            *piVar20 = *piVar20 + 1;
                          }
LAB_0015d7fa:
                          lVar35 = *local_2e0;
                          goto LAB_0015f02f;
                        }
                        piVar20 = (int *)((long)local_2b8 +
                                         (long)piVar38 * 4 + *local_280 * ((long)piVar36 + -2));
                        *piVar20 = *piVar20 + 1;
                        uVar11 = *(uint *)(local_330._24_8_ +
                                          (long)piVar38 * 4 + ((long)piVar36 + -2) * *local_2e0);
                        piVar20 = (int *)((long)local_2b8 +
                                         (long)piVar38 * 4 + *local_280 * (long)piVar36 + -8);
                        *piVar20 = *piVar20 + 1;
                        uVar12 = *(uint *)(local_330._24_8_ +
                                          (long)piVar38 * 4 + *local_2e0 * (long)piVar36 + -8);
                      }
                      uVar11 = RemSP::MemMerge(uVar11,uVar12);
                      piVar20 = (int *)((long)local_2b8 +
                                       (long)piVar38 * 4 + *local_280 * (long)piVar36);
                      *piVar20 = *piVar20 + 1;
                      lVar35 = *local_2e0;
                      goto LAB_0015f02f;
                    }
                  }
                  piVar20 = (int *)((long)local_2b8 + lVar35 * 4 + *local_280 * (long)piVar36);
                  *piVar20 = *piVar20 + 1;
                  uVar11 = *(uint *)(local_330._24_8_ + lVar35 * 4 + *local_2e0 * (long)piVar36);
                  piVar20 = (int *)((long)local_2b8 + (long)piVar38 * 4 + *local_280 * (long)piVar36
                                   );
                  *piVar20 = *piVar20 + 1;
                  lVar35 = *local_2e0;
                  goto LAB_0015f02f;
                }
LAB_0015b82a:
                piVar39 = (pointer)(ulong)uVar12;
                if ((int)plVar43 < (int)uVar12) {
LAB_0015c07b:
                  piVar31 = (pointer)((ulong)piVar39 & 0xffffffff);
                  piVar38 = (pointer)(long)(int)piVar39;
                  piVar20 = (int *)((long)local_1e8 + (long)piVar38 * 4 + *local_1b0 * (long)piVar36
                                   );
                  *piVar20 = *piVar20 + 1;
                  if (*(char *)((long)piVar38 +
                               (long)(*local_210 * (long)piVar36 + local_260._24_8_)) != '\0')
                  goto LAB_0015ea2f;
LAB_0015c0bf:
                  piVar38 = (pointer)(long)(int)piVar31;
                  piVar20 = (int *)((long)local_1e8 +
                                   (long)piVar38 * 4 + *local_1b0 * ((ulong)piVar36 | 1));
                  *piVar20 = *piVar20 + 1;
                  if (*(char *)((long)piVar38 +
                               (long)(((ulong)piVar36 | 1) * *local_210 + local_260._24_8_)) == '\0'
                     ) goto LAB_0015e87f;
                  goto LAB_0015ea2f;
                }
                piVar38 = (pointer)(long)(int)uVar12;
                piVar20 = (int *)((long)local_1e8 + (long)piVar38 * 4 + *local_1b0 * (long)piVar36);
                *piVar20 = *piVar20 + 1;
                lVar35 = (long)iVar17;
                if (*(char *)((long)piVar38 + (long)(*local_210 * (long)piVar36 + local_260._24_8_))
                    == '\0') {
                  piVar20 = (int *)((long)local_1e8 +
                                   (long)piVar38 * 4 + *local_1b0 * ((ulong)piVar36 | 1));
                  *piVar20 = *piVar20 + 1;
                  cVar15 = *(char *)((long)piVar38 +
                                    (long)(((ulong)piVar36 | 1) * *local_210 + local_260._24_8_));
                  piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + *local_1b0 * (long)piVar36 + 0xc)
                  ;
                  *piVar20 = *piVar20 + 1;
                  cVar1 = *(char *)(local_260._24_8_ + lVar35 + 3 + *local_210 * (long)piVar36);
                  if (cVar15 == '\0') {
                    if (cVar1 == '\0') goto LAB_001580ce;
                    goto LAB_0015efd4;
                  }
                  if (cVar1 == '\0') goto LAB_0015e61b;
                }
                piVar20 = (int *)((long)local_1e8 +
                                 lVar35 * 4 + *local_1b0 * ((long)piVar36 + -1) + 0xc);
                *piVar20 = *piVar20 + 1;
                cVar15 = *(char *)(local_260._24_8_ + lVar35 + 3 + ((long)piVar36 + -1) * *local_210
                                  );
                goto joined_r0x0015b8af;
              }
              piVar20 = (int *)((long)local_1e8 +
                               lVar40 * 4 + *local_1b0 * lVar30 + (long)local_158 * 4 + 8);
              *piVar20 = *piVar20 + 1;
              if (*(char *)(lVar40 + 2 + *local_210 * lVar30 + lVar32) == '\0') goto LAB_0015ee8c;
              piVar20 = (int *)((long)local_2b8 + lVar40 * 4 + *local_280 * lVar27 + lVar34);
              *piVar20 = *piVar20 + 1;
              uVar18 = *(undefined4 *)(local_330._24_8_ + lVar40 * 4 + *local_2e0 * lVar27 + lVar37)
              ;
              piVar20 = (int *)((long)local_2b8 + lVar40 * 4 + *local_280 * (long)piVar36 + lVar34);
              *piVar20 = *piVar20 + 1;
              *(undefined4 *)(local_330._24_8_ + lVar40 * 4 + *local_2e0 * (long)piVar36 + lVar37) =
                   uVar18;
              lVar24 = lVar24 + 0x200000000;
              lVar33 = lVar40 + 4;
              lVar40 = lVar40 + 2;
              lVar28 = lVar28 + 8;
              if ((long)local_178 <= (long)local_158 + lVar33) {
                piVar19 = (pointer)(ulong)(uint)(iVar17 + (int)lVar40);
                uVar12 = iVar10 + (int)lVar40;
                break;
              }
            } while( true );
          }
          piVar31 = (pointer)(ulong)uVar12;
          piVar38 = (pointer)(long)(int)uVar12;
          piVar20 = (int *)((long)local_1e8 + (long)piVar38 * 4 + *local_1b0 * (long)piVar36);
          *piVar20 = *piVar20 + 1;
          cVar15 = *(char *)((long)piVar38 + (long)(*local_210 * (long)piVar36 + local_260._24_8_));
          lVar37 = *local_1b0;
          iVar17 = (int)piVar19;
          if ((int)uVar12 <= (int)plVar43) {
            if (cVar15 != '\0') {
              lVar35 = (long)iVar17;
              piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + lVar37 * (long)piVar36 + 4);
              *piVar20 = *piVar20 + 1;
              if ((*(char *)(local_260._24_8_ + lVar35 + 1 + *local_210 * (long)piVar36) == '\0') &&
                 (piVar20 = (int *)((long)local_1e8 +
                                   lVar35 * 4 + *local_1b0 * ((ulong)piVar36 | 1) + 4),
                 *piVar20 = *piVar20 + 1,
                 *(char *)(local_260._24_8_ + lVar35 + 1 + ((ulong)piVar36 | 1) * *local_210) ==
                 '\0')) {
                lVar37 = (long)piVar36 + -1;
                piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + *local_1b0 * lVar37 + 0xc);
                *piVar20 = *piVar20 + 1;
                if (*(char *)(local_260._24_8_ + lVar35 + 3 + *local_210 * lVar37) == '\0')
                goto LAB_0015ef8e;
                piVar20 = (int *)((long)local_1e8 + (long)piVar38 * 4 + *local_1b0 * lVar37);
                *piVar20 = *piVar20 + 1;
                if (*(char *)((long)piVar38 + (long)(lVar37 * *local_210 + local_260._24_8_)) ==
                    '\0') {
LAB_0015e761:
                  lVar35 = (long)piVar36 + -2;
                  piVar38 = (pointer)(long)(int)uVar12;
                  piVar20 = (int *)((long)local_1e8 + (long)piVar38 * 4 + *local_1b0 * lVar35);
                  *piVar20 = *piVar20 + 1;
                  if (*(char *)((long)piVar38 + (long)(*local_210 * lVar35 + local_260._24_8_)) ==
                      '\0') {
                    piVar20 = (int *)((long)local_2b8 + (long)piVar38 * 4 + *local_280 * lVar35 + -8
                                     );
                    *piVar20 = *piVar20 + 1;
                    uVar12 = *(uint *)(local_330._24_8_ +
                                      (long)piVar38 * 4 + *local_2e0 * lVar35 + -8);
                    piVar20 = (int *)((long)local_2b8 + (long)piVar38 * 4 + *local_280 * lVar35);
                    *piVar20 = *piVar20 + 1;
                    uVar11 = *(uint *)(local_330._24_8_ + (long)piVar38 * 4 + lVar35 * *local_2e0);
                    goto LAB_001597ab;
                  }
                }
              }
              else {
LAB_0015e963:
                uVar12 = (uint)piVar31;
                piVar38 = (pointer)(long)(int)uVar12;
                piVar20 = (int *)((long)local_1e8 +
                                 (long)piVar38 * 4 + *local_1b0 * ((long)piVar36 + -1) + 4);
                *piVar20 = *piVar20 + 1;
                if (*(char *)(local_260._24_8_ +
                             (long)piVar38 + ((long)piVar36 + -1) * *local_210 + 1) == '\0') {
LAB_0015ea2f:
                  piVar20 = (int *)((long)local_2b8 +
                                   (long)piVar38 * 4 + *local_280 * (long)piVar36 + -8);
                  *piVar20 = *piVar20 + 1;
                  piVar31 = (pointer)(*local_2e0 * (long)piVar36 + local_330._24_8_);
                  lVar35 = *local_280;
LAB_0015ea6a:
                  piVar19 = (pointer)(lVar35 * (long)piVar36 + (long)local_2b8);
                  uVar11 = piVar31[(long)piVar38 - 2];
                  goto LAB_0015f01b;
                }
LAB_0015e9a6:
                piVar38 = (pointer)(long)(int)uVar12;
                piVar20 = (int *)((long)local_1e8 +
                                 (long)piVar38 * 4 + *local_1b0 * ((long)piVar36 + -1));
                *piVar20 = *piVar20 + 1;
                if ((*(char *)((long)piVar38 +
                              (long)(((long)piVar36 + -1) * *local_210 + local_260._24_8_)) == '\0')
                   && (piVar20 = (int *)((long)local_1e8 +
                                        (long)piVar38 * 4 + *local_1b0 * ((long)piVar36 + -2)),
                      *piVar20 = *piVar20 + 1,
                      *(char *)((long)piVar38 +
                               (long)(*local_210 * ((long)piVar36 + -2) + local_260._24_8_)) == '\0'
                      )) {
LAB_00159746:
                  piVar20 = (int *)((long)local_2b8 +
                                   (long)piVar38 * 4 + *local_280 * ((long)piVar36 + -2));
                  *piVar20 = *piVar20 + 1;
                  piVar19 = (pointer)(*local_280 * (long)piVar36 + (long)local_2b8);
                  uVar12 = *(uint *)(local_330._24_8_ +
                                    (long)piVar38 * 4 + ((long)piVar36 + -2) * *local_2e0);
LAB_0015978d:
                  piVar19[(long)piVar38 - 2] = piVar19[(long)piVar38 - 2] + 1;
                  uVar11 = *(uint *)(local_330._24_8_ +
                                    (long)piVar38 * 4 + *local_2e0 * (long)piVar36 + -8);
LAB_001597ab:
                  uVar11 = RemSP::MemMerge(uVar12,uVar11);
                  piVar20 = (int *)((long)local_2b8 + (long)piVar38 * 4 + *local_280 * (long)piVar36
                                   );
                  *piVar20 = *piVar20 + 1;
                  goto LAB_0015f01f;
                }
              }
LAB_0015efd4:
              piVar20 = (int *)((long)local_2b8 +
                               (long)piVar38 * 4 + *local_280 * ((long)piVar36 + -2));
              *piVar20 = *piVar20 + 1;
              piVar19 = (pointer)(*local_280 * (long)piVar36 + (long)local_2b8);
              uVar11 = *(uint *)(local_330._24_8_ +
                                (long)piVar38 * 4 + ((long)piVar36 + -2) * *local_2e0);
              goto LAB_0015f01b;
            }
            uVar41 = (ulong)piVar36 | 1;
            piVar20 = (int *)((long)local_1e8 + (long)piVar38 * 4 + lVar37 * uVar41);
            *piVar20 = *piVar20 + 1;
            if (*(char *)((long)piVar38 + (long)(*local_210 * uVar41 + local_260._24_8_)) == '\0')
            goto LAB_0015808c;
            lVar35 = (long)iVar17;
            piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + *local_1b0 * (long)piVar36 + 0xc);
            *piVar20 = *piVar20 + 1;
            if (*(char *)(local_260._24_8_ + lVar35 + 3 + *local_210 * (long)piVar36) == '\0')
            goto LAB_0015ea80;
            piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + *local_1b0 * (long)piVar36 + 4);
            *piVar20 = *piVar20 + 1;
            if (*(char *)(local_260._24_8_ + lVar35 + 1 + *local_210 * (long)piVar36) != '\0')
            goto LAB_0015e963;
            piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + *local_1b0 * uVar41 + 4);
            *piVar20 = *piVar20 + 1;
            if (*(char *)(local_260._24_8_ + lVar35 + 1 + uVar41 * *local_210) != '\0') {
              lVar37 = (long)piVar36 + -1;
              piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + *local_1b0 * lVar37 + 0xc);
              *piVar20 = *piVar20 + 1;
              if (*(char *)(local_260._24_8_ + lVar35 + 3 + *local_210 * lVar37) == '\0') {
                piVar20 = (int *)((long)local_1e8 + (long)piVar38 * 4 + *local_1b0 * lVar37);
                *piVar20 = *piVar20 + 1;
                cVar15 = *(char *)((long)piVar38 + (long)(lVar37 * *local_210 + local_260._24_8_));
joined_r0x0015b8af:
                if (cVar15 != '\0') goto LAB_0015efd4;
                goto LAB_0015e61b;
              }
              goto LAB_0015e9a6;
            }
            goto LAB_00157278;
          }
          if (cVar15 == '\0') {
            piVar20 = (int *)((long)local_1e8 + (long)piVar38 * 4 + lVar37 * ((ulong)piVar36 | 1));
            *piVar20 = *piVar20 + 1;
            if (*(char *)((long)piVar38 +
                         (long)(((ulong)piVar36 | 1) * *local_210 + local_260._24_8_)) != '\0') {
LAB_0015ea80:
              lVar35 = (long)iVar17;
              piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + *local_1b0 * ((ulong)piVar36 | 1) + 4
                               );
              *piVar20 = *piVar20 + 1;
              if ((*(char *)(local_260._24_8_ + lVar35 + 1 + ((ulong)piVar36 | 1) * *local_210) ==
                   '\0') &&
                 (piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + *local_1b0 * (long)piVar36 + 4),
                 *piVar20 = *piVar20 + 1, uVar11 = RemSP::length_,
                 *(char *)(local_260._24_8_ + lVar35 + 1 + *local_210 * (long)piVar36) == '\0')) {
                lVar35 = (long)(int)RemSP::length_;
                RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar35] =
                     RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar35] + 1;
                RemSP::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start[lVar35] = uVar11;
                lVar37 = *local_280;
                uVar11 = RemSP::length_;
                RemSP::length_ = RemSP::length_ + 1;
              }
              else {
                piVar20 = (int *)((long)local_2b8 + lVar35 * 4 + *local_280 * (long)piVar36);
                *piVar20 = *piVar20 + 1;
                lVar37 = *local_280;
                uVar11 = *(uint *)(local_330._24_8_ + lVar35 * 4 + *local_2e0 * (long)piVar36);
              }
              piVar19 = (pointer)(lVar37 * (long)piVar36 + (long)local_2b8);
              piVar38 = (pointer)(long)(int)uVar12;
              goto LAB_0015f01b;
            }
            goto LAB_0015e87f;
          }
          lVar35 = (long)iVar17;
          piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + lVar37 * (long)piVar36 + 4);
          *piVar20 = *piVar20 + 1;
          if ((*(char *)(local_260._24_8_ + lVar35 + 1 + *local_210 * (long)piVar36) == '\0') &&
             (piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + *local_1b0 * ((ulong)piVar36 | 1) + 4
                               ), *piVar20 = *piVar20 + 1,
             *(char *)(local_260._24_8_ + lVar35 + 1 + ((ulong)piVar36 | 1) * *local_210) == '\0'))
          {
LAB_0015ef8e:
            piVar38 = (pointer)(long)(int)uVar12;
            piVar20 = (int *)((long)local_1e8 +
                             (long)piVar38 * 4 + *local_1b0 * ((long)piVar36 + -1));
            *piVar20 = *piVar20 + 1;
            if (*(char *)((long)piVar38 +
                         (long)(((long)piVar36 + -1) * *local_210 + local_260._24_8_)) != '\0')
            goto LAB_0015efd4;
            piVar20 = (int *)((long)local_2b8 + (long)iVar17 * 4 + *local_280 * ((long)piVar36 + -2)
                             );
            *piVar20 = *piVar20 + 1;
            piVar19 = (pointer)(*local_280 * (long)piVar36 + (long)local_2b8);
            uVar11 = *(uint *)(local_330._24_8_ +
                              (long)iVar17 * 4 + ((long)piVar36 + -2) * *local_2e0);
            goto LAB_0015f01b;
          }
LAB_0015e61b:
          piVar20 = (int *)((long)local_2b8 + lVar35 * 4 + *local_280 * (long)piVar36);
          *piVar20 = *piVar20 + 1;
          uVar11 = *(uint *)(local_330._24_8_ + lVar35 * 4 + *local_2e0 * (long)piVar36);
          piVar20 = (int *)((long)local_2b8 + (long)piVar38 * 4 + *local_280 * (long)piVar36);
          *piVar20 = *piVar20 + 1;
          goto LAB_0015f01f;
        }
        if (iVar3 == 2) {
          plVar42 = (long *)((long)local_1e8 + *local_1b0 * (long)piVar36);
          *(int *)plVar42 = (int)*plVar42 + 1;
          piVar31 = (pointer)0x0;
          if ((char)*(pointer)(local_260._24_8_ + *local_210 * (long)piVar36) == '\0') {
LAB_00158011:
            lVar35 = *local_1b0;
            iVar17 = (int)piVar31;
            piVar38 = (pointer)(long)iVar17;
            piVar20 = (int *)((long)local_1e8 + (long)piVar38 * 4 + lVar35 * ((ulong)piVar36 | 1));
            *piVar20 = *piVar20 + 1;
            lVar37 = *local_210;
            if (*(char *)((long)piVar38 + (long)(((ulong)piVar36 | 1) * lVar37 + local_260._24_8_))
                == '\0') {
LAB_0015808c:
              uVar12 = (uint)piVar31;
              piVar20 = (int *)((long)local_1e8 +
                               (long)(int)uVar12 * 4 + *local_1b0 * (long)piVar36 + 4);
              *piVar20 = *piVar20 + 1;
              if (*(char *)(local_260._24_8_ + (long)(int)uVar12 + 1 + *local_210 * (long)piVar36)
                  != '\0') goto LAB_00157278;
LAB_001580ce:
              piVar38 = (pointer)(long)(int)uVar12;
              piVar20 = (int *)((long)local_1e8 +
                               (long)piVar38 * 4 + *local_1b0 * ((ulong)piVar36 | 1) + 4);
              *piVar20 = *piVar20 + 1;
              if (*(char *)(local_260._24_8_ + (long)piVar38 + ((ulong)piVar36 | 1) * *local_210 + 1
                           ) == '\0') {
                piVar19 = (pointer)(*local_280 * (long)piVar36 + (long)local_2b8);
                piVar38 = (pointer)(long)(int)uVar12;
                goto LAB_0015e896;
              }
            }
            else {
              piVar20 = (int *)((long)local_1e8 + (long)iVar17 * 4 + lVar35 * (long)piVar36 + 4);
              *piVar20 = *piVar20 + 1;
              if (*(char *)(local_260._24_8_ + (long)iVar17 + 1 + lVar37 * (long)piVar36) != '\0')
              goto LAB_00157278;
            }
LAB_00158110:
            uVar12 = RemSP::length_;
            lVar35 = (long)(int)RemSP::length_;
            RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[lVar35] =
                 RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar35] + 1;
            RemSP::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start[lVar35] = uVar12;
            piVar19 = (pointer)(*local_280 * (long)piVar36 + (long)local_2b8);
            uVar11 = RemSP::length_;
            RemSP::length_ = RemSP::length_ + 1;
LAB_0015f01b:
            piVar19[(long)piVar38] = piVar19[(long)piVar38] + 1;
LAB_0015f01f:
            lVar35 = *local_2e0;
          }
          else {
LAB_00157278:
            piVar38 = (pointer)(long)(int)piVar31;
            piVar20 = (int *)((long)local_1e8 +
                             (long)piVar38 * 4 + *local_1b0 * ((long)piVar36 + -1) + 4);
            *piVar20 = *piVar20 + 1;
            piVar19 = (pointer)((ulong)piVar31 & 0xffffffff);
            if (*(char *)(local_260._24_8_ + (long)piVar38 + ((long)piVar36 + -1) * *local_210 + 1)
                == '\0') goto LAB_001573a9;
LAB_001573eb:
            lVar37 = *local_280;
            piVar20 = (int *)((long)local_2b8 + (long)piVar38 * 4 + lVar37 * ((long)piVar36 + -2));
            *piVar20 = *piVar20 + 1;
            lVar35 = *local_2e0;
            uVar11 = *(uint *)(local_330._24_8_ + (long)piVar38 * 4 + ((long)piVar36 + -2) * lVar35)
            ;
            piVar20 = (int *)((long)local_2b8 + (long)piVar38 * 4 + lVar37 * (long)piVar36);
            *piVar20 = *piVar20 + 1;
          }
        }
        else {
          plVar42 = (long *)((long)local_1e8 + *local_1b0 * (long)piVar36);
          *(int *)plVar42 = (int)*plVar42 + 1;
          piVar19 = (pointer)0x0;
          uVar12 = 0;
          if ((char)*(pointer)(local_260._24_8_ + *local_210 * (long)piVar36) != '\0') {
LAB_001573a9:
            piVar38 = (pointer)(long)(int)piVar19;
            piVar20 = (int *)((long)local_1e8 +
                             (long)piVar38 * 4 + *local_1b0 * ((long)piVar36 + -1));
            *piVar20 = *piVar20 + 1;
            if (*(char *)((long)piVar38 +
                         (long)(((long)piVar36 + -1) * *local_210 + local_260._24_8_)) == '\0')
            goto LAB_00158110;
            goto LAB_001573eb;
          }
LAB_00157f58:
          piVar38 = (pointer)(long)(int)uVar12;
          piVar20 = (int *)((long)local_1e8 + (long)piVar38 * 4 + *local_1b0 * ((ulong)piVar36 | 1))
          ;
          *piVar20 = *piVar20 + 1;
          if (*(char *)((long)piVar38 + (long)(((ulong)piVar36 | 1) * *local_210 + local_260._24_8_)
                       ) != '\0') goto LAB_00158110;
LAB_0015e87f:
          piVar19 = (pointer)(*local_280 * (long)piVar36 + (long)local_2b8);
LAB_0015e896:
          piVar19[(long)piVar38] = piVar19[(long)piVar38] + 1;
          lVar35 = *local_2e0;
          uVar11 = 0;
        }
LAB_0015f02f:
        *(uint *)(local_330._24_8_ + (long)piVar38 * 4 + lVar35 * (long)piVar36) = uVar11;
        piVar36 = (pointer)((long)piVar36 + 2);
        lVar30 = lVar30 + 2;
        lVar27 = lVar27 + 2;
        lVar14 = lVar14 + 2;
      } while (piVar36 < piVar25);
    }
    iVar17 = (int)plVar43;
    this = local_170;
    if ((int)local_168 == 1) {
      local_180 = (pointer)CONCAT44(local_180._4_4_,iVar2 + -1);
      uVar12 = 0;
      if (2 < iVar3) {
        lVar35 = (long)(iVar2 + -1);
        lVar27 = uVar26 - 2;
        local_190 = (pointer)(uVar26 - 3);
        local_198 = (pointer)(uVar26 - 3);
        lVar30 = uVar26 - 3;
        local_138 = (pointer)(long)(iVar2 + -3);
        local_158 = (long *)(long)(iVar2 + -2);
        local_120 = (pointer)(long)(iVar2 + -3);
        local_130 = (pointer)(long)(iVar2 + -3);
        local_150 = (pointer)(long)(iVar2 + -3);
        local_128 = (long)(iVar2 + -3);
        local_140 = (long)(iVar2 + -3);
        lVar14 = (long)iVar17;
        local_148 = (pointer)(long)(iVar2 + -3);
        iVar10 = -2;
        plVar42 = (long *)0x0;
        do {
          uVar41 = (ulong)(int)plVar42;
          piVar20 = (int *)((long)local_1e8 + uVar41 * 4 + *local_1b0 * lVar35);
          *piVar20 = *piVar20 + 1;
          if (*(char *)(local_260._24_8_ + uVar41 + *local_210 * lVar35) == '\0') goto LAB_0015fb59;
          lVar37 = (long)iVar10;
          piVar20 = (int *)((long)local_1e8 + lVar37 * 4 + *local_1b0 * lVar27 + 0xc);
          *piVar20 = *piVar20 + 1;
          if (*(char *)(local_260._24_8_ + lVar37 + 3 + *local_210 * lVar27) != '\0') {
            lVar37 = *local_280;
            piVar25 = local_190;
            goto LAB_001621a5;
          }
          piVar20 = (int *)((long)local_1e8 + lVar37 * 4 + *local_1b0 * lVar35 + 0xc);
          *piVar20 = *piVar20 + 1;
          if (*(char *)(local_260._24_8_ + lVar37 + 3 + *local_210 * lVar35) != '\0') {
LAB_0015fbee:
            uVar41 = (ulong)(int)plVar42;
            piVar20 = (int *)((long)local_1e8 + uVar41 * 4 + *local_1b0 * lVar27 + 8);
            *piVar20 = *piVar20 + 1;
            cVar15 = *(char *)(local_260._24_8_ + uVar41 + 2 + *local_210 * lVar27);
            piVar20 = (int *)((long)local_1e8 + uVar41 * 4 + *local_1b0 * lVar27);
            *piVar20 = *piVar20 + 1;
            uVar12 = RemSP::length_;
            cVar1 = *(char *)(local_260._24_8_ + uVar41 + *local_210 * lVar27);
            if (cVar15 != '\0') {
              if (cVar1 != '\0') goto LAB_0015fc73;
              piVar20 = (int *)((long)local_2b8 + uVar41 * 4 + *local_280 * (long)local_198 + 8);
              *piVar20 = *piVar20 + 1;
              piVar25 = local_198;
              goto LAB_0015fe78;
            }
            if (cVar1 == '\0') {
              lVar37 = (long)(int)RemSP::length_;
              RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar37] =
                   RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar37] + 1;
              RemSP::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar37] = uVar12;
              piVar25 = (pointer)(*local_280 * lVar35 + (long)local_2b8);
              uVar12 = RemSP::length_;
              goto LAB_0016113d;
            }
LAB_0015fce9:
            piVar20 = (int *)((long)local_2b8 + uVar41 * 4 + *local_280 * (long)local_148);
            *piVar20 = *piVar20 + 1;
            uVar18 = *(undefined4 *)(local_330._24_8_ + uVar41 * 4 + *local_2e0 * (long)local_148);
            piVar20 = (int *)((long)local_2b8 + uVar41 * 4 + *local_280 * lVar35);
            *piVar20 = *piVar20 + 1;
            *(undefined4 *)(local_330._24_8_ + uVar41 * 4 + *local_2e0 * lVar35) = uVar18;
            lVar37 = (long)(int)plVar42;
            uVar41 = lVar37 + 2;
            if ((int)uVar41 < (int)local_268) {
              piVar20 = (int *)((long)local_1e8 + lVar37 * 4 + *local_1b0 * lVar35 + 8);
              *piVar20 = *piVar20 + 1;
              plVar43 = local_268;
              if (*(char *)(local_260._24_8_ + lVar37 + 2 + *local_210 * lVar35) == '\0') {
                plVar42 = (long *)(uVar41 & 0xffffffff);
                goto LAB_00160a2b;
              }
              piVar20 = (int *)((long)local_1e8 + lVar37 * 4 + *local_1b0 * lVar27 + 0xc);
              *piVar20 = *piVar20 + 1;
              if (*(char *)(local_260._24_8_ + lVar37 + 3 + *local_210 * lVar27) != '\0') {
                piVar20 = (int *)((long)local_1e8 + lVar37 * 4 + *local_1b0 * lVar30 + 8);
                *piVar20 = *piVar20 + 1;
                if (*(char *)(local_260._24_8_ + lVar37 + 2 + *local_210 * lVar30) == '\0') {
                  piVar20 = (int *)((long)local_2b8 + lVar37 * 4 + *local_280 * lVar30 + 8);
                  *piVar20 = *piVar20 + 1;
                  uVar12 = *(uint *)(local_330._24_8_ + lVar37 * 4 + *local_2e0 * lVar30 + 8);
                  piVar20 = (int *)((long)local_2b8 + lVar37 * 4 + *local_280 * lVar35);
                  *piVar20 = *piVar20 + 1;
                  uVar12 = RemSP::MemMerge(uVar12,*(uint *)(local_330._24_8_ +
                                                           lVar37 * 4 + *local_2e0 * lVar35));
                  plVar42 = (long *)(uVar41 & 0xffffffff);
                  plVar43 = local_268;
                  goto LAB_00161ab8;
                }
                plVar42 = (long *)(uVar41 & 0xffffffff);
LAB_001614b5:
                uVar41 = (ulong)(int)plVar42;
                piVar20 = (int *)((long)local_1e8 + uVar41 * 4 + *local_1b0 * lVar30 + -4);
                *piVar20 = *piVar20 + 1;
                if (*(char *)(local_260._24_8_ + (uVar41 - 1) + *local_210 * lVar30) != '\0')
                goto LAB_00162129;
                piVar25 = (pointer)(*local_280 * lVar30 + (long)local_2b8);
                uVar41 = (ulong)(int)plVar42;
                goto LAB_001621e9;
              }
              piVar20 = (int *)((long)local_1e8 + lVar37 * 4 + *local_1b0 * lVar35 + 0xc);
              *piVar20 = *piVar20 + 1;
              if (*(char *)(local_260._24_8_ + lVar37 + 3 + *local_210 * lVar35) != '\0') {
                piVar20 = (int *)((long)local_1e8 + lVar37 * 4 + *local_1b0 * lVar27 + 0x10);
                *piVar20 = *piVar20 + 1;
                if (*(char *)(local_260._24_8_ + lVar37 + 4 + *local_210 * lVar27) == '\0') {
                  piVar20 = (int *)((long)local_2b8 + lVar37 * 4 + *local_280 * lVar35);
                  *piVar20 = *piVar20 + 1;
                  puVar13 = (undefined4 *)(local_330._24_8_ + lVar37 * 4 + *local_2e0 * lVar35);
                  piVar20 = (int *)((long)local_2b8 + uVar41 * 4 + *local_280 * lVar35);
                  local_160 = (long *)(uVar41 & 0xffffffff);
                  goto LAB_001611e8;
                }
                piVar20 = (int *)((long)local_1e8 + lVar37 * 4 + *local_1b0 * lVar30 + 0xc);
                *piVar20 = *piVar20 + 1;
                if ((*(char *)(local_260._24_8_ + lVar37 + 3 + *local_210 * lVar30) == '\0') ||
                   (piVar20 = (int *)((long)local_1e8 + lVar37 * 4 + *local_1b0 * lVar30 + 8),
                   *piVar20 = *piVar20 + 1,
                   *(char *)(local_260._24_8_ + lVar37 + 2 + *local_210 * lVar30) == '\0')) {
                  piVar20 = (int *)((long)local_2b8 + lVar37 * 4 + *local_280 * lVar30 + 0x10);
                  *piVar20 = *piVar20 + 1;
                  uVar12 = *(uint *)(local_330._24_8_ + lVar37 * 4 + *local_2e0 * lVar30 + 0x10);
                  piVar20 = (int *)((long)local_2b8 + lVar37 * 4 + *local_280 * lVar35);
                  *piVar20 = *piVar20 + 1;
                  uVar12 = RemSP::MemMerge(uVar12,*(uint *)(local_330._24_8_ +
                                                           lVar37 * 4 + *local_2e0 * lVar35));
                  piVar20 = (int *)((long)local_2b8 + uVar41 * 4 + *local_280 * lVar35);
                  plVar42 = (long *)(uVar41 & 0xffffffff);
                  plVar43 = local_268;
                  goto LAB_00160bfd;
                }
                plVar42 = (long *)(uVar41 & 0xffffffff);
LAB_001616bf:
                iVar17 = (int)plVar42;
                uVar41 = (ulong)iVar17;
                piVar20 = (int *)((long)local_1e8 + uVar41 * 4 + *local_1b0 * local_140 + -4);
                *piVar20 = *piVar20 + 1;
                lVar37 = (long)(iVar17 + 2);
                if (*(char *)(local_260._24_8_ + (uVar41 - 1) + *local_210 * local_140) == '\0') {
                  piVar20 = (int *)((long)local_2b8 + lVar37 * 4 + *local_280 * local_140);
                  *piVar20 = *piVar20 + 1;
                  uVar11 = *(uint *)(local_330._24_8_ + lVar37 * 4 + *local_2e0 * local_140);
                  uVar41 = (ulong)iVar17;
                  piVar20 = (int *)((long)local_2b8 + uVar41 * 4 + *local_280 * lVar35 + -8);
                  *piVar20 = *piVar20 + 1;
                  uVar12 = *(uint *)(local_330._24_8_ + uVar41 * 4 + *local_2e0 * lVar35 + -8);
                  goto LAB_0015fffe;
                }
                piVar20 = (int *)((long)local_2b8 + lVar37 * 4 + *local_280 * local_140);
                *piVar20 = *piVar20 + 1;
                uVar12 = *(uint *)(local_330._24_8_ + lVar37 * 4 + *local_2e0 * local_140);
                lVar37 = *local_280;
LAB_00160bed:
                piVar20 = (int *)((long)local_2b8 + uVar41 * 4 + lVar37 * lVar35);
LAB_00160bfd:
                *piVar20 = *piVar20 + 1;
                *(uint *)(local_330._24_8_ + uVar41 * 4 + *local_2e0 * lVar35) = uVar12;
                uVar12 = (int)plVar42 + 2;
                iVar17 = (int)plVar43;
                if ((int)uVar12 < iVar17) {
                  lVar34 = (long)(int)plVar42;
                  local_178 = (pointer)(lVar34 + 2);
                  lVar28 = lVar34 << 0x20;
                  lVar37 = lVar34 * 4;
                  lVar40 = 8;
                  lVar24 = 0;
                  local_160 = plVar42;
                  while( true ) {
                    piVar20 = (int *)((long)local_1e8 +
                                     lVar24 * 4 + lVar37 + *local_1b0 * lVar35 + 8);
                    *piVar20 = *piVar20 + 1;
                    plVar43 = local_268;
                    if (*(char *)(local_260._24_8_ + lVar24 + 2 + lVar34 + *local_210 * lVar35) ==
                        '\0') {
                      plVar42 = (long *)((long)local_178 + lVar24);
                      piVar20 = (int *)((long)local_1e8 +
                                       (lVar28 + 0x300000000 >> 0x1e) + *local_1b0 * lVar35);
                      *piVar20 = *piVar20 + 1;
                      lVar37 = lVar28 + 0x300000000 >> 0x20;
                      uVar41 = lVar34 + 2 + lVar24;
                      if (*(char *)(local_260._24_8_ + lVar37 + *local_210 * lVar35) == '\0') {
                        piVar20 = (int *)((long)local_2b8 +
                                         lVar40 + lVar34 * 4 + *local_280 * lVar35);
                        iVar17 = (int)plVar42;
                        goto LAB_0016024b;
                      }
                      piVar20 = (int *)((long)local_1e8 + lVar37 * 4 + *local_1b0 * lVar27);
                      *piVar20 = *piVar20 + 1;
                      if (*(char *)(local_260._24_8_ + lVar37 + *local_210 * lVar27) != '\0') {
                        piVar20 = (int *)((long)local_2b8 +
                                         lVar40 + lVar34 * 4 + *local_280 * (long)local_138);
                        piVar25 = local_138;
                        goto LAB_00160acf;
                      }
                      piVar20 = (int *)((long)local_1e8 +
                                       (lVar28 + 0x400000000 >> 0x1e) + *local_1b0 * lVar27);
                      *piVar20 = *piVar20 + 1;
                      if (*(char *)(local_260._24_8_ +
                                   (lVar28 + 0x400000000 >> 0x20) + *local_210 * lVar27) != '\0')
                      goto LAB_0015fc73;
                      goto LAB_0015fce9;
                    }
                    piVar20 = (int *)((long)local_1e8 +
                                     lVar24 * 4 + *local_1b0 * lVar27 + lVar37 + 0xc);
                    *piVar20 = *piVar20 + 1;
                    iVar10 = (int)lVar24;
                    iVar17 = (int)local_178;
                    if (*(char *)(local_260._24_8_ + lVar24 + 3 + lVar34 + *local_210 * lVar27) !=
                        '\0') {
                      piVar20 = (int *)((long)local_2b8 +
                                       lVar24 * 4 + lVar34 * 4 + *local_280 * lVar30 + 8);
                      *piVar20 = *piVar20 + 1;
                      uVar12 = *(uint *)(local_330._24_8_ +
                                        lVar24 * 4 + lVar34 * 4 + *local_2e0 * lVar30 + 8);
                      uVar41 = lVar34 + lVar24 + 2;
                      plVar42 = (long *)(ulong)(uint)(iVar17 + iVar10);
                      goto LAB_00161ab8;
                    }
                    piVar20 = (int *)((long)local_1e8 +
                                     lVar24 * 4 + lVar37 + *local_1b0 * lVar35 + 0xc);
                    *piVar20 = *piVar20 + 1;
                    lVar32 = lVar28 >> 0x1e;
                    if (*(char *)(local_260._24_8_ + lVar24 + 3 + lVar34 + *local_210 * lVar35) ==
                        '\0') {
                      piVar20 = (int *)((long)local_2b8 + lVar32 + *local_280 * lVar35);
                      *piVar20 = *piVar20 + 1;
                      uVar12 = *(uint *)(local_330._24_8_ + lVar32 + *local_2e0 * lVar35);
                      uVar41 = lVar34 + lVar24 + 2;
                      piVar20 = (int *)((long)local_2b8 + lVar40 + lVar34 * 4 + *local_280 * lVar35)
                      ;
                      plVar42 = (long *)(ulong)(uint)(iVar17 + iVar10);
                      goto LAB_00162502;
                    }
                    piVar20 = (int *)((long)local_1e8 +
                                     lVar24 * 4 + lVar37 + *local_1b0 * lVar27 + 0x10);
                    *piVar20 = *piVar20 + 1;
                    if (*(char *)(local_260._24_8_ + lVar24 + 4 + lVar34 + *local_210 * lVar27) ==
                        '\0') break;
                    piVar20 = (int *)((long)local_1e8 +
                                     lVar24 * 4 + lVar37 + *local_1b0 * lVar30 + 0xc);
                    *piVar20 = *piVar20 + 1;
                    if (*(char *)(local_260._24_8_ + lVar24 + 3 + lVar34 + *local_210 * lVar30) ==
                        '\0') {
                      piVar20 = (int *)((long)local_2b8 +
                                       lVar24 * 4 + lVar37 + *local_280 * lVar30 + 0x10);
                      *piVar20 = *piVar20 + 1;
                      uVar12 = *(uint *)(local_330._24_8_ +
                                        lVar24 * 4 + lVar37 + *local_2e0 * lVar30 + 0x10);
                      piVar20 = (int *)((long)local_2b8 + lVar24 * 4 + lVar37 + *local_280 * lVar35)
                      ;
                      *piVar20 = *piVar20 + 1;
                      uVar12 = RemSP::MemMerge(uVar12,*(uint *)(local_330._24_8_ +
                                                               lVar24 * 4 +
                                                               lVar37 + *local_2e0 * lVar35));
                    }
                    else {
                      piVar20 = (int *)((long)local_2b8 +
                                       lVar24 * 4 + lVar37 + *local_280 * lVar30 + 0x10);
                      *piVar20 = *piVar20 + 1;
                      uVar12 = *(uint *)(local_330._24_8_ +
                                        lVar24 * 4 + lVar37 + *local_2e0 * lVar30 + 0x10);
                    }
                    piVar20 = (int *)((long)local_2b8 +
                                     lVar24 * 4 + lVar37 + *local_280 * lVar35 + 8);
                    *piVar20 = *piVar20 + 1;
                    *(uint *)(local_330._24_8_ + lVar24 * 4 + lVar37 + *local_2e0 * lVar35 + 8) =
                         uVar12;
                    lVar28 = lVar28 + 0x200000000;
                    lVar32 = lVar34 + lVar24;
                    lVar24 = lVar24 + 2;
                    lVar40 = lVar40 + 8;
                    if (lVar14 <= lVar32 + 4) {
                      uVar12 = (int)local_160 + (int)lVar24 + 2;
                      plVar42 = (long *)(ulong)(uint)((int)local_160 + (int)lVar24);
                      iVar17 = (int)local_268;
                      goto LAB_00162696;
                    }
                  }
                  piVar20 = (int *)((long)local_2b8 + lVar32 + *local_280 * lVar35);
                  *piVar20 = *piVar20 + 1;
                  puVar13 = (undefined4 *)(local_330._24_8_ + lVar32 + *local_2e0 * lVar35);
                  uVar41 = lVar34 + lVar24 + 2;
                  piVar20 = (int *)((long)local_2b8 + lVar40 + lVar34 * 4 + *local_280 * lVar35);
                  local_160 = (long *)(ulong)(uint)(iVar17 + iVar10);
LAB_001611e8:
                  uVar18 = *puVar13;
                  *piVar20 = *piVar20 + 1;
                  *(undefined4 *)(local_330._24_8_ + uVar41 * 4 + *local_2e0 * lVar35) = uVar18;
                  iVar17 = (int)local_160;
                  uVar12 = iVar17 + 2;
                  iVar10 = (int)plVar43;
                  if ((int)uVar12 < iVar10) {
                    lVar34 = *local_210;
                    piVar25 = (pointer)(long)iVar17;
                    local_168 = (pointer)((long)piVar25 + 2);
                    lVar24 = (long)piVar25 << 0x20;
                    lVar37 = (long)piVar25 * 4;
                    local_178 = (pointer)((long)local_1e8 +
                                         *local_1b0 * lVar35 + (long)piVar25 * 4 + 8);
                    lVar28 = local_260._24_8_ + (long)piVar25;
                    lVar32 = 8;
                    lVar40 = 0;
                    while( true ) {
                      local_178[lVar40] = local_178[lVar40] + 1;
                      local_188 = piVar25;
                      if (*(char *)((long)(lVar34 * lVar35 + (long)piVar25) + local_260._24_8_ + 2 +
                                   lVar40) == '\0') {
                        plVar42 = (long *)(ulong)(uint)((int)local_168 + (int)lVar40);
                        goto LAB_00160a2b;
                      }
                      piVar20 = (int *)((long)local_1e8 +
                                       lVar40 * 4 + *local_1b0 * lVar27 + (long)piVar25 * 4 + 0xc);
                      *piVar20 = *piVar20 + 1;
                      lVar33 = lVar24 >> 0x1e;
                      lVar23 = lVar24 >> 0x20;
                      this = local_170;
                      if (*(char *)(lVar40 + 3 + *local_210 * lVar27 + lVar28) != '\0') break;
                      piVar20 = (int *)((long)local_1e8 +
                                       lVar40 * 4 + *local_1b0 * lVar35 + (long)piVar25 * 4 + 0xc);
                      *piVar20 = *piVar20 + 1;
                      if (*(char *)(lVar40 + 3 + *local_210 * lVar35 + lVar28) == '\0') {
                        piVar20 = (int *)((long)local_2b8 + lVar33 + *local_280 * lVar35);
                        *piVar20 = *piVar20 + 1;
                        uVar12 = *(uint *)(local_330._24_8_ + lVar33 + *local_2e0 * lVar35);
                        uVar41 = (long)piVar25 + lVar40 + 2;
                        piVar20 = (int *)((long)local_2b8 +
                                         lVar32 + (long)piVar25 * 4 + *local_280 * lVar35);
                        plVar42 = (long *)(ulong)(uint)((int)local_168 + (int)lVar40);
                        goto LAB_00162502;
                      }
                      piVar20 = (int *)((long)local_1e8 +
                                       lVar40 * 4 + *local_1b0 * lVar27 + (long)piVar25 * 4 + 0x10);
                      *piVar20 = *piVar20 + 1;
                      if (*(char *)(lVar40 + 4 + *local_210 * lVar27 + lVar28) != '\0') {
                        plVar42 = (long *)((long)local_168 + lVar40);
                        piVar20 = (int *)((long)local_1e8 +
                                         lVar40 * 4 +
                                         (long)piVar25 * 4 + *local_1b0 * local_128 + 0xc);
                        *piVar20 = *piVar20 + 1;
                        uVar41 = (long)piVar25 + lVar40 + 2;
                        if (*(char *)(local_260._24_8_ +
                                     (long)piVar25 + *local_210 * local_128 + lVar40 + 3) == '\0') {
                          piVar20 = (int *)((long)local_2b8 +
                                           lVar40 * 4 +
                                           (long)piVar25 * 4 + *local_280 * local_128 + 0x10);
                          *piVar20 = *piVar20 + 1;
                          uVar12 = *(uint *)(local_330._24_8_ +
                                            lVar40 * 4 +
                                            (long)piVar25 * 4 + *local_2e0 * local_128 + 0x10);
                          piVar20 = (int *)((long)local_2b8 + lVar33 + *local_280 * lVar35);
                          *piVar20 = *piVar20 + 1;
                          uVar12 = RemSP::MemMerge(uVar12,*(uint *)(local_330._24_8_ +
                                                                   lVar33 + *local_2e0 * lVar35));
                          piVar20 = (int *)((long)local_2b8 +
                                           lVar32 + (long)piVar25 * 4 + *local_280 * lVar35);
                          this = local_170;
                          goto LAB_00160bfd;
                        }
                        piVar20 = (int *)((long)local_1e8 +
                                         lVar40 * 4 + (long)piVar25 * 4 + *local_1b0 * local_128 + 8
                                         );
                        *piVar20 = *piVar20 + 1;
                        if (*(char *)(lVar40 + 2 +
                                     (long)(*local_210 * local_128 + local_260._24_8_) +
                                     (long)piVar25) == '\0') {
                          piVar20 = (int *)((long)local_2b8 +
                                           lVar40 * 4 +
                                           (long)piVar25 * 4 + *local_280 * local_128 + 0x10);
                          *piVar20 = *piVar20 + 1;
                          uVar12 = *(uint *)(local_330._24_8_ +
                                            lVar40 * 4 +
                                            (long)piVar25 * 4 + *local_2e0 * local_128 + 0x10);
                          piVar20 = (int *)((long)local_2b8 + lVar33 + *local_280 * lVar35);
                          *piVar20 = *piVar20 + 1;
                          uVar12 = RemSP::MemMerge(uVar12,*(uint *)(local_330._24_8_ +
                                                                   lVar33 + *local_2e0 * lVar35));
                          piVar20 = (int *)((long)local_2b8 +
                                           lVar32 + (long)piVar25 * 4 + *local_280 * lVar35);
                        }
                        else {
                          piVar20 = (int *)((long)local_1e8 + lVar33 + *local_1b0 * lVar27);
                          *piVar20 = *piVar20 + 1;
                          if (*(char *)(local_260._24_8_ + lVar23 + *local_210 * lVar27) != '\0')
                          goto LAB_001616bf;
                          piVar20 = (int *)((long)local_2b8 +
                                           lVar40 * 4 +
                                           (long)piVar25 * 4 + *local_280 * local_128 + 0x10);
                          *piVar20 = *piVar20 + 1;
                          uVar12 = *(uint *)(local_330._24_8_ +
                                            lVar40 * 4 +
                                            (long)piVar25 * 4 + *local_2e0 * local_128 + 0x10);
                          piVar20 = (int *)((long)local_2b8 + lVar23 * 4 + *local_280 * lVar35);
                          *piVar20 = *piVar20 + 1;
                          uVar12 = RemSP::MemMerge(uVar12,*(uint *)(local_330._24_8_ +
                                                                   lVar23 * 4 + *local_2e0 * lVar35)
                                                  );
                          piVar20 = (int *)((long)local_2b8 +
                                           lVar32 + (long)piVar25 * 4 + *local_280 * lVar35);
                        }
                        goto LAB_00160bfd;
                      }
                      piVar20 = (int *)((long)local_2b8 + lVar40 * 4 + *local_280 * lVar35 + lVar37)
                      ;
                      *piVar20 = *piVar20 + 1;
                      uVar18 = *(undefined4 *)
                                (local_330._24_8_ + lVar40 * 4 + *local_2e0 * lVar35 + lVar37);
                      piVar20 = (int *)((long)local_2b8 +
                                       lVar40 * 4 + *local_280 * lVar35 + lVar37 + 8);
                      *piVar20 = *piVar20 + 1;
                      *(undefined4 *)
                       (local_330._24_8_ + lVar40 * 4 + *local_2e0 * lVar35 + lVar37 + 8) = uVar18;
                      lVar24 = lVar24 + 0x200000000;
                      lVar33 = lVar40 + 4;
                      lVar40 = lVar40 + 2;
                      lVar32 = lVar32 + 8;
                      iVar10 = (int)local_268;
                      plVar43 = local_268;
                      if (lVar14 <= (long)piVar25 + lVar33) {
                        uVar12 = iVar17 + (int)lVar40 + 2;
                        iVar17 = iVar17 + (int)lVar40;
                        goto LAB_00162668;
                      }
                    }
                    plVar42 = (long *)((long)local_168 + lVar40);
                    piVar20 = (int *)((long)local_1e8 +
                                     lVar40 * 4 + (long)piVar25 * 4 + *local_1b0 * lVar30 + 8);
                    *piVar20 = *piVar20 + 1;
                    uVar41 = (long)piVar25 + lVar40 + 2;
                    if (*(char *)(local_260._24_8_ +
                                 (long)piVar25 + *local_210 * lVar30 + lVar40 + 2) == '\0') {
                      piVar20 = (int *)((long)local_2b8 +
                                       lVar40 * 4 + (long)piVar25 * 4 + *local_280 * lVar30 + 8);
                      *piVar20 = *piVar20 + 1;
                      uVar12 = *(uint *)(local_330._24_8_ +
                                        lVar40 * 4 + (long)piVar25 * 4 + *local_2e0 * lVar30 + 8);
                      piVar20 = (int *)((long)local_2b8 + lVar33 + *local_280 * lVar35);
                      *piVar20 = *piVar20 + 1;
                      uVar12 = RemSP::MemMerge(uVar12,*(uint *)(local_330._24_8_ +
                                                               lVar33 + *local_2e0 * lVar35));
                      this = local_170;
                    }
                    else {
                      piVar20 = (int *)((long)local_1e8 + lVar33 + *local_1b0 * lVar27);
                      *piVar20 = *piVar20 + 1;
                      if (*(char *)(local_260._24_8_ + lVar23 + *local_210 * lVar27) != '\0')
                      goto LAB_001614b5;
                      piVar20 = (int *)((long)local_2b8 +
                                       lVar40 * 4 + (long)piVar25 * 4 + *local_280 * lVar30 + 8);
                      *piVar20 = *piVar20 + 1;
                      uVar12 = *(uint *)(local_330._24_8_ +
                                        lVar40 * 4 + (long)piVar25 * 4 + *local_2e0 * lVar30 + 8);
                      piVar20 = (int *)((long)local_2b8 + lVar23 * 4 + *local_280 * lVar35);
                      *piVar20 = *piVar20 + 1;
                      uVar12 = RemSP::MemMerge(uVar12,*(uint *)(local_330._24_8_ +
                                                               lVar23 * 4 + *local_2e0 * lVar35));
                    }
LAB_00161ab8:
                    do {
                      piVar20 = (int *)((long)local_2b8 + uVar41 * 4 + *local_280 * lVar35);
                      *piVar20 = *piVar20 + 1;
                      *(uint *)(local_330._24_8_ + uVar41 * 4 + *local_2e0 * lVar35) = uVar12;
                      iVar10 = (int)plVar42;
                      uVar12 = iVar10 + 2;
                      iVar17 = (int)plVar43;
                      if (iVar17 <= (int)uVar12) {
LAB_00162760:
                        uVar41 = (ulong)uVar12;
                        lVar27 = (long)(int)uVar12;
                        piVar20 = (int *)((long)local_1e8 + lVar27 * 4 + *local_1b0 * lVar35);
                        *piVar20 = *piVar20 + 1;
                        cVar15 = *(char *)(local_260._24_8_ + lVar27 + *local_210 * lVar35);
                        iVar10 = (int)plVar42;
                        if (iVar17 < (int)uVar12) {
                          if (cVar15 == '\0') goto LAB_00162bf6;
                          lVar30 = (long)iVar10;
                          piVar20 = (int *)((long)local_1e8 + lVar30 * 4 + *local_1b0 * lVar35 + 4);
                          *piVar20 = *piVar20 + 1;
                          if (*(char *)(local_260._24_8_ + lVar30 + 1 + *local_210 * lVar35) != '\0'
                             ) goto LAB_001629bf;
                        }
                        else {
                          if (cVar15 == '\0') {
LAB_001634e8:
                            uVar12 = (uint)uVar41;
                            goto LAB_001634eb;
                          }
                          lVar30 = (long)iVar10;
                          piVar20 = (int *)((long)local_1e8 + lVar30 * 4 + *local_1b0 * lVar35 + 4);
                          *piVar20 = *piVar20 + 1;
                          if (*(char *)(local_260._24_8_ + lVar30 + 1 + *local_210 * lVar35) != '\0'
                             ) {
LAB_00162a5a:
                            lVar30 = (long)(iVar2 + -2);
                            lVar27 = (long)(int)uVar12;
                            piVar20 = (int *)((long)local_1e8 + lVar27 * 4 + *local_1b0 * lVar30 + 4
                                             );
                            *piVar20 = *piVar20 + 1;
                            if (*(char *)(local_260._24_8_ + lVar27 + 1 + *local_210 * lVar30) ==
                                '\0') {
                              piVar20 = (int *)((long)local_2b8 +
                                               lVar27 * 4 + *local_280 * lVar35 + -8);
                              *piVar20 = *piVar20 + 1;
                              uVar18 = *(undefined4 *)
                                        (local_330._24_8_ + lVar27 * 4 + *local_2e0 * lVar35 + -8);
                              piVar20 = (int *)((long)local_2b8 + lVar27 * 4 + *local_280 * lVar35);
                              *piVar20 = *piVar20 + 1;
                              *(undefined4 *)(local_330._24_8_ + lVar27 * 4 + lVar35 * *local_2e0) =
                                   uVar18;
                              goto LAB_00163954;
                            }
                            piVar20 = (int *)((long)local_1e8 + lVar27 * 4 + *local_1b0 * lVar30);
                            *piVar20 = *piVar20 + 1;
                            lVar14 = (long)(iVar2 + -3);
                            if (*(char *)(local_260._24_8_ + lVar27 + lVar30 * *local_210) != '\0')
                            goto LAB_00162ae0;
                            piVar20 = (int *)((long)local_1e8 + lVar27 * 4 + *local_1b0 * lVar14);
                            *piVar20 = *piVar20 + 1;
                            cVar15 = *(char *)(local_260._24_8_ + lVar27 + *local_210 * lVar14);
                            piVar20 = (int *)((long)local_2b8 + lVar27 * 4 + *local_280 * lVar14);
                            *piVar20 = *piVar20 + 1;
                            uVar12 = *(uint *)(local_330._24_8_ + lVar27 * 4 + lVar14 * *local_2e0);
                            if (cVar15 != '\0') {
                              piVar20 = (int *)((long)local_2b8 + lVar27 * 4 + *local_280 * lVar35);
                              *piVar20 = *piVar20 + 1;
                              *(uint *)(local_330._24_8_ + lVar27 * 4 + lVar35 * *local_2e0) =
                                   uVar12;
                              goto LAB_00163954;
                            }
                            piVar20 = (int *)((long)local_2b8 +
                                             lVar27 * 4 + *local_280 * lVar35 + -8);
                            *piVar20 = *piVar20 + 1;
                            uVar11 = *(uint *)(local_330._24_8_ +
                                              lVar27 * 4 + *local_2e0 * lVar35 + -8);
                            goto LAB_00163918;
                          }
                          lVar14 = (long)(iVar2 + -2);
                          piVar20 = (int *)((long)local_1e8 + lVar30 * 4 + *local_1b0 * lVar14 + 0xc
                                           );
                          *piVar20 = *piVar20 + 1;
                          if (*(char *)(local_260._24_8_ + lVar30 + 3 + *local_210 * lVar14) != '\0'
                             ) {
                            piVar20 = (int *)((long)local_1e8 + lVar27 * 4 + *local_1b0 * lVar14);
                            *piVar20 = *piVar20 + 1;
                            if (*(char *)(local_260._24_8_ + lVar27 + lVar14 * *local_210) != '\0')
                            goto LAB_001631e7;
LAB_0016343f:
                            lVar14 = (long)(iVar2 + -3);
                            lVar27 = (long)(int)uVar41;
                            piVar20 = (int *)((long)local_1e8 + lVar27 * 4 + *local_1b0 * lVar14);
                            *piVar20 = *piVar20 + 1;
                            cVar15 = *(char *)(local_260._24_8_ + lVar27 + *local_210 * lVar14);
                            goto joined_r0x0016347c;
                          }
                        }
                        piVar20 = (int *)((long)local_1e8 +
                                         lVar27 * 4 + *local_1b0 * (long)(iVar2 + -2));
                        *piVar20 = *piVar20 + 1;
                        lVar30 = (long)(iVar2 + -3);
                        piVar25 = (pointer)(*local_280 * lVar30 + (long)local_2b8);
                        if (*(char *)(local_260._24_8_ + lVar27 + (long)(iVar2 + -2) * *local_210)
                            != '\0') goto LAB_00163204;
                        piVar25[iVar10] = piVar25[iVar10] + 1;
                        piVar25 = (pointer)(*local_280 * lVar35 + (long)local_2b8);
                        uVar18 = *(undefined4 *)
                                  (local_330._24_8_ + (long)iVar10 * 4 + lVar30 * *local_2e0);
                        goto LAB_00163232;
                      }
                      lVar37 = *local_210;
                      local_188 = (pointer)(long)iVar10;
                      local_168 = (pointer)((long)local_188 + 2);
                      lVar28 = (long)local_188 << 0x20;
                      local_178 = (pointer)((long)local_1e8 +
                                           *local_1b0 * lVar35 + (long)local_188 * 4 + 8);
                      lVar33 = local_260._24_8_ + (long)local_188;
                      lVar34 = (long)local_188 * 4 + 8;
                      lVar40 = (long)local_188 * 4 + 8;
                      lVar24 = 8;
                      lVar32 = 0;
LAB_00161ba2:
                      local_178[lVar32] = local_178[lVar32] + 1;
                      iVar17 = (int)lVar32;
                      iVar16 = (int)local_168;
                      this = local_170;
                      local_160 = plVar42;
                      plVar43 = local_268;
                      if (*(char *)(local_260._24_8_ + (long)(lVar37 * lVar35 + (long)local_188) + 2
                                   + lVar32) == '\0') {
                        plVar42 = (long *)(ulong)(uint)(iVar16 + iVar17);
                        goto LAB_0015fb59;
                      }
                      piVar20 = (int *)((long)local_1e8 +
                                       lVar32 * 4 + *local_1b0 * lVar35 + (long)local_188 * 4 + 4);
                      *piVar20 = *piVar20 + 1;
                      if (*(char *)(lVar32 + 1 + *local_210 * lVar35 + lVar33) != '\0') {
                        plVar42 = (long *)(ulong)(uint)(iVar16 + iVar17);
LAB_00161d03:
                        iVar17 = (int)plVar42;
                        uVar21 = (ulong)iVar17;
                        piVar20 = (int *)((long)local_1e8 + uVar21 * 4 + *local_1b0 * lVar27 + 4);
                        *piVar20 = *piVar20 + 1;
                        if (*(char *)(local_260._24_8_ + uVar21 + 1 + *local_210 * lVar27) != '\0')
                        {
                          piVar20 = (int *)((long)local_1e8 + uVar21 * 4 + *local_1b0 * lVar27);
                          *piVar20 = *piVar20 + 1;
                          uVar41 = uVar21;
                          if (*(char *)(local_260._24_8_ + uVar21 + *local_210 * lVar27) != '\0') {
                            lVar37 = *local_280;
                            piVar25 = local_120;
LAB_001621a5:
                            piVar20 = (int *)((long)local_2b8 + uVar41 * 4 + lVar37 * (long)piVar25)
                            ;
                            *piVar20 = *piVar20 + 1;
                            lVar37 = *local_2e0 * (long)piVar25;
                            goto LAB_001621c4;
                          }
                          piVar20 = (int *)((long)local_1e8 +
                                           uVar21 * 4 + *local_1b0 * (long)local_130);
                          *piVar20 = *piVar20 + 1;
                          if (*(char *)(local_260._24_8_ + uVar21 + *local_210 * (long)local_130) !=
                              '\0') {
                            lVar37 = *local_280;
                            piVar25 = local_130;
                            goto LAB_001621a5;
                          }
                          piVar20 = (int *)((long)local_2b8 +
                                           uVar21 * 4 + *local_280 * (long)local_130);
                          *piVar20 = *piVar20 + 1;
                          uVar12 = *(uint *)(local_330._24_8_ +
                                            uVar21 * 4 + *local_2e0 * (long)local_130);
                          piVar20 = (int *)((long)local_2b8 + uVar21 * 4 + *local_280 * lVar35 + -8)
                          ;
                          *piVar20 = *piVar20 + 1;
                          uVar11 = *(uint *)(local_330._24_8_ +
                                            uVar21 * 4 + *local_2e0 * lVar35 + -8);
                          goto LAB_001623eb;
                        }
                        piVar20 = (int *)((long)local_1e8 + uVar21 * 4 + *local_1b0 * lVar35 + 4);
                        *piVar20 = *piVar20 + 1;
                        if (*(char *)(local_260._24_8_ + uVar21 + 1 + *local_210 * lVar35) == '\0')
                        {
                          uVar41 = (ulong)iVar17;
                          piVar20 = (int *)((long)local_2b8 + uVar41 * 4 + *local_280 * lVar35 + -8)
                          ;
                          *piVar20 = *piVar20 + 1;
                          uVar12 = *(uint *)(local_330._24_8_ +
                                            uVar41 * 4 + *local_2e0 * lVar35 + -8);
                          goto LAB_0016227f;
                        }
                        uVar41 = (ulong)iVar17;
                        piVar20 = (int *)((long)local_1e8 + uVar41 * 4 + *local_1b0 * lVar27 + 8);
                        *piVar20 = *piVar20 + 1;
                        if (*(char *)(local_260._24_8_ + uVar41 + 2 + *local_210 * lVar27) == '\0')
                        {
                          uVar41 = (ulong)iVar17;
                          piVar20 = (int *)((long)local_2b8 + uVar41 * 4 + *local_280 * lVar35 + -8)
                          ;
                          *piVar20 = *piVar20 + 1;
                          puVar13 = (undefined4 *)
                                    (local_330._24_8_ + uVar41 * 4 + *local_2e0 * lVar35 + -8);
                          piVar20 = (int *)((long)local_2b8 + uVar41 * 4 + *local_280 * lVar35);
                          local_160 = plVar42;
                          goto LAB_001611e8;
                        }
                        piVar20 = (int *)((long)local_1e8 + uVar21 * 4 + *local_1b0 * lVar30 + 4);
                        *piVar20 = *piVar20 + 1;
                        if ((*(char *)(local_260._24_8_ + uVar21 + 1 + *local_210 * lVar30) == '\0')
                           || ((piVar20 = (int *)((long)local_1e8 + uVar41 * 4 + *local_1b0 * lVar27
                                                 ), *piVar20 = *piVar20 + 1,
                               *(char *)(local_260._24_8_ + uVar41 + *local_210 * lVar27) == '\0' &&
                               (piVar20 = (int *)((long)local_1e8 + uVar41 * 4 + *local_1b0 * lVar30
                                                 ), *piVar20 = *piVar20 + 1,
                               *(char *)(local_260._24_8_ + uVar41 + *local_210 * lVar30) == '\0')))
                           ) {
                          piVar20 = (int *)((long)local_2b8 + uVar41 * 4 + *local_280 * lVar30 + 8);
                          *piVar20 = *piVar20 + 1;
                          uVar12 = *(uint *)(local_330._24_8_ + uVar41 * 4 + *local_2e0 * lVar30 + 8
                                            );
                          piVar20 = (int *)((long)local_2b8 + uVar41 * 4 + *local_280 * lVar35 + -8)
                          ;
                          *piVar20 = *piVar20 + 1;
                          uVar12 = RemSP::MemMerge(uVar12,*(uint *)(local_330._24_8_ +
                                                                   uVar41 * 4 +
                                                                   *local_2e0 * lVar35 + -8));
                        }
                        else {
                          piVar20 = (int *)((long)local_2b8 + uVar41 * 4 + *local_280 * lVar30 + 8);
                          *piVar20 = *piVar20 + 1;
                          uVar12 = *(uint *)(local_330._24_8_ + uVar41 * 4 + *local_2e0 * lVar30 + 8
                                            );
                        }
                        piVar20 = (int *)((long)local_2b8 + uVar41 * 4 + *local_280 * lVar35);
                        goto LAB_00160bfd;
                      }
                      piVar20 = (int *)((long)local_1e8 +
                                       lVar32 * 4 +
                                       *local_1b0 * (long)local_158 + (long)local_188 * 4 + 0xc);
                      *piVar20 = *piVar20 + 1;
                      if (*(char *)(lVar32 + 3 + *local_210 * (long)local_158 + lVar33) == '\0') {
                        piVar20 = (int *)((long)local_1e8 +
                                         lVar32 * 4 +
                                         (long)local_188 * 4 + *local_1b0 * lVar35 + 0xc);
                        *piVar20 = *piVar20 + 1;
                        plVar42 = (long *)((long)local_168 + lVar32);
                        uVar41 = (long)local_188 + lVar32 + 2;
                        lVar37 = lVar28 >> 0x1e;
                        if (*(char *)(local_260._24_8_ +
                                     (long)local_188 + *local_210 * lVar35 + lVar32 + 3) != '\0') {
                          piVar20 = (int *)((long)local_1e8 +
                                           (lVar28 + 0x400000000 >> 0x1e) +
                                           *local_1b0 * (long)local_158);
                          *piVar20 = *piVar20 + 1;
                          cVar15 = *(char *)(local_260._24_8_ +
                                            (lVar28 + 0x400000000 >> 0x20) +
                                            *local_210 * (long)local_158);
                          piVar20 = (int *)((long)local_1e8 +
                                           lVar32 * 4 +
                                           (long)local_188 * 4 + *local_1b0 * (long)local_158 + 8);
                          *piVar20 = *piVar20 + 1;
                          cVar1 = *(char *)(lVar32 + 2 +
                                           (long)(*local_210 * (long)local_158 + local_260._24_8_) +
                                           (long)local_188);
                          if (cVar15 != '\0') {
                            if (cVar1 == '\0') goto LAB_00162024;
                            goto LAB_0015fc73;
                          }
                          if (cVar1 != '\0') goto LAB_0015fce9;
                          piVar20 = (int *)((long)local_2b8 + lVar37 + *local_280 * lVar30);
                          *piVar20 = *piVar20 + 1;
                          uVar12 = *(uint *)(local_330._24_8_ + lVar37 + *local_2e0 * lVar30);
                          piVar20 = (int *)((long)local_2b8 +
                                           lVar24 + (long)local_188 * 4 + *local_280 * lVar35);
                          goto LAB_00160731;
                        }
                        piVar20 = (int *)((long)local_1e8 +
                                         lVar32 * 4 +
                                         (long)local_188 * 4 + *local_1b0 * (long)local_158 + 8);
                        *piVar20 = *piVar20 + 1;
                        if (*(char *)(lVar32 + 2 +
                                     (long)(*local_210 * (long)local_158 + local_260._24_8_) +
                                     (long)local_188) == '\0') {
                          piVar20 = (int *)((long)local_2b8 + lVar37 + *local_280 * lVar30);
                          *piVar20 = *piVar20 + 1;
                          lVar34 = *local_280;
                          uVar12 = *(uint *)(local_330._24_8_ + lVar37 + *local_2e0 * lVar30);
                        }
                        else {
                          piVar20 = (int *)((long)local_2b8 +
                                           lVar32 * 4 +
                                           (long)local_188 * 4 + *local_280 * lVar30 + 8);
                          *piVar20 = *piVar20 + 1;
                          lVar34 = *local_280;
                          uVar12 = *(uint *)(local_330._24_8_ +
                                            lVar32 * 4 +
                                            (long)local_188 * 4 + *local_2e0 * lVar30 + 8);
                        }
                        piVar20 = (int *)((long)local_2b8 +
                                         lVar24 + (long)local_188 * 4 + lVar34 * lVar35);
                        goto LAB_00162502;
                      }
                      piVar20 = (int *)((long)local_1e8 +
                                       lVar32 * 4 +
                                       *local_1b0 * (long)local_158 + (long)local_188 * 4 + 8);
                      *piVar20 = *piVar20 + 1;
                      if (*(char *)(lVar32 + 2 + *local_210 * (long)local_158 + lVar33) != '\0')
                      goto code_r0x00161c2e;
                      plVar42 = (long *)(ulong)(uint)(iVar16 + iVar17);
LAB_001620e9:
                      uVar41 = (ulong)(int)plVar42;
                      piVar20 = (int *)((long)local_1e8 + uVar41 * 4 + *local_1b0 * lVar30);
                      *piVar20 = *piVar20 + 1;
                      if (*(char *)(local_260._24_8_ + uVar41 + *local_210 * lVar30) == '\0') {
                        piVar25 = (pointer)(*local_280 * lVar30 + (long)local_2b8);
LAB_001621e9:
                        piVar25[uVar41 - 2] = piVar25[uVar41 - 2] + 1;
                        uVar12 = *(uint *)(local_330._24_8_ + uVar41 * 4 + *local_2e0 * lVar30 + -8)
                        ;
                        piVar20 = (int *)((long)local_2b8 + uVar41 * 4 + *local_280 * lVar30);
                        *piVar20 = *piVar20 + 1;
                        uVar11 = *(uint *)(local_330._24_8_ + uVar41 * 4 + *local_2e0 * lVar30);
LAB_001623eb:
                        uVar12 = RemSP::MemMerge(uVar12,uVar11);
                      }
                      else {
LAB_00162129:
                        piVar20 = (int *)((long)local_2b8 + uVar41 * 4 + *local_280 * lVar30);
                        *piVar20 = *piVar20 + 1;
                        lVar37 = *local_2e0 * lVar30;
LAB_001621c4:
                        uVar12 = *(uint *)(local_330._24_8_ + uVar41 * 4 + lVar37);
                      }
                    } while( true );
                  }
LAB_00162668:
                  uVar41 = (ulong)uVar12;
                  if (iVar10 < (int)uVar12) goto LAB_001626a4;
                  lVar27 = (long)(int)uVar12;
                  piVar20 = (int *)((long)local_1e8 + lVar27 * 4 + *local_1b0 * lVar35);
                  *piVar20 = *piVar20 + 1;
                  if (*(char *)(local_260._24_8_ + lVar27 + *local_210 * lVar35) == '\0')
                  goto LAB_00162f98;
                  lVar14 = (long)(iVar2 + -2);
                  lVar30 = (long)iVar17;
                  piVar20 = (int *)((long)local_1e8 + lVar30 * 4 + *local_1b0 * lVar14 + 0xc);
                  *piVar20 = *piVar20 + 1;
                  if (*(char *)(local_260._24_8_ + lVar30 + 3 + *local_210 * lVar14) == '\0') {
                    piVar20 = (int *)((long)local_2b8 + lVar30 * 4 + *local_280 * lVar35);
                    *piVar20 = *piVar20 + 1;
                    uVar18 = *(undefined4 *)(local_330._24_8_ + lVar30 * 4 + *local_2e0 * lVar35);
                    piVar20 = (int *)((long)local_2b8 + lVar27 * 4 + *local_280 * lVar35);
                    *piVar20 = *piVar20 + 1;
                    *(undefined4 *)(local_330._24_8_ + lVar27 * 4 + lVar35 * *local_2e0) = uVar18;
                    goto LAB_00163954;
                  }
                  lVar37 = (long)(iVar2 + -3);
                  piVar20 = (int *)((long)local_1e8 + lVar27 * 4 + *local_1b0 * lVar37);
                  *piVar20 = *piVar20 + 1;
                  if ((*(char *)(local_260._24_8_ + lVar27 + *local_210 * lVar37) != '\0') &&
                     (piVar20 = (int *)((long)local_1e8 + lVar30 * 4 + *local_1b0 * lVar14),
                     *piVar20 = *piVar20 + 1,
                     *(char *)(local_260._24_8_ + lVar30 + lVar14 * *local_210) != '\0'))
                  goto LAB_001628ef;
                  piVar20 = (int *)((long)local_2b8 + lVar27 * 4 + *local_280 * lVar37);
                  *piVar20 = *piVar20 + 1;
                  uVar12 = *(uint *)(local_330._24_8_ + lVar27 * 4 + lVar37 * *local_2e0);
                  piVar20 = (int *)((long)local_2b8 + lVar30 * 4 + *local_280 * lVar35);
                  *piVar20 = *piVar20 + 1;
                  uVar11 = *(uint *)(local_330._24_8_ + lVar30 * 4 + *local_2e0 * lVar35);
                  goto LAB_00163918;
                }
LAB_00162696:
                uVar41 = (ulong)uVar12;
                if (iVar17 < (int)uVar12) goto LAB_001626a4;
                lVar27 = (long)(int)uVar12;
                piVar20 = (int *)((long)local_1e8 + lVar27 * 4 + *local_1b0 * lVar35);
                *piVar20 = *piVar20 + 1;
                lVar30 = (long)(int)plVar42;
                if (*(char *)(local_260._24_8_ + lVar27 + *local_210 * lVar35) == '\0') {
                  piVar20 = (int *)((long)local_1e8 + lVar30 * 4 + *local_1b0 * lVar35 + 0xc);
                  *piVar20 = *piVar20 + 1;
                  if (*(char *)(local_260._24_8_ + lVar30 + 3 + *local_210 * lVar35) != '\0')
                  goto LAB_001631e7;
                  goto LAB_00162bf6;
                }
                piVar20 = (int *)((long)local_1e8 +
                                 lVar30 * 4 + *local_1b0 * (long)(iVar2 + -2) + 0xc);
                *piVar20 = *piVar20 + 1;
                if (*(char *)(local_260._24_8_ + lVar30 + 3 + (long)(iVar2 + -2) * *local_210) !=
                    '\0') goto LAB_001631e7;
LAB_001629bf:
                piVar20 = (int *)((long)local_2b8 + lVar30 * 4 + *local_280 * lVar35);
                *piVar20 = *piVar20 + 1;
                uVar18 = *(undefined4 *)(local_330._24_8_ + lVar30 * 4 + *local_2e0 * lVar35);
                piVar20 = (int *)((long)local_2b8 + lVar27 * 4 + *local_280 * lVar35);
                *piVar20 = *piVar20 + 1;
                goto LAB_00163235;
              }
              piVar20 = (int *)((long)local_2b8 + lVar37 * 4 + *local_280 * lVar35);
              *piVar20 = *piVar20 + 1;
              uVar12 = *(uint *)(local_330._24_8_ + lVar37 * 4 + *local_2e0 * lVar35);
              piVar20 = (int *)((long)local_2b8 + uVar41 * 4 + *local_280 * lVar35);
              plVar42 = (long *)(uVar41 & 0xffffffff);
              goto LAB_00162502;
            }
            if ((int)local_268 < (int)uVar41) {
LAB_001626a4:
              lVar27 = (long)(int)uVar41;
              piVar20 = (int *)((long)local_1e8 + lVar27 * 4 + *local_1b0 * lVar35);
              *piVar20 = *piVar20 + 1;
              if (*(char *)(local_260._24_8_ + lVar27 + *local_210 * lVar35) == '\0') {
LAB_00162bf6:
                piVar20 = (int *)((long)local_2b8 + lVar27 * 4 + *local_280 * lVar35);
                *piVar20 = *piVar20 + 1;
                *(undefined4 *)(local_330._24_8_ + lVar27 * 4 + lVar35 * *local_2e0) = 0;
                goto LAB_00163954;
              }
              piVar20 = (int *)((long)local_2b8 + lVar27 * 4 + *local_280 * lVar35 + -8);
              *piVar20 = *piVar20 + 1;
              piVar25 = (pointer)(*local_280 * lVar35 + (long)local_2b8);
              uVar18 = *(undefined4 *)(local_330._24_8_ + lVar27 * 4 + *local_2e0 * lVar35 + -8);
            }
            else {
              piVar20 = (int *)((long)local_1e8 + lVar37 * 4 + *local_1b0 * lVar35 + 8);
              *piVar20 = *piVar20 + 1;
              if (*(char *)(local_260._24_8_ + lVar37 + 2 + *local_210 * lVar35) != '\0') {
                piVar20 = (int *)((long)local_1e8 +
                                 lVar37 * 4 + *local_1b0 * (long)(iVar2 + -2) + 0xc);
                *piVar20 = *piVar20 + 1;
                if (*(char *)(local_260._24_8_ + lVar37 + 3 + (long)(iVar2 + -2) * *local_210) ==
                    '\0') {
                  piVar20 = (int *)((long)local_2b8 + lVar37 * 4 + *local_280 * lVar35);
                  *piVar20 = *piVar20 + 1;
                  uVar18 = *(undefined4 *)(local_330._24_8_ + lVar37 * 4 + *local_2e0 * lVar35);
                  piVar20 = (int *)((long)local_2b8 + lVar37 * 4 + *local_280 * lVar35 + 8);
                  *piVar20 = *piVar20 + 1;
                  *(undefined4 *)(local_330._24_8_ + lVar37 * 4 + lVar35 * *local_2e0 + 8) = uVar18;
                }
                else {
                  lVar27 = (long)(iVar2 + -3);
                  piVar20 = (int *)((long)local_1e8 + lVar37 * 4 + *local_1b0 * lVar27 + 8);
                  *piVar20 = *piVar20 + 1;
                  if (*(char *)(local_260._24_8_ + lVar37 + 2 + *local_210 * lVar27) == '\0') {
                    piVar20 = (int *)((long)local_2b8 + lVar37 * 4 + *local_280 * lVar27 + 8);
                    *piVar20 = *piVar20 + 1;
                    uVar12 = *(uint *)(local_330._24_8_ + lVar37 * 4 + lVar27 * *local_2e0 + 8);
                    piVar20 = (int *)((long)local_2b8 + lVar37 * 4 + *local_280 * lVar35);
                    *piVar20 = *piVar20 + 1;
                    uVar12 = RemSP::MemMerge(uVar12,*(uint *)(local_330._24_8_ +
                                                             lVar37 * 4 + *local_2e0 * lVar35));
                    piVar20 = (int *)((long)local_2b8 + lVar37 * 4 + *local_280 * lVar35 + 8);
                    *piVar20 = *piVar20 + 1;
                    *(uint *)(local_330._24_8_ + lVar37 * 4 + lVar35 * *local_2e0 + 8) = uVar12;
                  }
                  else {
LAB_001628ef:
                    lVar14 = (long)(iVar2 + -3);
                    lVar27 = (long)(int)uVar41;
                    piVar20 = (int *)((long)local_1e8 + lVar27 * 4 + *local_1b0 * lVar14 + -4);
                    *piVar20 = *piVar20 + 1;
                    cVar15 = *(char *)(local_260._24_8_ + lVar27 + -1 + *local_210 * lVar14);
joined_r0x0016347c:
                    if (cVar15 == '\0') {
                      piVar20 = (int *)((long)local_2b8 + lVar27 * 4 + *local_280 * lVar14 + -8);
                      *piVar20 = *piVar20 + 1;
                      uVar12 = *(uint *)(local_330._24_8_ + lVar27 * 4 + *local_2e0 * lVar14 + -8);
                      piVar20 = (int *)((long)local_2b8 + lVar27 * 4 + *local_280 * lVar14);
                      *piVar20 = *piVar20 + 1;
                      uVar11 = *(uint *)(local_330._24_8_ + lVar27 * 4 + lVar14 * *local_2e0);
LAB_00163918:
                      uVar12 = RemSP::MemMerge(uVar12,uVar11);
                      piVar20 = (int *)((long)local_2b8 + lVar27 * 4 + *local_280 * lVar35);
                      *piVar20 = *piVar20 + 1;
                      *(uint *)(local_330._24_8_ + lVar27 * 4 + lVar35 * *local_2e0) = uVar12;
                    }
                    else {
LAB_00162ae0:
                      piVar20 = (int *)((long)local_2b8 + lVar27 * 4 + *local_280 * lVar14);
                      *piVar20 = *piVar20 + 1;
                      uVar18 = *(undefined4 *)(local_330._24_8_ + lVar27 * 4 + lVar14 * *local_2e0);
                      piVar20 = (int *)((long)local_2b8 + lVar27 * 4 + *local_280 * lVar35);
                      *piVar20 = *piVar20 + 1;
                      *(undefined4 *)(local_330._24_8_ + lVar27 * 4 + lVar35 * *local_2e0) = uVar18;
                    }
                  }
                }
                goto LAB_00163954;
              }
LAB_00162f98:
              lVar27 = (long)(int)uVar41;
              piVar20 = (int *)((long)local_1e8 + lVar27 * 4 + *local_1b0 * lVar35 + 4);
              *piVar20 = *piVar20 + 1;
              if (*(char *)(local_260._24_8_ + lVar27 + 1 + *local_210 * lVar35) == '\0') {
                piVar20 = (int *)((long)local_2b8 + lVar27 * 4 + *local_280 * lVar35);
                *piVar20 = *piVar20 + 1;
                *(undefined4 *)(local_330._24_8_ + lVar27 * 4 + lVar35 * *local_2e0) = 0;
                goto LAB_00163954;
              }
              piVar20 = (int *)((long)local_1e8 + lVar27 * 4 + *local_1b0 * (long)(iVar2 + -2) + 4);
              *piVar20 = *piVar20 + 1;
              uVar12 = RemSP::length_;
              if (*(char *)(local_260._24_8_ + lVar27 + 1 + (long)(iVar2 + -2) * *local_210) == '\0'
                 ) {
                lVar30 = (long)(int)RemSP::length_;
                RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar30] =
                     RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar30] + 1;
                RemSP::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start[lVar30] = uVar12;
                uVar12 = RemSP::length_;
                RemSP::length_ = RemSP::length_ + 1;
                piVar20 = (int *)((long)local_2b8 + lVar27 * 4 + *local_280 * lVar35);
                *piVar20 = *piVar20 + 1;
                *(uint *)(local_330._24_8_ + lVar27 * 4 + lVar35 * *local_2e0) = uVar12;
                goto LAB_00163954;
              }
LAB_001631e7:
              lVar30 = (long)(iVar2 + -3);
              piVar25 = (pointer)(*local_280 * lVar30 + (long)local_2b8);
LAB_00163204:
              piVar25[lVar27] = piVar25[lVar27] + 1;
              piVar25 = (pointer)(*local_280 * lVar35 + (long)local_2b8);
              uVar18 = *(undefined4 *)(local_330._24_8_ + lVar27 * 4 + lVar30 * *local_2e0);
            }
LAB_00163232:
            piVar25[lVar27] = piVar25[lVar27] + 1;
LAB_00163235:
            *(undefined4 *)(local_330._24_8_ + lVar27 * 4 + lVar35 * *local_2e0) = uVar18;
            goto LAB_00163954;
          }
          piVar20 = (int *)((long)local_1e8 + uVar41 * 4 + *local_1b0 * lVar27);
          *piVar20 = *piVar20 + 1;
          uVar12 = RemSP::length_;
          if (*(char *)(local_260._24_8_ + uVar41 + *local_210 * lVar27) == '\0') {
            lVar37 = (long)(int)RemSP::length_;
            RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[lVar37] =
                 RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar37] + 1;
            RemSP::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start[lVar37] = uVar12;
            lVar37 = *local_280;
            uVar12 = RemSP::length_;
            RemSP::length_ = RemSP::length_ + 1;
          }
          else {
            piVar20 = (int *)((long)local_2b8 + uVar41 * 4 + *local_280 * (long)local_190);
            *piVar20 = *piVar20 + 1;
            uVar12 = *(uint *)(local_330._24_8_ + uVar41 * 4 + *local_2e0 * (long)local_190);
LAB_0016227f:
            lVar37 = *local_280;
          }
          piVar20 = (int *)((long)local_2b8 + uVar41 * 4 + lVar37 * lVar35);
LAB_00162502:
          *piVar20 = *piVar20 + 1;
          iVar10 = (int)plVar42;
          *(uint *)(local_330._24_8_ + uVar41 * 4 + *local_2e0 * lVar35) = uVar12;
          uVar12 = iVar10 + 2;
          plVar42 = (long *)(ulong)uVar12;
          iVar17 = (int)plVar43;
        } while ((int)uVar12 < iVar17);
      }
      lVar27 = (long)(int)local_180;
      lVar30 = (long)(int)uVar12;
      piVar20 = (int *)((long)local_1e8 + lVar30 * 4 + *local_1b0 * lVar27);
      *piVar20 = *piVar20 + 1;
      cVar15 = *(char *)(local_260._24_8_ + lVar30 + *local_210 * lVar27);
      if (iVar17 < (int)uVar12) {
        if (cVar15 == '\0') {
LAB_00163622:
          piVar20 = (int *)((long)local_2b8 + lVar30 * 4 + *local_280 * lVar27);
          *piVar20 = *piVar20 + 1;
          *(undefined4 *)(local_330._24_8_ + lVar30 * 4 + lVar27 * *local_2e0) = 0;
        }
        else {
LAB_00163572:
          lVar27 = (long)(int)uVar12;
          piVar20 = (int *)((long)local_1e8 + lVar27 * 4 + *local_1b0 * (long)(iVar2 + -2));
          *piVar20 = *piVar20 + 1;
          uVar12 = RemSP::length_;
          if (*(char *)(local_260._24_8_ + lVar27 + (long)(iVar2 + -2) * *local_210) != '\0')
          goto LAB_001635b3;
          lVar30 = (long)(int)RemSP::length_;
          RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[lVar30] =
               RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[lVar30] + 1;
          RemSP::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
          .super__Vector_impl_data._M_start[lVar30] = uVar12;
          uVar12 = RemSP::length_;
          RemSP::length_ = RemSP::length_ + 1;
          piVar20 = (int *)((long)local_2b8 + lVar27 * 4 + *local_280 * (long)(int)local_180);
          *piVar20 = *piVar20 + 1;
          *(uint *)(local_330._24_8_ + lVar27 * 4 + (long)(int)local_180 * *local_2e0) = uVar12;
        }
      }
      else {
        if (cVar15 == '\0') {
LAB_001634eb:
          lVar27 = (long)(int)local_180;
          lVar30 = (long)(int)uVar12;
          piVar20 = (int *)((long)local_1e8 + lVar30 * 4 + *local_1b0 * lVar27 + 4);
          *piVar20 = *piVar20 + 1;
          if (*(char *)(local_260._24_8_ + lVar30 + 1 + *local_210 * lVar27) == '\0')
          goto LAB_00163622;
        }
        lVar27 = (long)(int)uVar12;
        piVar20 = (int *)((long)local_1e8 + lVar27 * 4 + *local_1b0 * (long)(iVar2 + -2) + 4);
        *piVar20 = *piVar20 + 1;
        if (*(char *)(local_260._24_8_ + lVar27 + 1 + (long)(iVar2 + -2) * *local_210) == '\0')
        goto LAB_00163572;
LAB_001635b3:
        piVar20 = (int *)((long)local_2b8 + lVar27 * 4 + *local_280 * (long)(iVar2 + -3));
        *piVar20 = *piVar20 + 1;
        uVar18 = *(undefined4 *)(local_330._24_8_ + lVar27 * 4 + (long)(iVar2 + -3) * *local_2e0);
        piVar20 = (int *)((long)local_2b8 + lVar27 * 4 + *local_280 * (long)(int)local_180);
        *piVar20 = *piVar20 + 1;
        *(undefined4 *)(local_330._24_8_ + lVar27 * 4 + (long)(int)local_180 * *local_2e0) = uVar18;
      }
    }
    goto LAB_00163954;
  }
  if (2 < iVar3) {
    iVar10 = -2;
    iVar16 = 0;
LAB_001566c7:
    lVar27 = (long)iVar16;
    piVar20 = (int *)((long)local_1e8 + lVar27 * 4);
    *piVar20 = *piVar20 + 1;
    if (*(char *)(local_260._24_8_ + lVar27) == '\0') goto LAB_00156718;
    piVar20 = (int *)((long)local_1e8 + (long)iVar10 * 4 + 0xc);
    *piVar20 = *piVar20 + 1;
    uVar12 = RemSP::length_;
    cVar15 = *(char *)(local_260._24_8_ + (long)iVar10 + 3);
    lVar30 = (long)(int)RemSP::length_;
    piVar25[lVar30] = piVar25[lVar30] + 1;
    puVar6[lVar30] = uVar12;
    uVar12 = RemSP::length_;
    RemSP::length_ = RemSP::length_ + 1;
    local_2b8[lVar27] = local_2b8[lVar27] + 1;
    *(uint *)(local_330._24_8_ + lVar27 * 4) = uVar12;
    iVar10 = iVar16;
    if (cVar15 == '\0') goto LAB_0015684f;
    while (iVar10 = iVar16 + 2, iVar29 = iVar16, iVar16 + 2 < iVar17) {
      lVar14 = (long)iVar16;
      lVar27 = lVar14 + 2;
      lVar35 = lVar14 << 0x20;
      lVar30 = 0;
      while (piVar20 = (int *)((long)local_1e8 + lVar30 * 4 + lVar14 * 4 + 8),
            *piVar20 = *piVar20 + 1, *(char *)(local_260._24_8_ + lVar30 + lVar14 + 2) != '\0') {
        piVar20 = (int *)((long)local_1e8 + lVar30 * 4 + lVar14 * 4 + 0xc);
        *piVar20 = *piVar20 + 1;
        if (*(char *)(local_260._24_8_ + lVar30 + lVar14 + 3) == '\0') {
          piVar20 = (int *)((long)local_2b8 + (lVar35 >> 0x1e));
          *piVar20 = *piVar20 + 1;
          lVar27 = lVar27 + lVar30;
          iVar10 = *(int *)(local_330._24_8_ + (lVar35 >> 0x1e));
          iVar16 = (int)lVar27;
          goto LAB_0015683c;
        }
        local_2b8[lVar14 + lVar30] = local_2b8[lVar14 + lVar30] + 1;
        iVar10 = *(pointer)(local_330._24_8_ + (lVar14 + lVar30) * 4);
        local_2b8[lVar14 + lVar30 + 2] = local_2b8[lVar14 + lVar30 + 2] + 1;
        *(int *)(local_330._24_8_ + (lVar14 + lVar30 + 2) * 4) = iVar10;
        lVar35 = lVar35 + 0x200000000;
        lVar37 = lVar27 + lVar30;
        lVar30 = lVar30 + 2;
        if ((long)iVar17 <= lVar37 + 2) {
          iVar10 = iVar16 + (int)lVar30 + 2;
          iVar29 = iVar16 + (int)lVar30;
          goto LAB_00156e16;
        }
      }
      iVar16 = (int)lVar27 + (int)lVar30;
LAB_00156718:
      lVar27 = (long)iVar16;
      piVar20 = (int *)((long)local_1e8 + lVar27 * 4 + 4);
      *piVar20 = *piVar20 + 1;
      uVar12 = RemSP::length_;
      if (*(char *)(local_260._24_8_ + lVar27 + 1) == '\0') goto LAB_001567eb;
      lVar30 = (long)(int)RemSP::length_;
      piVar25[lVar30] = piVar25[lVar30] + 1;
      puVar6[lVar30] = uVar12;
      uVar12 = RemSP::length_;
      RemSP::length_ = RemSP::length_ + 1;
      local_2b8[lVar27] = local_2b8[lVar27] + 1;
      *(uint *)(local_330._24_8_ + lVar27 * 4) = uVar12;
    }
LAB_00156e16:
    iVar16 = iVar10;
    lVar27 = (long)iVar16;
    piVar20 = (int *)((long)local_1e8 + lVar27 * 4);
    *piVar20 = *piVar20 + 1;
    if (iVar17 < iVar16) {
      if (*(char *)(local_260._24_8_ + lVar27) == '\0') {
        local_2b8[lVar27] = local_2b8[lVar27] + 1;
        *(int *)(local_330._24_8_ + lVar27 * 4) = 0;
        goto LAB_00163954;
      }
    }
    else {
      if (*(char *)(local_260._24_8_ + lVar27) == '\0') goto LAB_00156fbf;
      piVar20 = (int *)((long)local_1e8 + (long)iVar29 * 4 + 0xc);
      *piVar20 = *piVar20 + 1;
    }
    local_2b8[iVar29] = local_2b8[iVar29] + 1;
    iVar17 = *(pointer)(local_330._24_8_ + (long)iVar29 * 4);
    local_2b8[lVar27] = local_2b8[lVar27] + 1;
    *(int *)(local_330._24_8_ + lVar27 * 4) = iVar17;
    goto LAB_00163954;
  }
  iVar16 = 0;
  lVar27 = 1;
  goto LAB_00156dc5;
LAB_0015c5b0:
  piVar20 = (int *)((long)local_2b8 + lVar32 + *local_280 * (long)piVar36);
  *piVar20 = *piVar20 + 1;
  uVar12 = *(uint *)(local_330._24_8_ + lVar32 + *local_2e0 * (long)piVar36);
  piVar20 = (int *)((long)local_2b8 + lVar28 + (long)piVar31 * 4 + *local_280 * (long)piVar36);
  piVar39 = (pointer)((long)piVar31 + lVar40 + 2);
  piVar31 = (pointer)(ulong)(uint)(iVar16 + iVar10);
LAB_0015d070:
  do {
    *piVar20 = *piVar20 + 1;
    *(uint *)(local_330._24_8_ + (long)piVar39 * 4 + *local_2e0 * (long)piVar36) = uVar12;
    lVar35 = (long)(int)piVar31;
    piVar39 = (pointer)(lVar35 + 2);
    iVar17 = (int)piVar39;
    if ((int)plVar43 <= iVar17) {
      piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + *local_1b0 * (long)piVar36 + 8);
      *piVar20 = *piVar20 + 1;
      cVar15 = *(char *)(local_260._24_8_ + lVar35 + 2 + *local_210 * (long)piVar36);
      if ((int)plVar43 < iVar17) {
        if (cVar15 == '\0') {
          piVar19 = (pointer)((ulong)piVar39 & 0xffffffff);
LAB_0015d8de:
          iVar17 = (int)piVar19;
          piVar38 = (pointer)(long)iVar17;
          piVar20 = (int *)((long)local_1e8 + (long)piVar38 * 4 + *local_1b0 * ((ulong)piVar36 | 1))
          ;
          *piVar20 = *piVar20 + 1;
          if (*(char *)((long)piVar38 + (long)(((ulong)piVar36 | 1) * *local_210 + local_260._24_8_)
                       ) == '\0') goto LAB_0015e87f;
LAB_0015d923:
          piVar38 = (pointer)(long)iVar17;
          piVar20 = (int *)((long)local_1e8 +
                           (long)piVar38 * 4 + *local_1b0 * ((ulong)piVar36 | 1) + -4);
          *piVar20 = *piVar20 + 1;
          uVar12 = RemSP::length_;
          if (*(char *)(local_260._24_8_ + (long)piVar38 + ((ulong)piVar36 | 1) * *local_210 + -1)
              != '\0') goto LAB_0015ea2f;
          lVar35 = (long)(int)RemSP::length_;
          RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[lVar35] =
               RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[lVar35] + 1;
          RemSP::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
          .super__Vector_impl_data._M_start[lVar35] = uVar12;
          piVar19 = (pointer)(*local_280 * (long)piVar36 + (long)local_2b8);
          piVar38 = (pointer)(long)iVar17;
          uVar11 = RemSP::length_;
          RemSP::length_ = RemSP::length_ + 1;
          goto LAB_0015f01b;
        }
        piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + *local_1b0 * ((ulong)piVar36 | 1) + 4);
        *piVar20 = *piVar20 + 1;
        if (*(char *)(local_260._24_8_ + lVar35 + 1 + ((ulong)piVar36 | 1) * *local_210) == '\0') {
          piVar19 = (pointer)((ulong)piVar39 & 0xffffffff);
          goto LAB_001573a9;
        }
      }
      else {
        if (cVar15 == '\0') {
          piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + *local_1b0 * ((ulong)piVar36 | 1) + 8);
          *piVar20 = *piVar20 + 1;
          if (*(char *)(local_260._24_8_ + lVar35 + 2 + ((ulong)piVar36 | 1) * *local_210) == '\0')
          {
            piVar31 = (pointer)((ulong)piVar39 & 0xffffffff);
            goto LAB_0015808c;
          }
          piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + *local_1b0 * (long)piVar36 + 0xc);
          *piVar20 = *piVar20 + 1;
          if (*(char *)(local_260._24_8_ + lVar35 + 3 + *local_210 * (long)piVar36) == '\0')
          goto LAB_0015d923;
        }
        piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + *local_1b0 * ((ulong)piVar36 | 1) + 4);
        *piVar20 = *piVar20 + 1;
        if (*(char *)(local_260._24_8_ + lVar35 + 1 + ((ulong)piVar36 | 1) * *local_210) == '\0') {
          piVar31 = (pointer)((ulong)piVar39 & 0xffffffff);
          goto LAB_00157278;
        }
        lVar37 = (long)piVar36 + -1;
        piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + *local_1b0 * lVar37 + 0xc);
        *piVar20 = *piVar20 + 1;
        if (*(char *)(local_260._24_8_ + lVar35 + 3 + *local_210 * lVar37) != '\0') {
          piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + *local_1b0 * lVar37);
          *piVar20 = *piVar20 + 1;
          if (*(char *)(local_260._24_8_ + lVar35 + lVar37 * *local_210) != '\0') {
LAB_0015d3b1:
            uVar12 = (uint)piVar39;
            piVar38 = (pointer)(long)(int)uVar12;
            piVar20 = (int *)((long)local_1e8 +
                             (long)piVar38 * 4 + *local_1b0 * ((long)piVar36 + -2) + -4);
            *piVar20 = *piVar20 + 1;
            if (*(char *)(local_260._24_8_ + (long)piVar38 + *local_210 * ((long)piVar36 + -2) + -1)
                == '\0') goto LAB_00159746;
            goto LAB_0015e9a6;
          }
LAB_0015ab41:
          piVar20 = (int *)((long)local_2b8 + lVar35 * 4 + *local_280 * ((long)piVar36 + -2) + 8);
          *piVar20 = *piVar20 + 1;
          uVar12 = *(uint *)(local_330._24_8_ + lVar35 * 4 + ((long)piVar36 + -2) * *local_2e0 + 8);
          piVar20 = (int *)((long)local_2b8 + lVar35 * 4 + *local_280 * (long)piVar36);
          *piVar20 = *piVar20 + 1;
          uVar11 = RemSP::MemMerge(uVar12,*(uint *)(local_330._24_8_ +
                                                   lVar35 * 4 + *local_2e0 * (long)piVar36));
          piVar20 = (int *)((long)local_2b8 + lVar35 * 4 + *local_280 * (long)piVar36 + 8);
          *piVar20 = *piVar20 + 1;
          piVar38 = piVar39;
LAB_0015af35:
          lVar35 = *local_2e0;
          goto LAB_0015f02f;
        }
      }
      piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + *local_1b0 * ((long)piVar36 + -1) + 8);
      *piVar20 = *piVar20 + 1;
      if (*(char *)(local_260._24_8_ + lVar35 + 2 + ((long)piVar36 + -1) * *local_210) != '\0')
      goto LAB_0015d68e;
      piVar20 = (int *)((long)local_2b8 + lVar35 * 4 + *local_280 * (long)piVar36);
      *piVar20 = *piVar20 + 1;
      uVar11 = *(uint *)(local_330._24_8_ + lVar35 * 4 + *local_2e0 * (long)piVar36);
      piVar20 = (int *)((long)local_2b8 + lVar35 * 4 + *local_280 * (long)piVar36 + 8);
      *piVar20 = *piVar20 + 1;
      piVar38 = piVar39;
      goto LAB_0015d7fa;
    }
    piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + *local_1b0 * (long)piVar36 + 8);
    *piVar20 = *piVar20 + 1;
    uVar41 = (ulong)piVar36 | 1;
    if (*(char *)(local_260._24_8_ + lVar35 + 2 + *local_210 * (long)piVar36) == '\0') {
      piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + *local_1b0 * uVar41 + 8);
      *piVar20 = *piVar20 + 1;
      if (*(char *)(local_260._24_8_ + lVar35 + 2 + *local_210 * uVar41) == '\0') {
        piVar31 = (pointer)((ulong)piVar39 & 0xffffffff);
        goto LAB_001575fb;
      }
      piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + *local_1b0 * (long)piVar36 + 0xc);
      *piVar20 = *piVar20 + 1;
      if (*(char *)(local_260._24_8_ + lVar35 + 3 + *local_210 * (long)piVar36) == '\0') {
        piVar31 = (pointer)((ulong)piVar39 & 0xffffffff);
        goto LAB_00158d93;
      }
      piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + *local_1b0 * uVar41 + 4);
      *piVar20 = *piVar20 + 1;
      if (*(char *)(local_260._24_8_ + lVar35 + 1 + uVar41 * *local_210) == '\0') {
        piVar31 = (pointer)((ulong)piVar39 & 0xffffffff);
        goto LAB_0015763b;
      }
      lVar37 = (long)piVar36 + -1;
      piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + *local_1b0 * lVar37 + 0xc);
      *piVar20 = *piVar20 + 1;
      if (*(char *)(local_260._24_8_ + lVar35 + 3 + *local_210 * lVar37) != '\0') {
        piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + *local_1b0 * lVar37);
        *piVar20 = *piVar20 + 1;
        if (*(char *)(local_260._24_8_ + lVar35 + lVar37 * *local_210) == '\0') goto LAB_0015acaa;
        goto LAB_0015d598;
      }
    }
    else {
      piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + *local_1b0 * uVar41 + 4);
      *piVar20 = *piVar20 + 1;
      if (*(char *)(local_260._24_8_ + lVar35 + 1 + uVar41 * *local_210) == '\0') {
        piVar19 = (pointer)((ulong)piVar39 & 0xffffffff);
        goto LAB_00157318;
      }
      lVar37 = (long)piVar36 + -1;
      piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + *local_1b0 * lVar37 + 0xc);
      *piVar20 = *piVar20 + 1;
      if (*(char *)(local_260._24_8_ + lVar35 + 3 + *local_210 * lVar37) != '\0') {
        piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + *local_1b0 * lVar37);
        *piVar20 = *piVar20 + 1;
        if (*(char *)(local_260._24_8_ + lVar35 + lVar37 * *local_210) == '\0') {
LAB_0015aa30:
          piVar20 = (int *)((long)local_2b8 + lVar35 * 4 + *local_280 * ((long)piVar36 + -2) + 8);
          *piVar20 = *piVar20 + 1;
          uVar12 = *(uint *)(local_330._24_8_ + lVar35 * 4 + ((long)piVar36 + -2) * *local_2e0 + 8);
          piVar20 = (int *)((long)local_2b8 + lVar35 * 4 + *local_280 * (long)piVar36);
          *piVar20 = *piVar20 + 1;
          uVar12 = RemSP::MemMerge(uVar12,*(uint *)(local_330._24_8_ +
                                                   lVar35 * 4 + *local_2e0 * (long)piVar36));
          piVar19 = (pointer)((ulong)piVar39 & 0xffffffff);
          goto LAB_0015e2f2;
        }
LAB_0015d1a4:
        piVar19 = (pointer)((ulong)piVar39 & 0xffffffff);
        piVar39 = (pointer)(long)(int)piVar39;
        piVar20 = (int *)((long)local_1e8 +
                         (long)piVar39 * 4 + *local_1b0 * ((long)piVar36 + -2) + -4);
        *piVar20 = *piVar20 + 1;
        if (*(char *)(local_260._24_8_ + (long)piVar39 + *local_210 * ((long)piVar36 + -2) + -1) ==
            '\0') goto LAB_0015d1ea;
LAB_0015ce08:
        piVar39 = (pointer)(long)(int)piVar19;
        piVar20 = (int *)((long)local_1e8 + (long)piVar39 * 4 + *local_1b0 * ((long)piVar36 + -1));
        *piVar20 = *piVar20 + 1;
        if (*(char *)((long)piVar39 + (long)(((long)piVar36 + -1) * *local_210 + local_260._24_8_))
            != '\0') goto LAB_0015e2c2;
        piVar20 = (int *)((long)local_1e8 + (long)piVar39 * 4 + *local_1b0 * ((long)piVar36 + -2));
        *piVar20 = *piVar20 + 1;
        cVar15 = *(char *)((long)piVar39 +
                          (long)(*local_210 * ((long)piVar36 + -2) + local_260._24_8_));
        goto joined_r0x0015ce86;
      }
      piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + *local_1b0 * (long)piVar36 + 0xc);
      *piVar20 = *piVar20 + 1;
      if (*(char *)(local_260._24_8_ + lVar35 + 3 + *local_210 * (long)piVar36) == '\0') {
        piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + *local_1b0 * lVar37 + 8);
        *piVar20 = *piVar20 + 1;
        if (*(char *)(local_260._24_8_ + lVar35 + 2 + *local_210 * lVar37) != '\0') {
          piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + *local_1b0 * lVar37);
          *piVar20 = *piVar20 + 1;
          if (*(char *)(local_260._24_8_ + lVar35 + lVar37 * *local_210) != '\0') goto LAB_0015dd6b;
          piVar20 = (int *)((long)local_2b8 + lVar35 * 4 + *local_280 * ((long)piVar36 + -2) + 8);
          *piVar20 = *piVar20 + 1;
          uVar12 = *(uint *)(local_330._24_8_ + lVar35 * 4 + ((long)piVar36 + -2) * *local_2e0 + 8);
          piVar20 = (int *)((long)local_2b8 + lVar35 * 4 + *local_280 * (long)piVar36);
          *piVar20 = *piVar20 + 1;
          uVar12 = RemSP::MemMerge(uVar12,*(uint *)(local_330._24_8_ +
                                                   lVar35 * 4 + *local_2e0 * (long)piVar36));
          piVar19 = (pointer)((ulong)piVar39 & 0xffffffff);
          goto LAB_0015a27d;
        }
        piVar20 = (int *)((long)local_2b8 + lVar35 * 4 + *local_280 * (long)piVar36);
        *piVar20 = *piVar20 + 1;
        piVar19 = (pointer)((ulong)piVar39 & 0xffffffff);
        uVar12 = *(uint *)(local_330._24_8_ + lVar35 * 4 + *local_2e0 * (long)piVar36);
        goto LAB_001585f3;
      }
    }
    lVar37 = (long)piVar36 + -1;
    piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + *local_1b0 * lVar37 + 0x10);
    *piVar20 = *piVar20 + 1;
    if (*(char *)(local_260._24_8_ + lVar35 + 4 + *local_210 * lVar37) != '\0') {
      lVar34 = (long)piVar36 + -2;
      piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + *local_1b0 * lVar34 + 0xc);
      *piVar20 = *piVar20 + 1;
      if (*(char *)(local_260._24_8_ + lVar35 + 3 + *local_210 * lVar34) != '\0') {
        piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + *local_1b0 * lVar37);
        *piVar20 = *piVar20 + 1;
        if (*(char *)(local_260._24_8_ + lVar35 + lVar37 * *local_210) == '\0') goto LAB_0015adc0;
LAB_0015db33:
        piVar31 = (pointer)((ulong)piVar39 & 0xffffffff);
        lVar35 = (long)piVar36 + -2;
        piVar39 = (pointer)(long)(int)piVar39;
        piVar20 = (int *)((long)local_1e8 + (long)piVar39 * 4 + *local_1b0 * lVar35 + -4);
        *piVar20 = *piVar20 + 1;
        if (*(char *)(local_260._24_8_ + (long)piVar39 + *local_210 * lVar35 + -1) != '\0')
        goto LAB_0015cf5c;
        piVar20 = (int *)((long)local_2b8 + (long)piVar39 * 4 + *local_280 * lVar35 + 8);
        *piVar20 = *piVar20 + 1;
        uVar12 = *(uint *)(local_330._24_8_ + (long)piVar39 * 4 + lVar35 * *local_2e0 + 8);
        piVar20 = (int *)((long)local_2b8 + (long)piVar39 * 4 + *local_280 * (long)piVar36 + -8);
        *piVar20 = *piVar20 + 1;
        piVar19 = piVar31;
        goto LAB_0015dc91;
      }
      piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + *local_1b0 * lVar37 + 8);
      *piVar20 = *piVar20 + 1;
      if (*(char *)(local_260._24_8_ + lVar35 + 2 + *local_210 * lVar37) == '\0') goto LAB_0015adc0;
      piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + *local_1b0 * lVar37);
      *piVar20 = *piVar20 + 1;
      piVar31 = piVar39;
      if (*(char *)(local_260._24_8_ + lVar35 + lVar37 * *local_210) == '\0') {
        piVar20 = (int *)((long)local_2b8 + lVar35 * 4 + *local_280 * lVar34 + 8);
        *piVar20 = *piVar20 + 1;
        uVar12 = *(uint *)(local_330._24_8_ + lVar35 * 4 + *local_2e0 * lVar34 + 8);
        piVar20 = (int *)((long)local_2b8 + lVar35 * 4 + *local_280 * lVar34 + 0x10);
        *piVar20 = *piVar20 + 1;
        uVar12 = RemSP::MemMerge(uVar12,*(uint *)(local_330._24_8_ +
                                                 lVar35 * 4 + lVar34 * *local_2e0 + 0x10));
        piVar20 = (int *)((long)local_2b8 + lVar35 * 4 + *local_280 * (long)piVar36);
        *piVar20 = *piVar20 + 1;
        uVar11 = *(uint *)(local_330._24_8_ + lVar35 * 4 + *local_2e0 * (long)piVar36);
        goto LAB_0015ae25;
      }
LAB_0015dee2:
      lVar35 = (long)piVar36 + -2;
      iVar17 = (int)piVar31;
      lVar37 = (long)iVar17;
      piVar20 = (int *)((long)local_1e8 + lVar37 * 4 + *local_1b0 * lVar35 + -4);
      *piVar20 = *piVar20 + 1;
      if (*(char *)(local_260._24_8_ + lVar37 + -1 + *local_210 * lVar35) == '\0') {
        lVar37 = (long)iVar17;
        piVar20 = (int *)((long)local_2b8 + lVar37 * 4 + *local_280 * lVar35);
        *piVar20 = *piVar20 + 1;
        uVar12 = *(uint *)(local_330._24_8_ + lVar37 * 4 + *local_2e0 * lVar35);
        piVar20 = (int *)((long)local_2b8 + lVar37 * 4 + *local_280 * lVar35 + 8);
        *piVar20 = *piVar20 + 1;
        uVar12 = RemSP::MemMerge(uVar12,*(uint *)(local_330._24_8_ +
                                                 lVar37 * 4 + lVar35 * *local_2e0 + 8));
        piVar20 = (int *)((long)local_2b8 + lVar37 * 4 + *local_280 * (long)piVar36 + -8);
        *piVar20 = *piVar20 + 1;
        uVar11 = *(uint *)(local_330._24_8_ + lVar37 * 4 + *local_2e0 * (long)piVar36 + -8);
      }
      else {
        piVar20 = (int *)((long)local_2b8 + lVar37 * 4 + *local_280 * lVar35 + 8);
        *piVar20 = *piVar20 + 1;
        uVar12 = *(uint *)(local_330._24_8_ + lVar37 * 4 + lVar35 * *local_2e0 + 8);
        piVar20 = (int *)((long)local_2b8 + lVar37 * 4 + *local_280 * (long)piVar36 + -8);
        *piVar20 = *piVar20 + 1;
        uVar11 = *(uint *)(local_330._24_8_ + lVar37 * 4 + *local_2e0 * (long)piVar36 + -8);
      }
      piVar39 = (pointer)(long)iVar17;
      uVar12 = RemSP::MemMerge(uVar12,uVar11);
      piVar20 = (int *)((long)local_2b8 + (long)piVar39 * 4 + *local_280 * (long)piVar36);
      goto LAB_0015b43b;
    }
    piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + *local_1b0 * lVar37 + 8);
    *piVar20 = *piVar20 + 1;
    if (*(char *)(local_260._24_8_ + lVar35 + 2 + *local_210 * lVar37) == '\0') {
      piVar20 = (int *)((long)local_2b8 + lVar35 * 4 + *local_280 * (long)piVar36);
      *piVar20 = *piVar20 + 1;
      piVar19 = (pointer)(*local_280 * (long)piVar36 + (long)local_2b8);
      uVar12 = *(uint *)(local_330._24_8_ + lVar35 * 4 + *local_2e0 * (long)piVar36);
      goto LAB_0015e0ed;
    }
    piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + *local_1b0 * lVar37);
    *piVar20 = *piVar20 + 1;
    if (*(char *)(local_260._24_8_ + lVar35 + lVar37 * *local_210) == '\0') {
      piVar20 = (int *)((long)local_2b8 + lVar35 * 4 + *local_280 * ((long)piVar36 + -2) + 8);
      *piVar20 = *piVar20 + 1;
      uVar12 = *(uint *)(local_330._24_8_ + lVar35 * 4 + ((long)piVar36 + -2) * *local_2e0 + 8);
      piVar20 = (int *)((long)local_2b8 + lVar35 * 4 + *local_280 * (long)piVar36);
      *piVar20 = *piVar20 + 1;
      uVar12 = RemSP::MemMerge(uVar12,*(uint *)(local_330._24_8_ +
                                               lVar35 * 4 + *local_2e0 * (long)piVar36));
      piVar31 = (pointer)((ulong)piVar39 & 0xffffffff);
      goto LAB_001577e7;
    }
LAB_0015de2f:
    piVar31 = (pointer)((ulong)piVar39 & 0xffffffff);
    piVar39 = (pointer)(long)(int)piVar39;
    piVar20 = (int *)((long)local_1e8 + (long)piVar39 * 4 + *local_1b0 * ((long)piVar36 + -2) + -4);
    *piVar20 = *piVar20 + 1;
    if (*(char *)(local_260._24_8_ + (long)piVar39 + *local_210 * ((long)piVar36 + -2) + -1) != '\0'
       ) goto LAB_001577b9;
LAB_00158b51:
    piVar20 = (int *)((long)local_2b8 + (long)piVar39 * 4 + *local_280 * ((long)piVar36 + -2));
    *piVar20 = *piVar20 + 1;
    uVar12 = *(uint *)(local_330._24_8_ + (long)piVar39 * 4 + ((long)piVar36 + -2) * *local_2e0);
    piVar20 = (int *)((long)local_2b8 + (long)piVar39 * 4 + *local_280 * (long)piVar36 + -8);
    *piVar20 = *piVar20 + 1;
    uVar12 = RemSP::MemMerge(uVar12,*(uint *)(local_330._24_8_ +
                                             (long)piVar39 * 4 + *local_2e0 * (long)piVar36 + -8));
LAB_001577e7:
    piVar20 = (int *)((long)local_2b8 + (long)piVar39 * 4 + *local_280 * (long)piVar36);
    *piVar20 = *piVar20 + 1;
    *(uint *)(local_330._24_8_ + (long)piVar39 * 4 + *local_2e0 * (long)piVar36) = uVar12;
    lVar35 = (long)(int)piVar31;
    piVar39 = (pointer)(lVar35 + 2);
    if ((int)plVar43 <= (int)piVar39) {
      if ((int)plVar43 < (int)piVar39) goto LAB_0015c07b;
      piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + *local_1b0 * (long)piVar36 + 8);
      *piVar20 = *piVar20 + 1;
      piVar38 = piVar39;
      if (*(char *)(local_260._24_8_ + lVar35 + 2 + *local_210 * (long)piVar36) == '\0') {
        piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + *local_1b0 * ((ulong)piVar36 | 1) + 8);
        *piVar20 = *piVar20 + 1;
        if (*(char *)(local_260._24_8_ + lVar35 + 2 + ((ulong)piVar36 | 1) * *local_210) == '\0')
        goto LAB_0015c721;
        piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + *local_1b0 * (long)piVar36 + 0xc);
        *piVar20 = *piVar20 + 1;
        if (*(char *)(local_260._24_8_ + lVar35 + 3 + *local_210 * (long)piVar36) != '\0')
        goto LAB_00157982;
      }
      else {
LAB_00157982:
        piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + *local_1b0 * ((long)piVar36 + -1) + 0xc);
        *piVar20 = *piVar20 + 1;
        if (*(char *)(local_260._24_8_ + lVar35 + 3 + ((long)piVar36 + -1) * *local_210) != '\0') {
          lVar37 = (long)piVar36 + -2;
          piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + *local_1b0 * lVar37 + 8);
          *piVar20 = *piVar20 + 1;
          if (*(char *)(local_260._24_8_ + lVar35 + 2 + *local_210 * lVar37) != '\0')
          goto LAB_0015d6cf;
          piVar20 = (int *)((long)local_2b8 + lVar35 * 4 + *local_280 * lVar37 + 8);
          *piVar20 = *piVar20 + 1;
          uVar12 = *(uint *)(local_330._24_8_ + lVar35 * 4 + lVar37 * *local_2e0 + 8);
          piVar20 = (int *)((long)local_2b8 + lVar35 * 4 + *local_280 * (long)piVar36);
          *piVar20 = *piVar20 + 1;
          uVar11 = RemSP::MemMerge(uVar12,*(uint *)(local_330._24_8_ +
                                                   lVar35 * 4 + *local_2e0 * (long)piVar36));
          piVar20 = (int *)((long)local_2b8 + lVar35 * 4 + *local_280 * (long)piVar36 + 8);
          *piVar20 = *piVar20 + 1;
          goto LAB_0015d7fa;
        }
      }
LAB_0015aee6:
      piVar20 = (int *)((long)local_2b8 + lVar35 * 4 + *local_280 * (long)piVar36);
      *piVar20 = *piVar20 + 1;
      uVar11 = *(uint *)(local_330._24_8_ + lVar35 * 4 + *local_2e0 * (long)piVar36);
      piVar20 = (int *)((long)local_2b8 + lVar35 * 4 + *local_280 * (long)piVar36 + 8);
      *piVar20 = *piVar20 + 1;
      goto LAB_0015af35;
    }
    piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + *local_1b0 * (long)piVar36 + 8);
    *piVar20 = *piVar20 + 1;
    if (*(char *)(local_260._24_8_ + lVar35 + 2 + *local_210 * (long)piVar36) != '\0') {
      piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + *local_1b0 * ((long)piVar36 + -1) + 0xc);
      *piVar20 = *piVar20 + 1;
      if (*(char *)(local_260._24_8_ + lVar35 + 3 + ((long)piVar36 + -1) * *local_210) != '\0') {
        piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + *local_1b0 * ((long)piVar36 + -2) + 8);
        *piVar20 = *piVar20 + 1;
        if (*(char *)(local_260._24_8_ + lVar35 + 2 + *local_210 * ((long)piVar36 + -2)) == '\0')
        goto LAB_0015aa30;
        piVar19 = (pointer)((ulong)piVar39 & 0xffffffff);
        break;
      }
      piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + *local_1b0 * (long)piVar36 + 0xc);
      *piVar20 = *piVar20 + 1;
      if (*(char *)(local_260._24_8_ + lVar35 + 3 + *local_210 * (long)piVar36) == '\0') {
LAB_0015afba:
        piVar20 = (int *)((long)local_2b8 + lVar35 * 4 + *local_280 * (long)piVar36);
        *piVar20 = *piVar20 + 1;
        uVar12 = *(uint *)(local_330._24_8_ + lVar35 * 4 + *local_2e0 * (long)piVar36);
        piVar20 = (int *)((long)local_2b8 + (long)piVar39 * 4 + *local_280 * (long)piVar36);
        piVar31 = (pointer)((ulong)piVar39 & 0xffffffff);
        goto LAB_0015d070;
      }
      goto LAB_00157bf5;
    }
    piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + *local_1b0 * ((ulong)piVar36 | 1) + 8);
    *piVar20 = *piVar20 + 1;
    if (*(char *)(local_260._24_8_ + lVar35 + 2 + ((ulong)piVar36 | 1) * *local_210) == '\0')
    goto LAB_0015ad30;
    piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + *local_1b0 * (long)piVar36 + 0xc);
    *piVar20 = *piVar20 + 1;
    if (*(char *)(local_260._24_8_ + lVar35 + 3 + *local_210 * (long)piVar36) == '\0')
    goto LAB_0015af4a;
    piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + *local_1b0 * ((long)piVar36 + -1) + 0xc);
    *piVar20 = *piVar20 + 1;
    if (*(char *)(local_260._24_8_ + lVar35 + 3 + ((long)piVar36 + -1) * *local_210) == '\0') {
LAB_00157bf5:
      piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + *local_1b0 * ((long)piVar36 + -1) + 0x10);
      *piVar20 = *piVar20 + 1;
      if (*(char *)(local_260._24_8_ + lVar35 + 4 + ((long)piVar36 + -1) * *local_210) == '\0') {
LAB_0015b010:
        piVar20 = (int *)((long)local_2b8 + lVar35 * 4 + *local_280 * (long)piVar36);
        *piVar20 = *piVar20 + 1;
        uVar12 = *(uint *)(local_330._24_8_ + lVar35 * 4 + *local_2e0 * (long)piVar36);
        piVar20 = (int *)((long)local_2b8 + (long)piVar39 * 4 + *local_280 * (long)piVar36);
        local_190 = (pointer)((ulong)piVar39 & 0xffffffff);
        goto LAB_0015bdae;
      }
      lVar37 = (long)piVar36 + -2;
      piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + *local_1b0 * lVar37 + 0xc);
      *piVar20 = *piVar20 + 1;
      if ((*(char *)(local_260._24_8_ + lVar35 + 3 + *local_210 * lVar37) == '\0') ||
         (piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + *local_1b0 * lVar37 + 8),
         *piVar20 = *piVar20 + 1,
         *(char *)(local_260._24_8_ + lVar35 + 2 + *local_210 * lVar37) == '\0')) goto LAB_0015adc0;
      goto LAB_0015c43c;
    }
    piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + *local_1b0 * ((long)piVar36 + -2) + 8);
    *piVar20 = *piVar20 + 1;
    piVar38 = piVar39;
    if (*(char *)(local_260._24_8_ + lVar35 + 2 + *local_210 * ((long)piVar36 + -2)) == '\0')
    goto LAB_0015acaa;
LAB_0015c8db:
    piVar31 = (pointer)((ulong)piVar38 & 0xffffffff);
    piVar39 = (pointer)(long)(int)piVar38;
    piVar20 = (int *)((long)local_1e8 + (long)piVar39 * 4 + *local_1b0 * ((long)piVar36 + -2) + -4);
    *piVar20 = *piVar20 + 1;
    if (*(char *)(local_260._24_8_ + (long)piVar39 + *local_210 * ((long)piVar36 + -2) + -1) != '\0'
       ) goto LAB_0015b0ef;
LAB_00158957:
    piVar20 = (int *)((long)local_2b8 + (long)piVar39 * 4 + *local_280 * ((long)piVar36 + -2));
    *piVar20 = *piVar20 + 1;
    uVar12 = *(uint *)(local_330._24_8_ + (long)piVar39 * 4 + ((long)piVar36 + -2) * *local_2e0);
    piVar20 = (int *)((long)local_2b8 + (long)piVar39 * 4 + *local_280 * (long)piVar36 + -8);
    *piVar20 = *piVar20 + 1;
    uVar12 = RemSP::MemMerge(uVar12,*(uint *)(local_330._24_8_ +
                                             (long)piVar39 * 4 + *local_2e0 * (long)piVar36 + -8));
LAB_0015b11f:
    piVar20 = (int *)((long)local_2b8 + (long)piVar39 * 4 + *local_280 * (long)piVar36);
    *piVar20 = *piVar20 + 1;
    *(uint *)(local_330._24_8_ + (long)piVar39 * 4 + *local_2e0 * (long)piVar36) = uVar12;
    lVar35 = (long)(int)piVar31;
    piVar31 = (pointer)(lVar35 + 2);
    if ((int)plVar43 <= (int)piVar31) {
      if ((int)plVar43 < (int)piVar31) {
        piVar39 = (pointer)((ulong)piVar31 & 0xffffffff);
        goto LAB_0015c07b;
      }
      piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + *local_1b0 * (long)piVar36 + 8);
      *piVar20 = *piVar20 + 1;
      if (*(char *)(local_260._24_8_ + lVar35 + 2 + *local_210 * (long)piVar36) != '\0')
      goto LAB_0015e963;
      piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + *local_1b0 * ((ulong)piVar36 | 1) + 8);
      *piVar20 = *piVar20 + 1;
      if (*(char *)(local_260._24_8_ + lVar35 + 2 + ((ulong)piVar36 | 1) * *local_210) == '\0')
      goto LAB_0015808c;
      piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + *local_1b0 * (long)piVar36 + 0xc);
      *piVar20 = *piVar20 + 1;
      if (*(char *)(local_260._24_8_ + lVar35 + 3 + *local_210 * (long)piVar36) != '\0')
      goto LAB_0015e963;
LAB_0015b34b:
      piVar20 = (int *)((long)local_2b8 + lVar35 * 4 + *local_280 * (long)piVar36);
      *piVar20 = *piVar20 + 1;
      uVar11 = *(uint *)(local_330._24_8_ + lVar35 * 4 + *local_2e0 * (long)piVar36);
      piVar20 = (int *)((long)local_2b8 + lVar35 * 4 + *local_280 * (long)piVar36 + 8);
      *piVar20 = *piVar20 + 1;
      lVar35 = *local_2e0;
      piVar38 = piVar31;
      goto LAB_0015f02f;
    }
    piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + *local_1b0 * (long)piVar36 + 8);
    *piVar20 = *piVar20 + 1;
    if (*(char *)(local_260._24_8_ + lVar35 + 2 + *local_210 * (long)piVar36) == '\0') {
      piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + *local_1b0 * ((ulong)piVar36 | 1) + 8);
      *piVar20 = *piVar20 + 1;
      if (*(char *)(local_260._24_8_ + lVar35 + 2 + ((ulong)piVar36 | 1) * *local_210) == '\0')
      goto LAB_001575fb;
      piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + *local_1b0 * (long)piVar36 + 0xc);
      *piVar20 = *piVar20 + 1;
      if (*(char *)(local_260._24_8_ + lVar35 + 3 + *local_210 * (long)piVar36) == '\0')
      goto code_r0x0015b21d;
LAB_0015ec8d:
      piVar20 = (int *)((long)local_1e8 +
                       (long)(int)piVar31 * 4 + *local_1b0 * ((long)piVar36 + -1) + 4);
      *piVar20 = *piVar20 + 1;
      if (*(char *)(local_260._24_8_ + (long)(int)piVar31 + 1 + ((long)piVar36 + -1) * *local_210)
          != '\0') goto LAB_0015ecce;
      goto LAB_0015ced0;
    }
LAB_0015cdc3:
    piVar39 = (pointer)(long)(int)piVar31;
    piVar20 = (int *)((long)local_1e8 + (long)piVar39 * 4 + *local_1b0 * ((long)piVar36 + -1) + 4);
    *piVar20 = *piVar20 + 1;
    if (*(char *)(local_260._24_8_ + (long)piVar39 + ((long)piVar36 + -1) * *local_210 + 1) != '\0')
    {
      piVar19 = (pointer)((ulong)piVar31 & 0xffffffff);
      goto LAB_0015ce08;
    }
    piVar20 = (int *)((long)local_1e8 + (long)piVar39 * 4 + *local_1b0 * (long)piVar36 + 4);
    *piVar20 = *piVar20 + 1;
    if (*(char *)(local_260._24_8_ + (long)piVar39 + *local_210 * (long)piVar36 + 1) != '\0')
    goto LAB_0015ced0;
    piVar20 = (int *)((long)local_2b8 + (long)piVar39 * 4 + *local_280 * (long)piVar36 + -8);
    *piVar20 = *piVar20 + 1;
    uVar12 = *(uint *)(local_330._24_8_ + (long)piVar39 * 4 + *local_2e0 * (long)piVar36 + -8);
LAB_0015d05d:
    piVar20 = (int *)((long)local_2b8 + (long)piVar39 * 4 + *local_280 * (long)piVar36);
  } while( true );
LAB_001578f2:
  piVar39 = (pointer)(long)(int)piVar19;
  piVar20 = (int *)((long)local_1e8 + (long)piVar39 * 4 + *local_1b0 * ((long)piVar36 + -2) + -4);
  *piVar20 = *piVar20 + 1;
  cVar15 = *(char *)(local_260._24_8_ + (long)piVar39 + *local_210 * ((long)piVar36 + -2) + -1);
joined_r0x0015ce86:
  if (cVar15 != '\0') goto LAB_0015e2c2;
LAB_0015d1ea:
  piVar20 = (int *)((long)local_2b8 + (long)piVar39 * 4 + *local_280 * ((long)piVar36 + -2));
  *piVar20 = *piVar20 + 1;
  uVar12 = *(uint *)(local_330._24_8_ + (long)piVar39 * 4 + ((long)piVar36 + -2) * *local_2e0);
  piVar20 = (int *)((long)local_2b8 + (long)piVar39 * 4 + *local_280 * (long)piVar36 + -8);
  *piVar20 = *piVar20 + 1;
  uVar11 = *(uint *)(local_330._24_8_ + (long)piVar39 * 4 + *local_2e0 * (long)piVar36 + -8);
  goto LAB_0015ef70;
code_r0x0015b21d:
  piVar20 = (int *)((long)local_2b8 + lVar35 * 4 + *local_280 * (long)piVar36);
  *piVar20 = *piVar20 + 1;
  uVar18 = *(undefined4 *)(local_330._24_8_ + lVar35 * 4 + *local_2e0 * (long)piVar36);
  piVar20 = (int *)((long)local_2b8 + lVar35 * 4 + *local_280 * (long)piVar36 + 8);
  *piVar20 = *piVar20 + 1;
  *(undefined4 *)(local_330._24_8_ + lVar35 * 4 + *local_2e0 * (long)piVar36 + 8) = uVar18;
LAB_00158e98:
  lVar35 = (long)(int)piVar31;
  uVar12 = (int)piVar31 + 2;
  piVar31 = (pointer)(ulong)uVar12;
  if ((int)plVar43 <= (int)uVar12) {
    piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + *local_1b0 * (long)piVar36 + 8);
    *piVar20 = *piVar20 + 1;
    cVar15 = *(char *)(local_260._24_8_ + lVar35 + 2 + *local_210 * (long)piVar36);
    if ((int)plVar43 < (int)uVar12) {
      if (cVar15 == '\0') {
        piVar19 = (pointer)(ulong)uVar12;
        goto LAB_0015d8de;
      }
      piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + *local_1b0 * ((ulong)piVar36 | 1) + 4);
      *piVar20 = *piVar20 + 1;
      if (*(char *)(local_260._24_8_ + lVar35 + 1 + ((ulong)piVar36 | 1) * *local_210) == '\0') {
LAB_00159531:
        lVar35 = (long)piVar36 + -1;
        piVar38 = (pointer)(long)(int)uVar12;
        piVar20 = (int *)((long)local_1e8 + (long)piVar38 * 4 + *local_1b0 * lVar35);
        *piVar20 = *piVar20 + 1;
        if (*(char *)((long)piVar38 + (long)(*local_210 * lVar35 + local_260._24_8_)) != '\0')
        goto LAB_0015efd4;
        piVar20 = (int *)((long)local_1e8 + (long)piVar38 * 4 + *local_1b0 * lVar35 + -4);
        *piVar20 = *piVar20 + 1;
        if (*(char *)(local_260._24_8_ + (long)piVar38 + lVar35 * *local_210 + -1) == '\0')
        goto LAB_00158110;
        piVar20 = (int *)((long)local_2b8 +
                         (long)piVar38 * 4 + *local_280 * ((long)piVar36 + -2) + -8);
        *piVar20 = *piVar20 + 1;
        piVar31 = (pointer)(((long)piVar36 + -2) * *local_2e0 + local_330._24_8_);
        lVar35 = *local_280;
        goto LAB_0015ea6a;
      }
LAB_00159273:
      piVar38 = (pointer)(long)(int)piVar31;
      piVar20 = (int *)((long)local_1e8 + (long)piVar38 * 4 + *local_1b0 * ((long)piVar36 + -1) + -4
                       );
      *piVar20 = *piVar20 + 1;
      piVar19 = (pointer)((ulong)piVar31 & 0xffffffff);
      if (*(char *)(local_260._24_8_ + (long)piVar38 + ((long)piVar36 + -1) * *local_210 + -1) !=
          '\0') {
        piVar20 = (int *)((long)local_2b8 +
                         (long)piVar38 * 4 + *local_280 * ((long)piVar36 + -2) + -8);
        *piVar20 = *piVar20 + 1;
        piVar19 = (pointer)(*local_280 * (long)piVar36 + (long)local_2b8);
        uVar12 = *(uint *)(local_330._24_8_ +
                          (long)piVar38 * 4 + ((long)piVar36 + -2) * *local_2e0 + -8);
        goto LAB_0015978d;
      }
    }
    else {
      if (cVar15 != '\0') {
        piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + *local_1b0 * ((ulong)piVar36 | 1) + 4);
        *piVar20 = *piVar20 + 1;
        if (*(char *)(local_260._24_8_ + lVar35 + 1 + ((ulong)piVar36 | 1) * *local_210) == '\0') {
LAB_0015946b:
          lVar35 = (long)piVar36 + -1;
          piVar38 = (pointer)(long)(int)uVar12;
          piVar20 = (int *)((long)local_1e8 + (long)piVar38 * 4 + *local_1b0 * lVar35 + 4);
          *piVar20 = *piVar20 + 1;
          if (*(char *)(local_260._24_8_ + (long)piVar38 + *local_210 * lVar35 + 1) == '\0')
          goto LAB_00159531;
          piVar20 = (int *)((long)local_1e8 + (long)piVar38 * 4 + *local_1b0 * lVar35);
          *piVar20 = *piVar20 + 1;
          if ((*(char *)((long)piVar38 + (long)(*local_210 * lVar35 + local_260._24_8_)) != '\0') ||
             (piVar20 = (int *)((long)local_1e8 + (long)(int)uVar12 * 4 + *local_1b0 * lVar35 + -4),
             *piVar20 = *piVar20 + 1,
             *(char *)(local_260._24_8_ + (long)(int)uVar12 + -1 + lVar35 * *local_210) == '\0'))
          goto LAB_0015efd4;
          goto LAB_0015e761;
        }
LAB_00159108:
        lVar35 = (long)piVar36 + -1;
        piVar38 = (pointer)(long)(int)piVar31;
        piVar20 = (int *)((long)local_1e8 + (long)piVar38 * 4 + *local_1b0 * lVar35 + 4);
        *piVar20 = *piVar20 + 1;
        if (*(char *)(local_260._24_8_ + (long)piVar38 + *local_210 * lVar35 + 1) == '\0')
        goto LAB_00159273;
        piVar20 = (int *)((long)local_1e8 + (long)piVar38 * 4 + *local_1b0 * lVar35);
        *piVar20 = *piVar20 + 1;
        if (*(char *)((long)piVar38 + (long)(*local_210 * lVar35 + local_260._24_8_)) != '\0')
        goto LAB_00159746;
        lVar34 = (long)(int)piVar31;
        piVar20 = (int *)((long)local_1e8 + lVar34 * 4 + *local_1b0 * lVar35 + -4);
        *piVar20 = *piVar20 + 1;
        lVar37 = (long)piVar36 + -2;
        if (*(char *)(local_260._24_8_ + lVar34 + -1 + lVar35 * *local_210) == '\0') {
          piVar20 = (int *)((long)local_2b8 + (long)piVar38 * 4 + *local_280 * lVar37);
          *piVar20 = *piVar20 + 1;
          uVar12 = *(uint *)(local_330._24_8_ + (long)piVar38 * 4 + lVar37 * *local_2e0);
          piVar20 = (int *)((long)local_2b8 + lVar34 * 4 + *local_280 * (long)piVar36 + -8);
          *piVar20 = *piVar20 + 1;
          uVar11 = RemSP::MemMerge(uVar12,*(uint *)(local_330._24_8_ +
                                                   lVar34 * 4 + *local_2e0 * (long)piVar36 + -8));
          piVar20 = (int *)((long)local_2b8 + (long)piVar38 * 4 + *local_280 * (long)piVar36);
          *piVar20 = *piVar20 + 1;
          lVar35 = *local_2e0;
        }
        else {
          piVar20 = (int *)((long)local_1e8 + (long)piVar38 * 4 + *local_1b0 * lVar37);
          *piVar20 = *piVar20 + 1;
          if (*(char *)((long)piVar38 + (long)(*local_210 * lVar37 + local_260._24_8_)) == '\0') {
            piVar20 = (int *)((long)local_2b8 + lVar34 * 4 + *local_280 * lVar37 + -8);
            *piVar20 = *piVar20 + 1;
            uVar12 = *(uint *)(local_330._24_8_ + lVar34 * 4 + *local_2e0 * lVar37 + -8);
            piVar20 = (int *)((long)local_2b8 + (long)piVar38 * 4 + *local_280 * lVar37);
            *piVar20 = *piVar20 + 1;
            uVar12 = RemSP::MemMerge(uVar12,*(uint *)(local_330._24_8_ +
                                                     (long)piVar38 * 4 + lVar37 * *local_2e0));
            piVar20 = (int *)((long)local_2b8 + lVar34 * 4 + *local_280 * (long)piVar36 + -8);
            *piVar20 = *piVar20 + 1;
            uVar11 = *(uint *)(local_330._24_8_ + lVar34 * 4 + *local_2e0 * (long)piVar36 + -8);
          }
          else {
            piVar20 = (int *)((long)local_2b8 + (long)piVar38 * 4 + *local_280 * lVar37);
            *piVar20 = *piVar20 + 1;
            uVar12 = *(uint *)(local_330._24_8_ + (long)piVar38 * 4 + lVar37 * *local_2e0);
            piVar20 = (int *)((long)local_2b8 + lVar34 * 4 + *local_280 * (long)piVar36 + -8);
            *piVar20 = *piVar20 + 1;
            uVar11 = *(uint *)(local_330._24_8_ + lVar34 * 4 + *local_2e0 * (long)piVar36 + -8);
          }
          uVar11 = RemSP::MemMerge(uVar12,uVar11);
          piVar20 = (int *)((long)local_2b8 + (long)piVar38 * 4 + *local_280 * (long)piVar36);
          *piVar20 = *piVar20 + 1;
          lVar35 = *local_2e0;
        }
        goto LAB_0015f02f;
      }
      piVar19 = (pointer)(ulong)uVar12;
LAB_001595fc:
      iVar17 = (int)piVar19;
      lVar35 = (long)iVar17;
      piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + *local_1b0 * ((ulong)piVar36 | 1));
      *piVar20 = *piVar20 + 1;
      if (*(char *)(local_260._24_8_ + lVar35 + ((ulong)piVar36 | 1) * *local_210) == '\0') {
        piVar31 = (pointer)((ulong)piVar19 & 0xffffffff);
        goto LAB_0015808c;
      }
      piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + *local_1b0 * (long)piVar36 + 4);
      *piVar20 = *piVar20 + 1;
      if (*(char *)(local_260._24_8_ + lVar35 + 1 + *local_210 * (long)piVar36) == '\0')
      goto LAB_0015d923;
LAB_0015967b:
      piVar20 = (int *)((long)local_1e8 +
                       (long)(int)piVar19 * 4 + *local_1b0 * ((ulong)piVar36 | 1) + -4);
      *piVar20 = *piVar20 + 1;
      piVar31 = (pointer)((ulong)piVar19 & 0xffffffff);
      if (*(char *)(local_260._24_8_ + (long)(int)piVar19 + -1 + ((ulong)piVar36 | 1) * *local_210)
          == '\0') goto LAB_00157278;
LAB_001596c1:
      piVar38 = (pointer)(long)(int)piVar19;
      piVar20 = (int *)((long)local_1e8 + (long)piVar38 * 4 + *local_1b0 * ((long)piVar36 + -1) + 4)
      ;
      *piVar20 = *piVar20 + 1;
      if (*(char *)(local_260._24_8_ + (long)piVar38 + ((long)piVar36 + -1) * *local_210 + 1) !=
          '\0') goto LAB_00159746;
    }
LAB_00159700:
    piVar38 = (pointer)(long)(int)piVar19;
    piVar20 = (int *)((long)local_1e8 + (long)piVar38 * 4 + *local_1b0 * ((long)piVar36 + -1));
    *piVar20 = *piVar20 + 1;
    if (*(char *)((long)piVar38 + (long)(((long)piVar36 + -1) * *local_210 + local_260._24_8_)) !=
        '\0') goto LAB_00159746;
    goto LAB_0015ea2f;
  }
  piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + *local_1b0 * (long)piVar36 + 8);
  *piVar20 = *piVar20 + 1;
  if (*(char *)(local_260._24_8_ + lVar35 + 2 + *local_210 * (long)piVar36) == '\0')
  goto LAB_00158854;
  piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + *local_1b0 * ((ulong)piVar36 | 1) + 4);
  *piVar20 = *piVar20 + 1;
  piVar19 = piVar31;
  if (*(char *)(local_260._24_8_ + lVar35 + 1 + ((ulong)piVar36 | 1) * *local_210) == '\0')
  goto LAB_0015822b;
LAB_00158f25:
  lVar35 = (long)piVar36 + -1;
  iVar17 = (int)piVar31;
  piVar39 = (pointer)(long)iVar17;
  piVar20 = (int *)((long)local_1e8 + (long)piVar39 * 4 + *local_1b0 * lVar35 + 4);
  *piVar20 = *piVar20 + 1;
  if (*(char *)(local_260._24_8_ + (long)piVar39 + *local_210 * lVar35 + 1) != '\0') {
    piVar20 = (int *)((long)local_1e8 + (long)piVar39 * 4 + *local_1b0 * lVar35);
    *piVar20 = *piVar20 + 1;
    piVar19 = piVar31;
    if (*(char *)((long)piVar39 + (long)(*local_210 * lVar35 + local_260._24_8_)) == '\0') {
      lVar34 = (long)iVar17;
      piVar20 = (int *)((long)local_1e8 + lVar34 * 4 + *local_1b0 * lVar35 + -4);
      *piVar20 = *piVar20 + 1;
      lVar37 = (long)piVar36 + -2;
      if (*(char *)(local_260._24_8_ + lVar34 + -1 + lVar35 * *local_210) == '\0') {
        piVar20 = (int *)((long)local_2b8 + (long)piVar39 * 4 + *local_280 * lVar37);
        *piVar20 = *piVar20 + 1;
        uVar12 = *(uint *)(local_330._24_8_ + (long)piVar39 * 4 + lVar37 * *local_2e0);
        piVar20 = (int *)((long)local_2b8 + lVar34 * 4 + *local_280 * (long)piVar36 + -8);
        *piVar20 = *piVar20 + 1;
        uVar12 = RemSP::MemMerge(uVar12,*(uint *)(local_330._24_8_ +
                                                 lVar34 * 4 + *local_2e0 * (long)piVar36 + -8));
      }
      else {
        piVar20 = (int *)((long)local_1e8 + (long)piVar39 * 4 + *local_1b0 * lVar37);
        *piVar20 = *piVar20 + 1;
        if (*(char *)((long)piVar39 + (long)(*local_210 * lVar37 + local_260._24_8_)) == '\0') {
          piVar20 = (int *)((long)local_2b8 + lVar34 * 4 + *local_280 * lVar37 + -8);
          *piVar20 = *piVar20 + 1;
          uVar12 = *(uint *)(local_330._24_8_ + lVar34 * 4 + *local_2e0 * lVar37 + -8);
          piVar20 = (int *)((long)local_2b8 + (long)piVar39 * 4 + *local_280 * lVar37);
          *piVar20 = *piVar20 + 1;
          local_190 = piVar31;
          uVar12 = RemSP::MemMerge(uVar12,*(uint *)(local_330._24_8_ +
                                                   (long)piVar39 * 4 + lVar37 * *local_2e0));
          piVar20 = (int *)((long)local_2b8 + lVar34 * 4 + *local_280 * (long)piVar36 + -8);
          *piVar20 = *piVar20 + 1;
          uVar11 = *(uint *)(local_330._24_8_ + lVar34 * 4 + *local_2e0 * (long)piVar36 + -8);
        }
        else {
          piVar20 = (int *)((long)local_2b8 + (long)piVar39 * 4 + *local_280 * lVar37);
          *piVar20 = *piVar20 + 1;
          uVar12 = *(uint *)(local_330._24_8_ + (long)piVar39 * 4 + lVar37 * *local_2e0);
          piVar20 = (int *)((long)local_2b8 + lVar34 * 4 + *local_280 * (long)piVar36 + -8);
          *piVar20 = *piVar20 + 1;
          uVar11 = *(uint *)(local_330._24_8_ + lVar34 * 4 + *local_2e0 * (long)piVar36 + -8);
          local_190 = piVar31;
        }
        uVar12 = RemSP::MemMerge(uVar12,uVar11);
        piVar19 = (pointer)((ulong)local_190 & 0xffffffff);
      }
    }
    else {
      piVar20 = (int *)((long)local_2b8 + (long)piVar39 * 4 + *local_280 * ((long)piVar36 + -2));
      *piVar20 = *piVar20 + 1;
      uVar12 = *(uint *)(local_330._24_8_ + (long)piVar39 * 4 + ((long)piVar36 + -2) * *local_2e0);
      piVar20 = (int *)((long)local_2b8 + (long)piVar39 * 4 + *local_280 * (long)piVar36 + -8);
      *piVar20 = *piVar20 + 1;
      uVar12 = RemSP::MemMerge(uVar12,*(uint *)(local_330._24_8_ +
                                               (long)piVar39 * 4 + *local_2e0 * (long)piVar36 + -8))
      ;
    }
    goto LAB_0015e2f2;
  }
  piVar20 = (int *)((long)local_1e8 + (long)piVar39 * 4 + *local_1b0 * (long)piVar36 + 4);
  *piVar20 = *piVar20 + 1;
  if (*(char *)(local_260._24_8_ + (long)piVar39 + *local_210 * (long)piVar36 + 1) == '\0') {
    piVar39 = (pointer)(long)iVar17;
    piVar20 = (int *)((long)local_1e8 + (long)piVar39 * 4 + *local_1b0 * lVar35 + -4);
    *piVar20 = *piVar20 + 1;
    if (*(char *)(local_260._24_8_ + (long)piVar39 + lVar35 * *local_210 + -1) == '\0') {
      piVar19 = (pointer)((ulong)piVar31 & 0xffffffff);
      goto LAB_00159cdf;
    }
    piVar20 = (int *)((long)local_2b8 + (long)piVar39 * 4 + *local_280 * ((long)piVar36 + -2) + -8);
    *piVar20 = *piVar20 + 1;
    uVar12 = *(uint *)(local_330._24_8_ + (long)piVar39 * 4 + ((long)piVar36 + -2) * *local_2e0 + -8
                      );
    piVar20 = (int *)((long)local_2b8 + (long)piVar39 * 4 + *local_280 * (long)piVar36 + -8);
    *piVar20 = *piVar20 + 1;
    uVar12 = RemSP::MemMerge(uVar12,*(uint *)(local_330._24_8_ +
                                             (long)piVar39 * 4 + *local_2e0 * (long)piVar36 + -8));
    goto LAB_0015d05d;
  }
  piVar19 = (pointer)(long)iVar17;
  piVar20 = (int *)((long)local_1e8 + (long)piVar19 * 4 + *local_1b0 * lVar35 + 8);
  *piVar20 = *piVar20 + 1;
  if (*(char *)(local_260._24_8_ + (long)piVar19 + *local_210 * lVar35 + 2) != '\0') {
    piVar20 = (int *)((long)local_1e8 + (long)piVar19 * 4 + *local_1b0 * lVar35);
    *piVar20 = *piVar20 + 1;
    if (*(char *)((long)piVar19 + (long)(*local_210 * lVar35 + local_260._24_8_)) != '\0') {
      lVar35 = (long)piVar36 + -2;
      piVar20 = (int *)((long)local_1e8 + (long)piVar39 * 4 + *local_1b0 * lVar35 + 4);
      *piVar20 = *piVar20 + 1;
      if (*(char *)(local_260._24_8_ + (long)piVar39 + *local_210 * lVar35 + 1) == '\0') {
        piVar20 = (int *)((long)local_2b8 + (long)piVar19 * 4 + *local_280 * lVar35);
        *piVar20 = *piVar20 + 1;
        uVar12 = *(uint *)(local_330._24_8_ + (long)piVar19 * 4 + *local_2e0 * lVar35);
        piVar20 = (int *)((long)local_2b8 + (long)piVar19 * 4 + *local_280 * lVar35 + 8);
        *piVar20 = *piVar20 + 1;
        local_190 = piVar31;
        uVar12 = RemSP::MemMerge(uVar12,*(uint *)(local_330._24_8_ +
                                                 (long)piVar19 * 4 + lVar35 * *local_2e0 + 8));
        piVar20 = (int *)((long)local_2b8 + (long)piVar19 * 4 + *local_280 * (long)piVar36 + -8);
        *piVar20 = *piVar20 + 1;
        uVar11 = *(uint *)(local_330._24_8_ + (long)piVar19 * 4 + *local_2e0 * (long)piVar36 + -8);
      }
      else {
        piVar20 = (int *)((long)local_2b8 + (long)piVar19 * 4 + *local_280 * lVar35 + 8);
        *piVar20 = *piVar20 + 1;
        uVar12 = *(uint *)(local_330._24_8_ + (long)piVar19 * 4 + lVar35 * *local_2e0 + 8);
        piVar20 = (int *)((long)local_2b8 + (long)piVar19 * 4 + *local_280 * (long)piVar36 + -8);
        *piVar20 = *piVar20 + 1;
        uVar11 = *(uint *)(local_330._24_8_ + (long)piVar19 * 4 + *local_2e0 * (long)piVar36 + -8);
        local_190 = piVar31;
      }
      uVar12 = RemSP::MemMerge(uVar12,uVar11);
      piVar20 = (int *)((long)local_2b8 + (long)piVar19 * 4 + *local_280 * (long)piVar36);
      piVar39 = piVar19;
      piVar31 = local_190;
      goto LAB_0015b43b;
    }
    lVar34 = (long)iVar17;
    piVar20 = (int *)((long)local_1e8 + lVar34 * 4 + *local_1b0 * lVar35 + -4);
    *piVar20 = *piVar20 + 1;
    lVar37 = (long)piVar36 + -2;
    if (*(char *)(local_260._24_8_ + lVar34 + -1 + lVar35 * *local_210) == '\0') {
      piVar20 = (int *)((long)local_2b8 + (long)piVar19 * 4 + *local_280 * lVar37 + 8);
      *piVar20 = *piVar20 + 1;
      uVar12 = *(uint *)(local_330._24_8_ + (long)piVar19 * 4 + lVar37 * *local_2e0 + 8);
      piVar20 = (int *)((long)local_2b8 + lVar34 * 4 + *local_280 * (long)piVar36 + -8);
      *piVar20 = *piVar20 + 1;
      uVar11 = *(uint *)(local_330._24_8_ + lVar34 * 4 + *local_2e0 * (long)piVar36 + -8);
    }
    else {
      piVar20 = (int *)((long)local_1e8 + (long)piVar39 * 4 + *local_1b0 * lVar37 + 4);
      *piVar20 = *piVar20 + 1;
      if (*(char *)(local_260._24_8_ + (long)piVar39 + *local_210 * lVar37 + 1) != '\0') {
        piVar20 = (int *)((long)local_1e8 + (long)piVar19 * 4 + *local_1b0 * lVar37);
        *piVar20 = *piVar20 + 1;
        if (*(char *)((long)piVar19 + (long)(*local_210 * lVar37 + local_260._24_8_)) == '\0') {
          piVar20 = (int *)((long)local_2b8 + lVar34 * 4 + *local_280 * lVar37 + -8);
          *piVar20 = *piVar20 + 1;
          uVar12 = *(uint *)(local_330._24_8_ + lVar34 * 4 + *local_2e0 * lVar37 + -8);
          piVar20 = (int *)((long)local_2b8 + (long)piVar19 * 4 + *local_280 * lVar37 + 8);
          *piVar20 = *piVar20 + 1;
          uVar12 = RemSP::MemMerge(uVar12,*(uint *)(local_330._24_8_ +
                                                   (long)piVar19 * 4 + lVar37 * *local_2e0 + 8));
          piVar20 = (int *)((long)local_2b8 + lVar34 * 4 + *local_280 * (long)piVar36 + -8);
          *piVar20 = *piVar20 + 1;
          uVar11 = *(uint *)(local_330._24_8_ + lVar34 * 4 + *local_2e0 * (long)piVar36 + -8);
        }
        else {
          piVar20 = (int *)((long)local_2b8 + (long)piVar19 * 4 + *local_280 * lVar37 + 8);
          *piVar20 = *piVar20 + 1;
          uVar12 = *(uint *)(local_330._24_8_ + (long)piVar19 * 4 + lVar37 * *local_2e0 + 8);
          piVar20 = (int *)((long)local_2b8 + lVar34 * 4 + *local_280 * (long)piVar36 + -8);
          *piVar20 = *piVar20 + 1;
          uVar11 = *(uint *)(local_330._24_8_ + lVar34 * 4 + *local_2e0 * (long)piVar36 + -8);
        }
        uVar12 = RemSP::MemMerge(uVar12,uVar11);
        piVar20 = (int *)((long)local_2b8 + (long)piVar19 * 4 + *local_280 * (long)piVar36);
        piVar39 = piVar19;
        goto LAB_0015b43b;
      }
      piVar20 = (int *)((long)local_2b8 + lVar34 * 4 + *local_280 * lVar37 + -8);
      *piVar20 = *piVar20 + 1;
      uVar12 = *(uint *)(local_330._24_8_ + lVar34 * 4 + *local_2e0 * lVar37 + -8);
      piVar20 = (int *)((long)local_2b8 + (long)piVar19 * 4 + *local_280 * lVar37 + 8);
      *piVar20 = *piVar20 + 1;
      uVar12 = RemSP::MemMerge(uVar12,*(uint *)(local_330._24_8_ +
                                               (long)piVar19 * 4 + lVar37 * *local_2e0 + 8));
      piVar20 = (int *)((long)local_2b8 + lVar34 * 4 + *local_280 * (long)piVar36 + -8);
      *piVar20 = *piVar20 + 1;
      uVar11 = *(uint *)(local_330._24_8_ + lVar34 * 4 + *local_2e0 * (long)piVar36 + -8);
    }
    uVar12 = RemSP::MemMerge(uVar12,uVar11);
    piVar20 = (int *)((long)local_2b8 + (long)piVar19 * 4 + *local_280 * (long)piVar36);
    piVar39 = piVar19;
    goto LAB_0015b43b;
  }
  piVar39 = (pointer)(long)iVar17;
  piVar20 = (int *)((long)local_1e8 + (long)piVar39 * 4 + *local_1b0 * lVar35 + -4);
  *piVar20 = *piVar20 + 1;
  if (*(char *)(local_260._24_8_ + (long)piVar39 + lVar35 * *local_210 + -1) != '\0') {
    piVar20 = (int *)((long)local_2b8 + (long)piVar39 * 4 + *local_280 * ((long)piVar36 + -2) + -8);
    *piVar20 = *piVar20 + 1;
    uVar12 = *(uint *)(local_330._24_8_ + (long)piVar39 * 4 + ((long)piVar36 + -2) * *local_2e0 + -8
                      );
    piVar20 = (int *)((long)local_2b8 + (long)piVar39 * 4 + *local_280 * (long)piVar36 + -8);
    *piVar20 = *piVar20 + 1;
    uVar12 = RemSP::MemMerge(uVar12,*(uint *)(local_330._24_8_ +
                                             (long)piVar39 * 4 + *local_2e0 * (long)piVar36 + -8));
    goto LAB_0015d441;
  }
LAB_00158b0d:
  piVar39 = (pointer)(long)(int)piVar31;
  piVar20 = (int *)((long)local_1e8 + (long)piVar39 * 4 + *local_1b0 * ((long)piVar36 + -1));
  *piVar20 = *piVar20 + 1;
  if (*(char *)((long)piVar39 + (long)(((long)piVar36 + -1) * *local_210 + local_260._24_8_)) !=
      '\0') goto LAB_00158b51;
  piVar20 = (int *)((long)local_2b8 + (long)piVar39 * 4 + *local_280 * (long)piVar36 + -8);
  *piVar20 = *piVar20 + 1;
  lVar35 = *local_280;
  piVar19 = piVar31;
  uVar12 = *(uint *)(local_330._24_8_ + (long)piVar39 * 4 + *local_2e0 * (long)piVar36 + -8);
LAB_0015854c:
  piVar38 = (pointer)(lVar35 * (long)piVar36 + (long)local_2b8);
  piVar31 = piVar19;
LAB_0015a980:
  piVar20 = piVar38 + (long)piVar39;
LAB_0015a984:
  *piVar20 = *piVar20 + 1;
  *(uint *)(local_330._24_8_ + (long)piVar39 * 4 + *local_2e0 * (long)piVar36) = uVar12;
  lVar35 = (long)(int)piVar31;
  piVar39 = (pointer)(lVar35 + 2);
  if ((int)plVar43 <= (int)piVar39) {
    if ((int)plVar43 < (int)piVar39) goto LAB_0015c07b;
    piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + *local_1b0 * (long)piVar36 + 8);
    *piVar20 = *piVar20 + 1;
    piVar38 = piVar39;
    if (*(char *)(local_260._24_8_ + lVar35 + 2 + *local_210 * (long)piVar36) == '\0') {
      piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + *local_1b0 * ((ulong)piVar36 | 1) + 8);
      *piVar20 = *piVar20 + 1;
      if (*(char *)(local_260._24_8_ + lVar35 + 2 + ((ulong)piVar36 | 1) * *local_210) == '\0')
      goto LAB_0015c721;
      piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + *local_1b0 * (long)piVar36 + 0xc);
      *piVar20 = *piVar20 + 1;
      if (*(char *)(local_260._24_8_ + lVar35 + 3 + *local_210 * (long)piVar36) == '\0')
      goto LAB_0015aee6;
    }
    piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + *local_1b0 * ((long)piVar36 + -1) + 0xc);
    *piVar20 = *piVar20 + 1;
    if (*(char *)(local_260._24_8_ + lVar35 + 3 + ((long)piVar36 + -1) * *local_210) == '\0')
    goto LAB_0015aee6;
    goto LAB_0015ab41;
  }
  piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + *local_1b0 * (long)piVar36 + 8);
  *piVar20 = *piVar20 + 1;
  if (*(char *)(local_260._24_8_ + lVar35 + 2 + *local_210 * (long)piVar36) != '\0') {
    piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + *local_1b0 * ((long)piVar36 + -1) + 0xc);
    *piVar20 = *piVar20 + 1;
    if (*(char *)(local_260._24_8_ + lVar35 + 3 + ((long)piVar36 + -1) * *local_210) != '\0')
    goto LAB_0015aa30;
    piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + *local_1b0 * (long)piVar36 + 0xc);
    *piVar20 = *piVar20 + 1;
    if (*(char *)(local_260._24_8_ + lVar35 + 3 + *local_210 * (long)piVar36) == '\0')
    goto LAB_0015afba;
LAB_0015ad7c:
    piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + *local_1b0 * ((long)piVar36 + -1) + 0x10);
    *piVar20 = *piVar20 + 1;
    if (*(char *)(local_260._24_8_ + lVar35 + 4 + ((long)piVar36 + -1) * *local_210) != '\0')
    goto LAB_0015adc0;
    goto LAB_0015b010;
  }
  piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + *local_1b0 * ((ulong)piVar36 | 1) + 8);
  *piVar20 = *piVar20 + 1;
  if (*(char *)(local_260._24_8_ + lVar35 + 2 + ((ulong)piVar36 | 1) * *local_210) == '\0') {
LAB_0015ad30:
    piVar31 = (pointer)((ulong)piVar39 & 0xffffffff);
LAB_0015b066:
    iVar17 = (int)piVar31;
    piVar39 = (pointer)(long)iVar17;
    piVar20 = (int *)((long)local_1e8 + (long)piVar39 * 4 + *local_1b0 * (long)piVar36 + 4);
    *piVar20 = *piVar20 + 1;
    if (*(char *)(local_260._24_8_ + (long)piVar39 + *local_210 * (long)piVar36 + 1) != '\0')
    goto code_r0x0015b0a8;
LAB_00157d4b:
    uVar41 = (ulong)piVar36 | 1;
    lVar35 = (long)(int)piVar31;
    lVar37 = *local_1b0;
    lVar40 = lVar37 * uVar41;
    piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + lVar40 + 4);
    *piVar20 = *piVar20 + 1;
    uVar12 = RemSP::length_;
    lVar34 = *local_210;
    if (*(char *)(local_260._24_8_ + lVar35 + 1 + lVar34 * uVar41) != '\0') {
      lVar24 = (long)(int)RemSP::length_;
      RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start[lVar24] =
           RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start[lVar24] + 1;
      RemSP::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[lVar24] = uVar12;
      uVar12 = RemSP::length_;
      RemSP::length_ = RemSP::length_ + 1;
      lVar24 = *local_280 * (long)piVar36;
      piVar20 = (int *)((long)local_2b8 + lVar35 * 4 + lVar24);
      *piVar20 = *piVar20 + 1;
      lVar28 = *local_2e0 * (long)piVar36;
      *(uint *)(local_330._24_8_ + lVar35 * 4 + lVar28) = uVar12;
      piVar31 = (pointer)(lVar35 + 2);
      lVar37 = lVar37 * (long)piVar36;
      piVar25 = local_198;
      plVar43 = local_268;
      if ((int)local_268 <= (int)piVar31) {
        piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + lVar37 + 8);
        *piVar20 = *piVar20 + 1;
        cVar15 = *(char *)(local_260._24_8_ + lVar35 + 2 + lVar34 * (long)piVar36);
        if ((int)local_268 < (int)piVar31) {
          if (cVar15 == '\0') goto LAB_0015c0bf;
          goto LAB_00159273;
        }
        if (cVar15 != '\0') goto LAB_00159108;
        piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + lVar40 + 8);
        *piVar20 = *piVar20 + 1;
        if (*(char *)(local_260._24_8_ + lVar35 + 2 + uVar41 * *local_210) == '\0')
        goto LAB_0015808c;
        piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + *local_1b0 * (long)piVar36 + 0xc);
        *piVar20 = *piVar20 + 1;
        piVar19 = (pointer)((ulong)piVar31 & 0xffffffff);
        if (*(char *)(local_260._24_8_ + lVar35 + 3 + *local_210 * (long)piVar36) == '\0')
        goto LAB_0015b34b;
        goto LAB_001596c1;
      }
      piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + lVar37 + 8);
      *piVar20 = *piVar20 + 1;
      if (*(char *)(local_260._24_8_ + lVar35 + 2 + lVar34 * (long)piVar36) != '\0')
      goto LAB_00158f25;
      piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + lVar40 + 8);
      *piVar20 = *piVar20 + 1;
      if (*(char *)(local_260._24_8_ + lVar35 + lVar34 * uVar41 + 2) != '\0') {
        piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + lVar37 + 0xc);
        *piVar20 = *piVar20 + 1;
        if (*(char *)(local_260._24_8_ + lVar35 + lVar34 * (long)piVar36 + 3) == '\0') {
          piVar20 = (int *)((long)local_2b8 + lVar35 * 4 + lVar24);
          *piVar20 = *piVar20 + 1;
          uVar18 = *(undefined4 *)(local_330._24_8_ + lVar35 * 4 + lVar28);
          piVar20 = (int *)((long)local_2b8 + lVar35 * 4 + lVar24 + 8);
          *piVar20 = *piVar20 + 1;
          *(undefined4 *)(local_330._24_8_ + lVar35 * 4 + lVar28 + 8) = uVar18;
          goto LAB_00158e98;
        }
LAB_00158910:
        piVar39 = (pointer)(long)(int)piVar31;
        piVar20 = (int *)((long)local_1e8 +
                         (long)piVar39 * 4 + *local_1b0 * ((long)piVar36 + -1) + 4);
        *piVar20 = *piVar20 + 1;
        if (*(char *)(local_260._24_8_ + (long)piVar39 + ((long)piVar36 + -1) * *local_210 + 1) !=
            '\0') goto LAB_00158957;
        piVar19 = (pointer)((ulong)piVar31 & 0xffffffff);
LAB_001589e2:
        lVar35 = (long)piVar36 + -1;
        piVar38 = (pointer)(long)(int)piVar19;
        piVar20 = (int *)((long)local_1e8 + (long)piVar38 * 4 + *local_1b0 * lVar35 + 8);
        *piVar20 = *piVar20 + 1;
        if (*(char *)(local_260._24_8_ + (long)piVar38 + *local_210 * lVar35 + 2) == '\0') {
          piVar31 = (pointer)((ulong)piVar19 & 0xffffffff);
          goto LAB_00158b0d;
        }
        lVar37 = (long)piVar36 + -2;
        piVar20 = (int *)((long)local_1e8 + (long)piVar38 * 4 + *local_1b0 * lVar37 + 4);
        *piVar20 = *piVar20 + 1;
        if (*(char *)(local_260._24_8_ + (long)piVar38 + *local_210 * lVar37 + 1) == '\0') {
          piVar39 = (pointer)(long)(int)piVar19;
          piVar20 = (int *)((long)local_1e8 + (long)piVar39 * 4 + *local_1b0 * lVar35);
          *piVar20 = *piVar20 + 1;
          if (*(char *)((long)piVar39 + (long)(lVar35 * *local_210 + local_260._24_8_)) == '\0') {
            piVar20 = (int *)((long)local_2b8 + (long)piVar38 * 4 + *local_280 * lVar37 + 8);
            *piVar20 = *piVar20 + 1;
            uVar11 = *(uint *)(local_330._24_8_ + (long)piVar38 * 4 + lVar37 * *local_2e0 + 8);
            piVar20 = (int *)((long)local_2b8 + (long)piVar39 * 4 + *local_280 * (long)piVar36 + -8)
            ;
            *piVar20 = *piVar20 + 1;
            uVar12 = *(uint *)(local_330._24_8_ +
                              (long)piVar39 * 4 + *local_2e0 * (long)piVar36 + -8);
          }
          else {
            piVar20 = (int *)((long)local_2b8 + (long)piVar39 * 4 + *local_280 * lVar37);
            *piVar20 = *piVar20 + 1;
            uVar12 = *(uint *)(local_330._24_8_ + (long)piVar39 * 4 + *local_2e0 * lVar37);
            piVar20 = (int *)((long)local_2b8 + (long)piVar38 * 4 + *local_280 * lVar37 + 8);
            *piVar20 = *piVar20 + 1;
            uVar11 = RemSP::MemMerge(uVar12,*(uint *)(local_330._24_8_ +
                                                     (long)piVar38 * 4 + lVar37 * *local_2e0 + 8));
            piVar20 = (int *)((long)local_2b8 + (long)piVar39 * 4 + *local_280 * (long)piVar36 + -8)
            ;
            *piVar20 = *piVar20 + 1;
            uVar12 = *(uint *)(local_330._24_8_ +
                              (long)piVar39 * 4 + *local_2e0 * (long)piVar36 + -8);
          }
          uVar12 = RemSP::MemMerge(uVar11,uVar12);
          piVar20 = (int *)((long)local_2b8 + (long)piVar39 * 4 + *local_280 * (long)piVar36);
          piVar31 = (pointer)((ulong)piVar19 & 0xffffffff);
        }
        else {
          piVar20 = (int *)((long)local_2b8 + (long)piVar38 * 4 + *local_280 * lVar37 + 8);
          *piVar20 = *piVar20 + 1;
          uVar12 = *(uint *)(local_330._24_8_ + (long)piVar38 * 4 + lVar37 * *local_2e0 + 8);
          piVar20 = (int *)((long)local_2b8 + (long)piVar38 * 4 + *local_280 * (long)piVar36 + -8);
          *piVar20 = *piVar20 + 1;
          uVar12 = RemSP::MemMerge(uVar12,*(uint *)(local_330._24_8_ +
                                                   (long)piVar38 * 4 +
                                                   *local_2e0 * (long)piVar36 + -8));
          piVar20 = (int *)((long)local_2b8 + (long)piVar38 * 4 + *local_280 * (long)piVar36);
          piVar31 = (pointer)((ulong)piVar19 & 0xffffffff);
          piVar39 = piVar38;
        }
        goto LAB_0015b43b;
      }
LAB_001575fb:
      piVar20 = (int *)((long)local_1e8 + (long)(int)piVar31 * 4 + *local_1b0 * (long)piVar36 + 4);
      *piVar20 = *piVar20 + 1;
      if (*(char *)(local_260._24_8_ + (long)(int)piVar31 + 1 + *local_210 * (long)piVar36) != '\0')
      goto LAB_0015763b;
      goto LAB_00157d4b;
    }
    piVar20 = (int *)((long)local_2b8 + lVar35 * 4 + *local_280 * (long)piVar36);
    *piVar20 = *piVar20 + 1;
    *(undefined4 *)(local_330._24_8_ + lVar35 * 4 + *local_2e0 * (long)piVar36) = 0;
    uVar12 = (int)piVar31 + 2;
    piVar31 = (pointer)(ulong)uVar12;
    if ((int)plVar43 <= (int)uVar12) {
      piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + lVar37 * (long)piVar36 + 8);
      *piVar20 = *piVar20 + 1;
      cVar15 = *(char *)(local_260._24_8_ + lVar35 + 2 + lVar34 * (long)piVar36);
      if ((int)uVar12 <= (int)plVar43) {
        if (cVar15 != '\0') goto LAB_0015946b;
        goto LAB_00158011;
      }
      if (cVar15 != '\0') goto LAB_00159531;
      goto LAB_00157f58;
    }
    piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + lVar37 * (long)piVar36 + 8);
    *piVar20 = *piVar20 + 1;
    piVar19 = piVar31;
    if (*(char *)(local_260._24_8_ + lVar35 + 2 + lVar34 * (long)piVar36) == '\0') {
LAB_0015751a:
      lVar35 = *local_1b0;
      lVar34 = (long)(int)piVar31;
      piVar20 = (int *)((long)local_1e8 + lVar34 * 4 + lVar35 * ((ulong)piVar36 | 1));
      *piVar20 = *piVar20 + 1;
      lVar37 = *local_210;
      if (*(char *)(local_260._24_8_ + lVar34 + ((ulong)piVar36 | 1) * lVar37) != '\0') {
        piVar20 = (int *)((long)local_1e8 + lVar34 * 4 + lVar35 * (long)piVar36 + 4);
        *piVar20 = *piVar20 + 1;
        uVar12 = RemSP::length_;
        if (*(char *)(local_260._24_8_ + lVar34 + 1 + lVar37 * (long)piVar36) != '\0')
        goto LAB_0015763b;
        lVar35 = (long)(int)RemSP::length_;
        RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[lVar35] =
             RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[lVar35] + 1;
        RemSP::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[lVar35] = uVar12;
        uVar12 = RemSP::length_;
        RemSP::length_ = RemSP::length_ + 1;
        piVar20 = (int *)((long)local_2b8 + lVar34 * 4 + *local_280 * (long)piVar36);
        *piVar20 = *piVar20 + 1;
        *(uint *)(local_330._24_8_ + lVar34 * 4 + *local_2e0 * (long)piVar36) = uVar12;
        goto LAB_00158e98;
      }
      goto LAB_001575fb;
    }
LAB_0015822b:
    lVar35 = (long)piVar36 + -1;
    iVar17 = (int)piVar19;
    piVar39 = (pointer)(long)iVar17;
    piVar20 = (int *)((long)local_1e8 + (long)piVar39 * 4 + *local_1b0 * lVar35 + 4);
    *piVar20 = *piVar20 + 1;
    if (*(char *)(local_260._24_8_ + (long)piVar39 + *local_210 * lVar35 + 1) != '\0') {
      piVar20 = (int *)((long)local_1e8 + (long)piVar39 * 4 + *local_1b0 * lVar35);
      *piVar20 = *piVar20 + 1;
      if ((*(char *)((long)piVar39 + (long)(*local_210 * lVar35 + local_260._24_8_)) == '\0') &&
         (piVar20 = (int *)((long)local_1e8 + (long)iVar17 * 4 + *local_1b0 * lVar35 + -4),
         *piVar20 = *piVar20 + 1,
         *(char *)(local_260._24_8_ + (long)iVar17 + -1 + lVar35 * *local_210) != '\0'))
      goto LAB_0015eec6;
      piVar20 = (int *)((long)local_2b8 + (long)piVar39 * 4 + *local_280 * ((long)piVar36 + -2));
      *piVar20 = *piVar20 + 1;
      uVar12 = *(uint *)(local_330._24_8_ + (long)piVar39 * 4 + ((long)piVar36 + -2) * *local_2e0);
      goto LAB_0015e2f2;
    }
    piVar20 = (int *)((long)local_1e8 + (long)piVar39 * 4 + *local_1b0 * (long)piVar36 + 4);
    *piVar20 = *piVar20 + 1;
    if (*(char *)(local_260._24_8_ + (long)piVar39 + *local_210 * (long)piVar36 + 1) != '\0') {
      piVar39 = (pointer)(long)iVar17;
      piVar20 = (int *)((long)local_1e8 + (long)piVar39 * 4 + *local_1b0 * lVar35 + 8);
      *piVar20 = *piVar20 + 1;
      cVar15 = *(char *)(local_260._24_8_ + (long)piVar39 + *local_210 * lVar35 + 2);
      piVar20 = (int *)((long)local_1e8 + (long)piVar39 * 4 + *local_1b0 * lVar35);
      *piVar20 = *piVar20 + 1;
      cVar1 = *(char *)((long)piVar39 + (long)(*local_210 * lVar35 + local_260._24_8_));
      piVar31 = piVar19;
      if (cVar15 == '\0') {
        if (cVar1 != '\0') goto LAB_001577b9;
        lVar37 = (long)iVar17;
        piVar20 = (int *)((long)local_1e8 + lVar37 * 4 + *local_1b0 * lVar35 + -4);
        *piVar20 = *piVar20 + 1;
        if (*(char *)(local_260._24_8_ + lVar37 + -1 + lVar35 * *local_210) == '\0')
        goto LAB_0015851c;
        piVar20 = (int *)((long)local_2b8 + lVar37 * 4 + *local_280 * ((long)piVar36 + -2) + -8);
        *piVar20 = *piVar20 + 1;
        uVar12 = *(uint *)(local_330._24_8_ + lVar37 * 4 + ((long)piVar36 + -2) * *local_2e0 + -8);
        lVar35 = *local_280;
        goto LAB_0015854c;
      }
      if (cVar1 != '\0') goto LAB_001576fd;
      piVar20 = (int *)((long)local_1e8 + (long)iVar17 * 4 + *local_1b0 * lVar35 + -4);
      *piVar20 = *piVar20 + 1;
      if (*(char *)(local_260._24_8_ + (long)iVar17 + -1 + lVar35 * *local_210) == '\0')
      goto LAB_0015b3f0;
LAB_0015f425:
      lVar35 = (long)piVar36 + -2;
      piVar39 = (pointer)(long)(int)piVar31;
      piVar20 = (int *)((long)local_1e8 + (long)piVar39 * 4 + *local_1b0 * lVar35 + 4);
      *piVar20 = *piVar20 + 1;
      if (*(char *)(local_260._24_8_ + (long)piVar39 + *local_210 * lVar35 + 1) == '\0') {
        lVar37 = *local_280;
LAB_0015f566:
        piVar39 = (pointer)(long)(int)piVar31;
        piVar20 = (int *)((long)local_2b8 + (long)piVar39 * 4 + lVar37 * lVar35 + -8);
        *piVar20 = *piVar20 + 1;
        uVar12 = *(uint *)(local_330._24_8_ + (long)piVar39 * 4 + *local_2e0 * lVar35 + -8);
        piVar20 = (int *)((long)local_2b8 + (long)piVar39 * 4 + *local_280 * lVar35 + 8);
        *piVar20 = *piVar20 + 1;
        uVar11 = *(uint *)(local_330._24_8_ + (long)piVar39 * 4 + lVar35 * *local_2e0 + 8);
        goto LAB_0015f5b5;
      }
      piVar20 = (int *)((long)local_1e8 + (long)piVar39 * 4 + *local_1b0 * lVar35);
      *piVar20 = *piVar20 + 1;
      if (*(char *)((long)piVar39 + (long)(*local_210 * lVar35 + local_260._24_8_)) == '\0') {
        lVar37 = *local_280;
        goto LAB_0015f566;
      }
      piVar20 = (int *)((long)local_2b8 + (long)piVar39 * 4 + *local_280 * lVar35 + 8);
      *piVar20 = *piVar20 + 1;
      uVar12 = *(uint *)(local_330._24_8_ + (long)piVar39 * 4 + lVar35 * *local_2e0 + 8);
      lVar35 = *local_280;
      goto LAB_0015f5d2;
    }
    piVar39 = (pointer)(long)iVar17;
    piVar20 = (int *)((long)local_1e8 + (long)piVar39 * 4 + *local_1b0 * lVar35);
    *piVar20 = *piVar20 + 1;
    if (*(char *)((long)piVar39 + (long)(*local_210 * lVar35 + local_260._24_8_)) == '\0') {
      lVar37 = (long)iVar17;
      piVar20 = (int *)((long)local_1e8 + lVar37 * 4 + *local_1b0 * lVar35 + -4);
      *piVar20 = *piVar20 + 1;
      uVar12 = RemSP::length_;
      if (*(char *)(local_260._24_8_ + lVar37 + -1 + lVar35 * *local_210) != '\0') {
        piVar20 = (int *)((long)local_2b8 + lVar37 * 4 + *local_280 * ((long)piVar36 + -2) + -8);
        *piVar20 = *piVar20 + 1;
        uVar12 = *(uint *)(local_330._24_8_ + lVar37 * 4 + ((long)piVar36 + -2) * *local_2e0 + -8);
        goto LAB_001585f3;
      }
      lVar35 = (long)(int)RemSP::length_;
      RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start[lVar35] =
           RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start[lVar35] + 1;
      RemSP::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[lVar35] = uVar12;
      uVar12 = RemSP::length_;
      RemSP::length_ = RemSP::length_ + 1;
      goto LAB_001585f3;
    }
    piVar20 = (int *)((long)local_2b8 + (long)piVar39 * 4 + *local_280 * ((long)piVar36 + -2));
    *piVar20 = *piVar20 + 1;
    uVar12 = *(uint *)(local_330._24_8_ + (long)piVar39 * 4 + ((long)piVar36 + -2) * *local_2e0);
LAB_0015a27d:
    piVar20 = (int *)((long)local_2b8 + (long)piVar39 * 4 + *local_280 * (long)piVar36);
    *piVar20 = *piVar20 + 1;
    *(uint *)(local_330._24_8_ + (long)piVar39 * 4 + *local_2e0 * (long)piVar36) = uVar12;
    lVar35 = (long)(int)piVar19;
    piVar39 = (pointer)(lVar35 + 2);
    iVar17 = (int)piVar39;
    if ((int)plVar43 <= iVar17) {
      piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + *local_1b0 * (long)piVar36 + 8);
      *piVar20 = *piVar20 + 1;
      cVar15 = *(char *)(local_260._24_8_ + lVar35 + 2 + *local_210 * (long)piVar36);
      if ((int)plVar43 < iVar17) {
        if (cVar15 == '\0') {
          piVar19 = (pointer)((ulong)piVar39 & 0xffffffff);
          goto LAB_0015d8de;
        }
        piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + *local_1b0 * ((ulong)piVar36 | 1) + 4);
        *piVar20 = *piVar20 + 1;
        if (*(char *)(local_260._24_8_ + lVar35 + 1 + ((ulong)piVar36 | 1) * *local_210) == '\0') {
          piVar19 = (pointer)((ulong)piVar39 & 0xffffffff);
          goto LAB_001573a9;
        }
      }
      else {
        if (cVar15 == '\0') {
          piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + *local_1b0 * ((ulong)piVar36 | 1) + 8);
          *piVar20 = *piVar20 + 1;
          if (*(char *)(local_260._24_8_ + lVar35 + 2 + ((ulong)piVar36 | 1) * *local_210) == '\0')
          {
            piVar31 = (pointer)((ulong)piVar39 & 0xffffffff);
            goto LAB_0015808c;
          }
          piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + *local_1b0 * (long)piVar36 + 0xc);
          *piVar20 = *piVar20 + 1;
          if (*(char *)(local_260._24_8_ + lVar35 + 3 + *local_210 * (long)piVar36) == '\0')
          goto LAB_0015d923;
        }
        piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + *local_1b0 * ((ulong)piVar36 | 1) + 4);
        *piVar20 = *piVar20 + 1;
        if (*(char *)(local_260._24_8_ + lVar35 + 1 + ((ulong)piVar36 | 1) * *local_210) == '\0') {
          piVar31 = (pointer)((ulong)piVar39 & 0xffffffff);
          goto LAB_00157278;
        }
        piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + *local_1b0 * ((long)piVar36 + -1) + 0xc);
        *piVar20 = *piVar20 + 1;
        if (*(char *)(local_260._24_8_ + lVar35 + 3 + ((long)piVar36 + -1) * *local_210) != '\0')
        goto LAB_0015d3b1;
      }
      piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + *local_1b0 * ((long)piVar36 + -1) + 8);
      *piVar20 = *piVar20 + 1;
      if (*(char *)(local_260._24_8_ + lVar35 + 2 + ((long)piVar36 + -1) * *local_210) != '\0')
      goto LAB_0015d6cf;
      piVar20 = (int *)((long)local_2b8 + lVar35 * 4 + *local_280 * (long)piVar36);
      *piVar20 = *piVar20 + 1;
      uVar11 = *(uint *)(local_330._24_8_ + lVar35 * 4 + *local_2e0 * (long)piVar36);
      piVar20 = (int *)((long)local_2b8 + lVar35 * 4 + *local_280 * (long)piVar36 + 8);
      *piVar20 = *piVar20 + 1;
      piVar38 = piVar39;
      goto LAB_0015d7fa;
    }
    piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + *local_1b0 * (long)piVar36 + 8);
    *piVar20 = *piVar20 + 1;
    uVar41 = (ulong)piVar36 | 1;
    if (*(char *)(local_260._24_8_ + lVar35 + 2 + *local_210 * (long)piVar36) != '\0') {
      piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + *local_1b0 * uVar41 + 4);
      *piVar20 = *piVar20 + 1;
      if (*(char *)(local_260._24_8_ + lVar35 + 1 + uVar41 * *local_210) == '\0') {
        piVar19 = (pointer)((ulong)piVar39 & 0xffffffff);
        goto LAB_00157318;
      }
      lVar37 = (long)piVar36 + -1;
      piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + *local_1b0 * lVar37 + 0xc);
      *piVar20 = *piVar20 + 1;
      if (*(char *)(local_260._24_8_ + lVar35 + 3 + *local_210 * lVar37) != '\0') goto LAB_0015d1a4;
      piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + *local_1b0 * (long)piVar36 + 0xc);
      *piVar20 = *piVar20 + 1;
      if (*(char *)(local_260._24_8_ + lVar35 + 3 + *local_210 * (long)piVar36) != '\0')
      goto LAB_0015a6f6;
      piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + *local_1b0 * lVar37 + 8);
      *piVar20 = *piVar20 + 1;
      if (*(char *)(local_260._24_8_ + lVar35 + 2 + lVar37 * *local_210) == '\0') {
        piVar20 = (int *)((long)local_2b8 + lVar35 * 4 + *local_280 * (long)piVar36);
        *piVar20 = *piVar20 + 1;
        piVar19 = (pointer)((ulong)piVar39 & 0xffffffff);
        uVar12 = *(uint *)(local_330._24_8_ + lVar35 * 4 + *local_2e0 * (long)piVar36);
LAB_001585f3:
        while( true ) {
          piVar20 = (int *)((long)local_2b8 + (long)piVar39 * 4 + *local_280 * (long)piVar36);
          *piVar20 = *piVar20 + 1;
          *(uint *)(local_330._24_8_ + (long)piVar39 * 4 + *local_2e0 * (long)piVar36) = uVar12;
          lVar35 = (long)(int)piVar19;
          piVar19 = (pointer)(lVar35 + 2);
          if ((int)plVar43 <= (int)piVar19) {
            piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + *local_1b0 * (long)piVar36 + 8);
            *piVar20 = *piVar20 + 1;
            cVar15 = *(char *)(local_260._24_8_ + lVar35 + 2 + *local_210 * (long)piVar36);
            if ((int)piVar19 <= (int)plVar43) {
              if (cVar15 == '\0') goto LAB_001595fc;
              goto LAB_0015967b;
            }
            if (cVar15 == '\0') goto LAB_0015d8de;
            piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + *local_1b0 * ((ulong)piVar36 | 1) + 4);
            *piVar20 = *piVar20 + 1;
            if (*(char *)(local_260._24_8_ + lVar35 + 1 + ((ulong)piVar36 | 1) * *local_210) == '\0'
               ) goto LAB_001573a9;
            goto LAB_00159700;
          }
          piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + *local_1b0 * (long)piVar36 + 8);
          *piVar20 = *piVar20 + 1;
          if (*(char *)(local_260._24_8_ + lVar35 + 2 + *local_210 * (long)piVar36) == '\0') {
            piVar31 = (pointer)((ulong)piVar19 & 0xffffffff);
LAB_00158854:
            uVar41 = (ulong)piVar36 | 1;
            lVar35 = (long)(int)piVar31;
            piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + *local_1b0 * uVar41);
            *piVar20 = *piVar20 + 1;
            if (*(char *)(local_260._24_8_ + lVar35 + *local_210 * uVar41) == '\0')
            goto LAB_001575fb;
            piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + *local_1b0 * (long)piVar36 + 4);
            *piVar20 = *piVar20 + 1;
            if (*(char *)(local_260._24_8_ + lVar35 + 1 + *local_210 * (long)piVar36) != '\0') {
              piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + *local_1b0 * uVar41 + -4);
              *piVar20 = *piVar20 + 1;
              if (*(char *)(local_260._24_8_ + lVar35 + -1 + uVar41 * *local_210) != '\0')
              goto LAB_00158910;
              goto LAB_0015763b;
            }
            goto LAB_00158d93;
          }
          piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + *local_1b0 * ((ulong)piVar36 | 1) + 4);
          *piVar20 = *piVar20 + 1;
          if (*(char *)(local_260._24_8_ + lVar35 + 1 + ((ulong)piVar36 | 1) * *local_210) == '\0')
          goto LAB_00157318;
          piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + *local_1b0 * ((long)piVar36 + -1) + 0xc);
          *piVar20 = *piVar20 + 1;
          if (*(char *)(local_260._24_8_ + lVar35 + 3 + ((long)piVar36 + -1) * *local_210) != '\0')
          {
            piVar20 = (int *)((long)local_2b8 + lVar35 * 4 + *local_280 * ((long)piVar36 + -2) + 8);
            *piVar20 = *piVar20 + 1;
            uVar12 = *(uint *)(local_330._24_8_ + lVar35 * 4 + ((long)piVar36 + -2) * *local_2e0 + 8
                              );
            piVar20 = (int *)((long)local_2b8 + lVar35 * 4 + *local_280 * (long)piVar36);
            *piVar20 = *piVar20 + 1;
            uVar12 = RemSP::MemMerge(uVar12,*(uint *)(local_330._24_8_ +
                                                     lVar35 * 4 + *local_2e0 * (long)piVar36));
            piVar39 = piVar19;
            goto LAB_0015e2f2;
          }
          piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + *local_1b0 * (long)piVar36 + 0xc);
          *piVar20 = *piVar20 + 1;
          if (*(char *)(local_260._24_8_ + lVar35 + 3 + *local_210 * (long)piVar36) != '\0')
          goto LAB_001589e2;
LAB_00159cdf:
          iVar17 = (int)piVar19;
          piVar39 = (pointer)(long)iVar17;
          piVar20 = (int *)((long)local_1e8 + (long)piVar39 * 4 + *local_1b0 * ((long)piVar36 + -1))
          ;
          *piVar20 = *piVar20 + 1;
          if (*(char *)((long)piVar39 + (long)(((long)piVar36 + -1) * *local_210 + local_260._24_8_)
                       ) != '\0') break;
          piVar20 = (int *)((long)local_2b8 + (long)iVar17 * 4 + *local_280 * (long)piVar36 + -8);
          *piVar20 = *piVar20 + 1;
          uVar12 = *(uint *)(local_330._24_8_ + (long)iVar17 * 4 + *local_2e0 * (long)piVar36 + -8);
        }
      }
      else {
LAB_0015dd6b:
        piVar19 = (pointer)((ulong)piVar39 & 0xffffffff);
        piVar39 = (pointer)(long)(int)piVar39;
        piVar20 = (int *)((long)local_1e8 +
                         (long)piVar39 * 4 + *local_1b0 * ((long)piVar36 + -2) + -4);
        *piVar20 = *piVar20 + 1;
        if (*(char *)(local_260._24_8_ + (long)piVar39 + *local_210 * ((long)piVar36 + -2) + -1) !=
            '\0') {
LAB_001574bb:
          piVar20 = (int *)((long)local_2b8 + (long)piVar39 * 4 + *local_280 * ((long)piVar36 + -2))
          ;
          *piVar20 = *piVar20 + 1;
          uVar12 = *(uint *)(local_330._24_8_ +
                            (long)piVar39 * 4 + ((long)piVar36 + -2) * *local_2e0);
          goto LAB_0015a27d;
        }
      }
      piVar20 = (int *)((long)local_2b8 + (long)piVar39 * 4 + *local_280 * ((long)piVar36 + -2));
      *piVar20 = *piVar20 + 1;
      uVar12 = *(uint *)(local_330._24_8_ + (long)piVar39 * 4 + ((long)piVar36 + -2) * *local_2e0);
      piVar20 = (int *)((long)local_2b8 + (long)piVar39 * 4 + *local_280 * (long)piVar36 + -8);
      *piVar20 = *piVar20 + 1;
      uVar12 = RemSP::MemMerge(uVar12,*(uint *)(local_330._24_8_ +
                                               (long)piVar39 * 4 + *local_2e0 * (long)piVar36 + -8))
      ;
      goto LAB_0015a27d;
    }
    piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + *local_1b0 * uVar41 + 8);
    *piVar20 = *piVar20 + 1;
    if (*(char *)(local_260._24_8_ + lVar35 + 2 + *local_210 * uVar41) == '\0') {
      piVar31 = (pointer)((ulong)piVar39 & 0xffffffff);
      goto LAB_001575fb;
    }
    piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + *local_1b0 * (long)piVar36 + 0xc);
    *piVar20 = *piVar20 + 1;
    if (*(char *)(local_260._24_8_ + lVar35 + 3 + *local_210 * (long)piVar36) != '\0')
    goto code_r0x0015a5a3;
    piVar31 = (pointer)((ulong)piVar39 & 0xffffffff);
LAB_00158d93:
    lVar35 = (long)(int)piVar31;
    piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + *local_1b0 * ((ulong)piVar36 | 1) + -4);
    *piVar20 = *piVar20 + 1;
    uVar12 = RemSP::length_;
    if (*(char *)(local_260._24_8_ + lVar35 + -1 + ((ulong)piVar36 | 1) * *local_210) == '\0') {
      lVar37 = (long)(int)RemSP::length_;
      RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start[lVar37] =
           RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start[lVar37] + 1;
      RemSP::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[lVar37] = uVar12;
      uVar12 = RemSP::length_;
      RemSP::length_ = RemSP::length_ + 1;
      piVar20 = (int *)((long)local_2b8 + lVar35 * 4 + *local_280 * (long)piVar36);
      *piVar20 = *piVar20 + 1;
      *(uint *)(local_330._24_8_ + lVar35 * 4 + *local_2e0 * (long)piVar36) = uVar12;
    }
    else {
      piVar20 = (int *)((long)local_2b8 + lVar35 * 4 + *local_280 * (long)piVar36 + -8);
      *piVar20 = *piVar20 + 1;
      uVar18 = *(undefined4 *)(local_330._24_8_ + lVar35 * 4 + *local_2e0 * (long)piVar36 + -8);
      piVar20 = (int *)((long)local_2b8 + lVar35 * 4 + *local_280 * (long)piVar36);
      *piVar20 = *piVar20 + 1;
      *(undefined4 *)(local_330._24_8_ + lVar35 * 4 + *local_2e0 * (long)piVar36) = uVar18;
    }
    goto LAB_00158e98;
  }
  piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + *local_1b0 * (long)piVar36 + 0xc);
  *piVar20 = *piVar20 + 1;
  if (*(char *)(local_260._24_8_ + lVar35 + 3 + *local_210 * (long)piVar36) == '\0')
  goto LAB_0015af4a;
  piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + *local_1b0 * ((long)piVar36 + -1) + 0xc);
  *piVar20 = *piVar20 + 1;
  if (*(char *)(local_260._24_8_ + lVar35 + 3 + ((long)piVar36 + -1) * *local_210) == '\0')
  goto LAB_0015ad7c;
LAB_0015acaa:
  piVar20 = (int *)((long)local_2b8 + lVar35 * 4 + *local_280 * ((long)piVar36 + -2) + 8);
  *piVar20 = *piVar20 + 1;
  uVar12 = *(uint *)(local_330._24_8_ + lVar35 * 4 + ((long)piVar36 + -2) * *local_2e0 + 8);
  piVar20 = (int *)((long)local_2b8 + lVar35 * 4 + *local_280 * (long)piVar36);
  *piVar20 = *piVar20 + 1;
  uVar12 = RemSP::MemMerge(uVar12,*(uint *)(local_330._24_8_ +
                                           lVar35 * 4 + *local_2e0 * (long)piVar36));
  piVar31 = (pointer)((ulong)piVar39 & 0xffffffff);
  goto LAB_0015b11f;
LAB_0015af4a:
  piVar20 = (int *)((long)local_2b8 + lVar35 * 4 + *local_280 * (long)piVar36);
  *piVar20 = *piVar20 + 1;
  uVar18 = *(undefined4 *)(local_330._24_8_ + lVar35 * 4 + *local_2e0 * (long)piVar36);
  piVar20 = (int *)((long)local_2b8 + lVar35 * 4 + *local_280 * (long)piVar36 + 8);
  *piVar20 = *piVar20 + 1;
  *(undefined4 *)(local_330._24_8_ + lVar35 * 4 + *local_2e0 * (long)piVar36 + 8) = uVar18;
  piVar31 = (pointer)((ulong)piVar39 & 0xffffffff);
  goto LAB_00158e98;
LAB_0015adc0:
  piVar20 = (int *)((long)local_2b8 + lVar35 * 4 + *local_280 * ((long)piVar36 + -2) + 0x10);
  *piVar20 = *piVar20 + 1;
  uVar12 = *(uint *)(local_330._24_8_ + lVar35 * 4 + ((long)piVar36 + -2) * *local_2e0 + 0x10);
  piVar20 = (int *)((long)local_2b8 + lVar35 * 4 + *local_280 * (long)piVar36);
  *piVar20 = *piVar20 + 1;
  uVar11 = *(uint *)(local_330._24_8_ + lVar35 * 4 + *local_2e0 * (long)piVar36);
LAB_0015ae25:
  uVar12 = RemSP::MemMerge(uVar12,uVar11);
  piVar20 = (int *)((long)local_2b8 + (long)piVar39 * 4 + *local_280 * (long)piVar36);
  piVar31 = (pointer)((ulong)piVar39 & 0xffffffff);
  goto LAB_0015b43b;
code_r0x0015b0a8:
  lVar35 = (long)piVar36 + -1;
  piVar20 = (int *)((long)local_1e8 + (long)piVar39 * 4 + *local_1b0 * lVar35 + 4);
  *piVar20 = *piVar20 + 1;
  if (*(char *)(local_260._24_8_ + (long)piVar39 + *local_210 * lVar35 + 1) != '\0')
  goto LAB_0015b0ef;
  piVar39 = (pointer)(long)iVar17;
  piVar20 = (int *)((long)local_1e8 + (long)piVar39 * 4 + *local_1b0 * lVar35 + 8);
  *piVar20 = *piVar20 + 1;
  uVar12 = RemSP::length_;
  piVar19 = piVar31;
  if (*(char *)(local_260._24_8_ + (long)piVar39 + lVar35 * *local_210 + 2) != '\0')
  goto LAB_0015b3f0;
  lVar35 = (long)(int)RemSP::length_;
  RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[lVar35] =
       RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start[lVar35] + 1;
  RemSP::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start[lVar35] = uVar12;
  piVar38 = (pointer)(*local_280 * (long)piVar36 + (long)local_2b8);
  piVar39 = (pointer)(long)iVar17;
  uVar12 = RemSP::length_;
  RemSP::length_ = RemSP::length_ + 1;
  goto LAB_0015a980;
code_r0x0015a5a3:
  piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + *local_1b0 * uVar41 + 4);
  *piVar20 = *piVar20 + 1;
  if (*(char *)(local_260._24_8_ + lVar35 + 1 + uVar41 * *local_210) == '\0') {
    piVar31 = (pointer)((ulong)piVar39 & 0xffffffff);
    goto LAB_0015763b;
  }
  piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + *local_1b0 * ((long)piVar36 + -1) + 0xc);
  *piVar20 = *piVar20 + 1;
  if (*(char *)(local_260._24_8_ + lVar35 + 3 + ((long)piVar36 + -1) * *local_210) != '\0')
  goto LAB_0015d598;
LAB_0015a6f6:
  lVar37 = (long)piVar36 + -1;
  piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + *local_1b0 * lVar37 + 0x10);
  *piVar20 = *piVar20 + 1;
  if (*(char *)(local_260._24_8_ + lVar35 + 4 + *local_210 * lVar37) != '\0') {
    lVar34 = (long)piVar36 + -2;
    piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + *local_1b0 * lVar34 + 0xc);
    *piVar20 = *piVar20 + 1;
    if (*(char *)(local_260._24_8_ + lVar35 + 3 + *local_210 * lVar34) != '\0') goto LAB_0015db33;
    piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + *local_1b0 * lVar37 + 8);
    *piVar20 = *piVar20 + 1;
    piVar31 = piVar39;
    if (*(char *)(local_260._24_8_ + lVar35 + 2 + lVar37 * *local_210) != '\0') goto LAB_0015dee2;
    piVar20 = (int *)((long)local_2b8 + lVar35 * 4 + *local_280 * lVar34 + 0x10);
    *piVar20 = *piVar20 + 1;
    uVar12 = *(uint *)(local_330._24_8_ + lVar35 * 4 + lVar34 * *local_2e0 + 0x10);
    piVar20 = (int *)((long)local_2b8 + lVar35 * 4 + *local_280 * (long)piVar36);
    *piVar20 = *piVar20 + 1;
    uVar12 = RemSP::MemMerge(uVar12,*(uint *)(local_330._24_8_ +
                                             lVar35 * 4 + *local_2e0 * (long)piVar36));
    piVar20 = (int *)((long)local_2b8 + (long)piVar39 * 4 + *local_280 * (long)piVar36);
    piVar31 = (pointer)((ulong)piVar39 & 0xffffffff);
    goto LAB_0015b43b;
  }
  piVar20 = (int *)((long)local_1e8 + lVar35 * 4 + *local_1b0 * lVar37 + 8);
  *piVar20 = *piVar20 + 1;
  if (*(char *)(local_260._24_8_ + lVar35 + 2 + lVar37 * *local_210) != '\0') goto LAB_0015de2f;
  piVar20 = (int *)((long)local_2b8 + lVar35 * 4 + *local_280 * (long)piVar36);
  *piVar20 = *piVar20 + 1;
  piVar19 = (pointer)(*local_280 * (long)piVar36 + (long)local_2b8);
  uVar12 = *(uint *)(local_330._24_8_ + lVar35 * 4 + *local_2e0 * (long)piVar36);
LAB_0015e0ed:
  piVar20 = piVar19 + (long)piVar39;
  piVar31 = (pointer)((ulong)piVar39 & 0xffffffff);
  goto LAB_0015a984;
LAB_0015d598:
  piVar31 = (pointer)((ulong)piVar39 & 0xffffffff);
  piVar39 = (pointer)(long)(int)piVar39;
  piVar20 = (int *)((long)local_1e8 + (long)piVar39 * 4 + *local_1b0 * ((long)piVar36 + -2) + -4);
  *piVar20 = *piVar20 + 1;
  if (*(char *)(local_260._24_8_ + (long)piVar39 + *local_210 * ((long)piVar36 + -2) + -1) == '\0')
  goto LAB_00158957;
LAB_0015ecce:
  piVar39 = (pointer)(long)(int)piVar31;
  piVar20 = (int *)((long)local_1e8 + (long)piVar39 * 4 + *local_1b0 * ((long)piVar36 + -1));
  *piVar20 = *piVar20 + 1;
  if ((*(char *)((long)piVar39 + (long)(((long)piVar36 + -1) * *local_210 + local_260._24_8_)) ==
       '\0') &&
     (piVar20 = (int *)((long)local_1e8 + (long)piVar39 * 4 + *local_1b0 * ((long)piVar36 + -2)),
     *piVar20 = *piVar20 + 1,
     *(char *)((long)piVar39 + (long)(*local_210 * ((long)piVar36 + -2) + local_260._24_8_)) == '\0'
     )) goto LAB_00158957;
LAB_0015b0ef:
  piVar20 = (int *)((long)local_2b8 + (long)piVar39 * 4 + *local_280 * ((long)piVar36 + -2));
  *piVar20 = *piVar20 + 1;
  uVar12 = *(uint *)(local_330._24_8_ + (long)piVar39 * 4 + ((long)piVar36 + -2) * *local_2e0);
  goto LAB_0015b11f;
LAB_0015763b:
  piVar39 = (pointer)(long)(int)piVar31;
  piVar20 = (int *)((long)local_1e8 + (long)piVar39 * 4 + *local_1b0 * ((long)piVar36 + -1) + 4);
  *piVar20 = *piVar20 + 1;
  if (*(char *)(local_260._24_8_ + (long)piVar39 + ((long)piVar36 + -1) * *local_210 + 1) != '\0')
  goto LAB_0015b0ef;
LAB_0015767e:
  lVar35 = (long)piVar36 + -1;
  piVar39 = (pointer)(long)(int)piVar31;
  piVar20 = (int *)((long)local_1e8 + (long)piVar39 * 4 + *local_1b0 * lVar35 + 8);
  *piVar20 = *piVar20 + 1;
  cVar15 = *(char *)(local_260._24_8_ + (long)piVar39 + *local_210 * lVar35 + 2);
  piVar20 = (int *)((long)local_1e8 + (long)piVar39 * 4 + *local_1b0 * lVar35);
  *piVar20 = *piVar20 + 1;
  cVar1 = *(char *)((long)piVar39 + (long)(lVar35 * *local_210 + local_260._24_8_));
  piVar19 = piVar31;
  if (cVar15 != '\0') {
    if (cVar1 == '\0') goto LAB_0015b3f0;
    goto LAB_001576fd;
  }
  if (cVar1 != '\0') goto LAB_001577b9;
LAB_0015851c:
  uVar12 = RemSP::length_;
  lVar35 = (long)(int)RemSP::length_;
  RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[lVar35] =
       RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start[lVar35] + 1;
  RemSP::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start[lVar35] = uVar12;
  lVar35 = *local_280;
  uVar12 = RemSP::length_;
  RemSP::length_ = RemSP::length_ + 1;
  goto LAB_0015854c;
LAB_001577b9:
  piVar20 = (int *)((long)local_2b8 + (long)piVar39 * 4 + *local_280 * ((long)piVar36 + -2));
  *piVar20 = *piVar20 + 1;
  uVar12 = *(uint *)(local_330._24_8_ + (long)piVar39 * 4 + ((long)piVar36 + -2) * *local_2e0);
  goto LAB_001577e7;
LAB_0015ced0:
  piVar39 = (pointer)(long)(int)piVar31;
  piVar20 = (int *)((long)local_1e8 + (long)piVar39 * 4 + *local_1b0 * ((long)piVar36 + -1) + 8);
  *piVar20 = *piVar20 + 1;
  if (*(char *)(local_260._24_8_ + (long)piVar39 + ((long)piVar36 + -1) * *local_210 + 2) != '\0')
  goto LAB_0015cf13;
  piVar20 = (int *)((long)local_2b8 + (long)piVar39 * 4 + *local_280 * (long)piVar36 + -8);
  *piVar20 = *piVar20 + 1;
  uVar12 = *(uint *)(local_330._24_8_ + (long)piVar39 * 4 + *local_2e0 * (long)piVar36 + -8);
LAB_0015d441:
  piVar20 = (int *)((long)local_2b8 + (long)piVar39 * 4 + *local_280 * (long)piVar36);
  local_190 = piVar31;
  goto LAB_0015bdae;
LAB_0015cf13:
  lVar35 = (long)piVar36 + -2;
  piVar39 = (pointer)(long)(int)piVar31;
  piVar20 = (int *)((long)local_1e8 + (long)piVar39 * 4 + *local_1b0 * lVar35 + 4);
  *piVar20 = *piVar20 + 1;
  if (*(char *)(local_260._24_8_ + (long)piVar39 + *local_210 * lVar35 + 1) != '\0')
  goto LAB_0015cf5c;
  piVar20 = (int *)((long)local_2b8 + (long)piVar39 * 4 + *local_280 * lVar35 + 8);
  *piVar20 = *piVar20 + 1;
  uVar12 = *(uint *)(local_330._24_8_ + (long)piVar39 * 4 + lVar35 * *local_2e0 + 8);
  piVar20 = (int *)((long)local_2b8 + (long)piVar39 * 4 + *local_280 * (long)piVar36 + -8);
  *piVar20 = *piVar20 + 1;
  uVar11 = *(uint *)(local_330._24_8_ + (long)piVar39 * 4 + *local_2e0 * (long)piVar36 + -8);
LAB_0015f5b5:
  uVar12 = RemSP::MemMerge(uVar12,uVar11);
  lVar35 = *local_280;
LAB_0015f5d2:
  piVar20 = (int *)((long)local_2b8 + (long)piVar39 * 4 + lVar35 * (long)piVar36);
  goto LAB_0015b43b;
LAB_0015cf5c:
  piVar39 = (pointer)(long)(int)piVar31;
  piVar20 = (int *)((long)local_1e8 + (long)piVar39 * 4 + *local_1b0 * ((long)piVar36 + -1));
  *piVar20 = *piVar20 + 1;
  lVar35 = (long)piVar36 + -2;
  piVar19 = piVar31;
  if (*(char *)((long)piVar39 + (long)(((long)piVar36 + -1) * *local_210 + local_260._24_8_)) !=
      '\0') {
LAB_0015b3f0:
    piVar20 = (int *)((long)local_2b8 + (long)piVar39 * 4 + *local_280 * ((long)piVar36 + -2) + 8);
    *piVar20 = *piVar20 + 1;
    uVar12 = *(uint *)(local_330._24_8_ + (long)piVar39 * 4 + ((long)piVar36 + -2) * *local_2e0 + 8)
    ;
    lVar35 = *local_280;
    goto LAB_0015b42b;
  }
  piVar20 = (int *)((long)local_1e8 + (long)piVar39 * 4 + *local_1b0 * lVar35);
  *piVar20 = *piVar20 + 1;
  lVar37 = (long)((int)piVar31 + 2);
  if (*(char *)((long)piVar39 + (long)(*local_210 * lVar35 + local_260._24_8_)) != '\0') {
LAB_0015cfe2:
    piVar20 = (int *)((long)local_2b8 + lVar37 * 4 + *local_280 * ((long)piVar36 + -2));
    *piVar20 = *piVar20 + 1;
    uVar12 = *(uint *)(local_330._24_8_ + lVar37 * 4 + ((long)piVar36 + -2) * *local_2e0);
    lVar35 = *local_280;
    goto LAB_0015b42b;
  }
  piVar20 = (int *)((long)local_2b8 + lVar37 * 4 + *local_280 * lVar35);
  *piVar20 = *piVar20 + 1;
  uVar12 = *(uint *)(local_330._24_8_ + lVar37 * 4 + lVar35 * *local_2e0);
  piVar20 = (int *)((long)local_2b8 + (long)piVar39 * 4 + *local_280 * (long)piVar36 + -8);
  *piVar20 = *piVar20 + 1;
LAB_0015dc91:
  uVar11 = *(uint *)(local_330._24_8_ + (long)piVar39 * 4 + *local_2e0 * (long)piVar36 + -8);
  goto LAB_0015dca9;
LAB_0015c43c:
  piVar19 = (pointer)((ulong)piVar39 & 0xffffffff);
  lVar35 = (long)piVar36 + -2;
  iVar17 = (int)piVar39;
  piVar39 = (pointer)(long)iVar17;
  piVar20 = (int *)((long)local_1e8 + (long)piVar39 * 4 + *local_1b0 * lVar35 + -4);
  *piVar20 = *piVar20 + 1;
  lVar37 = (long)(iVar17 + 2);
  if (*(char *)(local_260._24_8_ + (long)piVar39 + *local_210 * lVar35 + -1) != '\0')
  goto LAB_0015cfe2;
  piVar20 = (int *)((long)local_2b8 + lVar37 * 4 + *local_280 * lVar35);
  *piVar20 = *piVar20 + 1;
  uVar12 = *(uint *)(local_330._24_8_ + lVar37 * 4 + lVar35 * *local_2e0);
  piVar39 = (pointer)(long)iVar17;
  piVar20 = (int *)((long)local_2b8 + (long)piVar39 * 4 + *local_280 * (long)piVar36 + -8);
  *piVar20 = *piVar20 + 1;
  goto LAB_0015dc91;
LAB_0015ee8c:
  piVar19 = (pointer)(ulong)(uint)(iVar10 + (int)lVar40);
LAB_0015eec6:
  lVar35 = (long)piVar36 + -2;
  piVar39 = (pointer)(long)(int)piVar19;
  piVar20 = (int *)((long)local_1e8 + (long)piVar39 * 4 + *local_1b0 * lVar35);
  *piVar20 = *piVar20 + 1;
  if (*(char *)((long)piVar39 + (long)(*local_210 * lVar35 + local_260._24_8_)) != '\0')
  goto LAB_0015e2c2;
  piVar20 = (int *)((long)local_2b8 + (long)piVar39 * 4 + *local_280 * lVar35 + -8);
  *piVar20 = *piVar20 + 1;
  uVar12 = *(uint *)(local_330._24_8_ + (long)piVar39 * 4 + *local_2e0 * lVar35 + -8);
  piVar20 = (int *)((long)local_2b8 + (long)piVar39 * 4 + *local_280 * lVar35);
  *piVar20 = *piVar20 + 1;
  uVar11 = *(uint *)(local_330._24_8_ + (long)piVar39 * 4 + lVar35 * *local_2e0);
LAB_0015ef70:
  uVar12 = RemSP::MemMerge(uVar12,uVar11);
  goto LAB_0015e2f2;
LAB_00160731:
  *piVar20 = *piVar20 + 1;
  *(uint *)(local_330._24_8_ + uVar41 * 4 + *local_2e0 * lVar35) = uVar12;
  lVar37 = (long)(int)plVar42;
  uVar41 = lVar37 + 2;
  if ((int)plVar43 <= (int)uVar41) {
    if ((int)plVar43 < (int)uVar41) goto LAB_001626a4;
    piVar20 = (int *)((long)local_1e8 + lVar37 * 4 + *local_1b0 * lVar35 + 8);
    *piVar20 = *piVar20 + 1;
    if (*(char *)(local_260._24_8_ + lVar37 + 2 + *local_210 * lVar35) == '\0') goto LAB_00162f98;
    piVar20 = (int *)((long)local_1e8 + lVar37 * 4 + *local_1b0 * (long)(iVar2 + -2) + 0xc);
    *piVar20 = *piVar20 + 1;
    if (*(char *)(local_260._24_8_ + lVar37 + 3 + (long)(iVar2 + -2) * *local_210) == '\0') {
      piVar20 = (int *)((long)local_2b8 + lVar37 * 4 + *local_280 * lVar35);
      *piVar20 = *piVar20 + 1;
      uVar18 = *(undefined4 *)(local_330._24_8_ + lVar37 * 4 + *local_2e0 * lVar35);
      piVar20 = (int *)((long)local_2b8 + lVar37 * 4 + *local_280 * lVar35 + 8);
      *piVar20 = *piVar20 + 1;
      *(undefined4 *)(local_330._24_8_ + lVar37 * 4 + lVar35 * *local_2e0 + 8) = uVar18;
    }
    else {
      piVar20 = (int *)((long)local_2b8 + lVar37 * 4 + *local_280 * (long)(iVar2 + -3) + 8);
      *piVar20 = *piVar20 + 1;
      uVar12 = *(uint *)(local_330._24_8_ + lVar37 * 4 + (long)(iVar2 + -3) * *local_2e0 + 8);
      piVar20 = (int *)((long)local_2b8 + lVar37 * 4 + *local_280 * lVar35);
      *piVar20 = *piVar20 + 1;
      uVar12 = RemSP::MemMerge(uVar12,*(uint *)(local_330._24_8_ + lVar37 * 4 + *local_2e0 * lVar35)
                              );
      piVar20 = (int *)((long)local_2b8 + lVar37 * 4 + *local_280 * lVar35 + 8);
      *piVar20 = *piVar20 + 1;
      *(uint *)(local_330._24_8_ + lVar37 * 4 + lVar35 * *local_2e0 + 8) = uVar12;
    }
    goto LAB_00163954;
  }
  piVar20 = (int *)((long)local_1e8 + lVar37 * 4 + *local_1b0 * lVar35 + 8);
  *piVar20 = *piVar20 + 1;
  if (*(char *)(local_260._24_8_ + lVar37 + 2 + *local_210 * lVar35) != '\0') {
    piVar20 = (int *)((long)local_1e8 + lVar37 * 4 + *local_1b0 * lVar27 + 0xc);
    *piVar20 = *piVar20 + 1;
    if (*(char *)(local_260._24_8_ + lVar37 + 3 + *local_210 * lVar27) != '\0') {
      piVar20 = (int *)((long)local_2b8 + lVar37 * 4 + *local_280 * (long)local_198 + 8);
      *piVar20 = *piVar20 + 1;
      uVar12 = *(uint *)(local_330._24_8_ + lVar37 * 4 + *local_2e0 * (long)local_198 + 8);
      piVar20 = (int *)((long)local_2b8 + lVar37 * 4 + *local_280 * lVar35);
      *piVar20 = *piVar20 + 1;
      uVar12 = RemSP::MemMerge(uVar12,*(uint *)(local_330._24_8_ + lVar37 * 4 + *local_2e0 * lVar35)
                              );
      plVar42 = (long *)(uVar41 & 0xffffffff);
      goto LAB_00161ab8;
    }
    piVar20 = (int *)((long)local_1e8 + lVar37 * 4 + *local_1b0 * lVar35 + 0xc);
    *piVar20 = *piVar20 + 1;
    if (*(char *)(local_260._24_8_ + lVar37 + 3 + *local_210 * lVar35) == '\0') {
      piVar20 = (int *)((long)local_2b8 + lVar37 * 4 + *local_280 * lVar35);
      *piVar20 = *piVar20 + 1;
      uVar12 = *(uint *)(local_330._24_8_ + lVar37 * 4 + *local_2e0 * lVar35);
      piVar20 = (int *)((long)local_2b8 + uVar41 * 4 + *local_280 * lVar35);
      plVar42 = (long *)(uVar41 & 0xffffffff);
      goto LAB_00162502;
    }
    piVar20 = (int *)((long)local_1e8 + lVar37 * 4 + *local_1b0 * lVar27 + 0x10);
    *piVar20 = *piVar20 + 1;
    if (*(char *)(local_260._24_8_ + lVar37 + 4 + *local_210 * lVar27) == '\0') {
      piVar20 = (int *)((long)local_2b8 + lVar37 * 4 + *local_280 * lVar35);
      *piVar20 = *piVar20 + 1;
      puVar13 = (undefined4 *)(local_330._24_8_ + lVar37 * 4 + *local_2e0 * lVar35);
      piVar20 = (int *)((long)local_2b8 + uVar41 * 4 + *local_280 * lVar35);
      local_160 = (long *)(uVar41 & 0xffffffff);
      goto LAB_001611e8;
    }
    piVar20 = (int *)((long)local_2b8 + lVar37 * 4 + *local_280 * (long)local_198 + 0x10);
    *piVar20 = *piVar20 + 1;
    uVar12 = *(uint *)(local_330._24_8_ + lVar37 * 4 + *local_2e0 * (long)local_198 + 0x10);
    piVar20 = (int *)((long)local_2b8 + lVar37 * 4 + *local_280 * lVar35);
    *piVar20 = *piVar20 + 1;
    uVar12 = RemSP::MemMerge(uVar12,*(uint *)(local_330._24_8_ + lVar37 * 4 + *local_2e0 * lVar35));
    piVar20 = (int *)((long)local_2b8 + uVar41 * 4 + *local_280 * lVar35);
    plVar42 = (long *)(uVar41 & 0xffffffff);
    goto LAB_00160bfd;
  }
  plVar42 = (long *)(uVar41 & 0xffffffff);
LAB_00160a2b:
  iVar17 = (int)plVar42;
  uVar41 = (ulong)iVar17;
  piVar20 = (int *)((long)local_1e8 + uVar41 * 4 + *local_1b0 * lVar35 + 4);
  *piVar20 = *piVar20 + 1;
  if (*(char *)(local_260._24_8_ + uVar41 + 1 + *local_210 * lVar35) == '\0') goto LAB_0016022d;
  piVar20 = (int *)((long)local_1e8 + uVar41 * 4 + *local_1b0 * lVar27 + 4);
  *piVar20 = *piVar20 + 1;
  if (*(char *)(local_260._24_8_ + uVar41 + 1 + *local_210 * lVar27) != '\0') {
    lVar37 = *local_280;
    piVar25 = local_198;
    while( true ) {
      piVar20 = (int *)((long)local_2b8 + uVar41 * 4 + lVar37 * (long)piVar25);
LAB_00160acf:
      *piVar20 = *piVar20 + 1;
      uVar18 = *(undefined4 *)(local_330._24_8_ + uVar41 * 4 + (long)piVar25 * *local_2e0);
      piVar20 = (int *)((long)local_2b8 + uVar41 * 4 + *local_280 * lVar35);
      *piVar20 = *piVar20 + 1;
      *(undefined4 *)(local_330._24_8_ + uVar41 * 4 + *local_2e0 * lVar35) = uVar18;
      lVar37 = (long)(int)plVar42;
      uVar12 = (int)plVar42 + 2;
      plVar42 = (long *)(ulong)uVar12;
      if ((int)plVar43 <= (int)uVar12) break;
      piVar20 = (int *)((long)local_1e8 + lVar37 * 4 + *local_1b0 * lVar35 + 8);
      *piVar20 = *piVar20 + 1;
      if (*(char *)(local_260._24_8_ + lVar37 + 2 + *local_210 * lVar35) != '\0') goto LAB_00161d03;
LAB_0015fb59:
      while( true ) {
        uVar41 = (ulong)(int)plVar42;
        piVar20 = (int *)((long)local_1e8 + uVar41 * 4 + *local_1b0 * lVar35 + 4);
        *piVar20 = *piVar20 + 1;
        if (*(char *)(local_260._24_8_ + uVar41 + 1 + *local_210 * lVar35) != '\0') break;
LAB_0016022d:
        iVar17 = (int)plVar42;
        uVar41 = (ulong)iVar17;
        piVar20 = (int *)((long)local_2b8 + uVar41 * 4 + *local_280 * lVar35);
LAB_0016024b:
        *piVar20 = *piVar20 + 1;
        *(undefined4 *)(local_330._24_8_ + uVar41 * 4 + *local_2e0 * lVar35) = 0;
        lVar37 = (long)iVar17;
        uVar41 = lVar37 + 2;
        if ((int)plVar43 <= (int)uVar41) {
          piVar20 = (int *)((long)local_1e8 + lVar37 * 4 + *local_1b0 * lVar35 + 8);
          *piVar20 = *piVar20 + 1;
          cVar15 = *(char *)(local_260._24_8_ + lVar37 + 2 + *local_210 * lVar35);
          if ((int)plVar43 < (int)uVar41) {
            if (cVar15 == '\0') {
              piVar20 = (int *)((long)local_2b8 + lVar37 * 4 + *local_280 * lVar35 + 8);
              *piVar20 = *piVar20 + 1;
              *(undefined4 *)(local_330._24_8_ + lVar37 * 4 + lVar35 * *local_2e0 + 8) = 0;
              goto LAB_00163954;
            }
LAB_00163711:
            lVar27 = (long)(iVar2 + -2);
            piVar20 = (int *)((long)local_1e8 + lVar37 * 4 + *local_1b0 * lVar27 + 8);
            *piVar20 = *piVar20 + 1;
            if (*(char *)(local_260._24_8_ + lVar37 + 2 + *local_210 * lVar27) != '\0')
            goto LAB_00163754;
            piVar20 = (int *)((long)local_1e8 + lVar37 * 4 + *local_1b0 * lVar27 + 4);
            *piVar20 = *piVar20 + 1;
            uVar12 = RemSP::length_;
            if (*(char *)(local_260._24_8_ + lVar37 + 1 + lVar27 * *local_210) == '\0') {
              lVar27 = (long)(int)RemSP::length_;
              RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar27] =
                   RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar27] + 1;
              RemSP::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar27] = uVar12;
              uVar12 = RemSP::length_;
              RemSP::length_ = RemSP::length_ + 1;
              piVar20 = (int *)((long)local_2b8 + lVar37 * 4 + *local_280 * lVar35 + 8);
              *piVar20 = *piVar20 + 1;
              *(uint *)(local_330._24_8_ + lVar37 * 4 + lVar35 * *local_2e0 + 8) = uVar12;
              goto LAB_00163954;
            }
            piVar20 = (int *)((long)local_2b8 + lVar37 * 4 + *local_280 * (long)(iVar2 + -3));
            *piVar20 = *piVar20 + 1;
            lVar27 = *local_280;
            uVar18 = *(undefined4 *)
                      (local_330._24_8_ + lVar37 * 4 + (long)(iVar2 + -3) * *local_2e0);
          }
          else {
            if (cVar15 == '\0') goto LAB_001634e8;
            piVar20 = (int *)((long)local_1e8 + lVar37 * 4 + *local_1b0 * lVar27 + 0xc);
            *piVar20 = *piVar20 + 1;
            if (*(char *)(local_260._24_8_ + lVar37 + 3 + *local_210 * lVar27) == '\0')
            goto LAB_00163711;
            piVar20 = (int *)((long)local_1e8 + lVar37 * 4 + *local_1b0 * lVar27 + 8);
            *piVar20 = *piVar20 + 1;
            if (*(char *)(local_260._24_8_ + lVar37 + 2 + *local_210 * lVar27) == '\0') {
              piVar20 = (int *)((long)local_1e8 + lVar37 * 4 + *local_1b0 * lVar27 + 4);
              *piVar20 = *piVar20 + 1;
              if (*(char *)(local_260._24_8_ + lVar37 + 1 + lVar27 * *local_210) != '\0')
              goto LAB_0016343f;
              piVar20 = (int *)((long)local_2b8 + lVar37 * 4 + *local_280 * lVar30 + 8);
              *piVar20 = *piVar20 + 1;
              uVar18 = *(undefined4 *)(local_330._24_8_ + lVar37 * 4 + lVar30 * *local_2e0 + 8);
              piVar20 = (int *)((long)local_2b8 + lVar37 * 4 + *local_280 * lVar35 + 8);
              *piVar20 = *piVar20 + 1;
              *(undefined4 *)(local_330._24_8_ + lVar37 * 4 + lVar35 * *local_2e0 + 8) = uVar18;
              goto LAB_00163954;
            }
LAB_00163754:
            piVar20 = (int *)((long)local_2b8 + lVar37 * 4 + *local_280 * (long)(iVar2 + -3) + 8);
            *piVar20 = *piVar20 + 1;
            lVar27 = *local_280;
            uVar18 = *(undefined4 *)
                      (local_330._24_8_ + lVar37 * 4 + (long)(iVar2 + -3) * *local_2e0 + 8);
          }
          piVar20 = (int *)((long)local_2b8 + lVar37 * 4 + lVar27 * lVar35 + 8);
          *piVar20 = *piVar20 + 1;
          *(undefined4 *)(local_330._24_8_ + lVar37 * 4 + lVar35 * *local_2e0 + 8) = uVar18;
          goto LAB_00163954;
        }
        piVar20 = (int *)((long)local_1e8 + lVar37 * 4 + *local_1b0 * lVar35 + 8);
        *piVar20 = *piVar20 + 1;
        if (*(char *)(local_260._24_8_ + lVar37 + 2 + *local_210 * lVar35) != '\0') {
          piVar20 = (int *)((long)local_1e8 + lVar37 * 4 + *local_1b0 * lVar27 + 0xc);
          *piVar20 = *piVar20 + 1;
          if (*(char *)(local_260._24_8_ + lVar37 + 3 + *local_210 * lVar27) != '\0') {
            piVar20 = (int *)((long)local_1e8 + lVar37 * 4 + *local_1b0 * lVar27 + 8);
            *piVar20 = *piVar20 + 1;
            if ((*(char *)(local_260._24_8_ + lVar37 + 2 + *local_210 * lVar27) == '\0') &&
               (piVar20 = (int *)((long)local_1e8 + lVar37 * 4 + *local_1b0 * lVar27 + 4),
               *piVar20 = *piVar20 + 1,
               *(char *)(local_260._24_8_ + lVar37 + 1 + *local_210 * lVar27) != '\0')) {
              plVar42 = (long *)(uVar41 & 0xffffffff);
              goto LAB_001620e9;
            }
            piVar20 = (int *)((long)local_2b8 + lVar37 * 4 + *local_280 * (long)local_198 + 8);
            *piVar20 = *piVar20 + 1;
            uVar12 = *(uint *)(local_330._24_8_ + lVar37 * 4 + *local_2e0 * (long)local_198 + 8);
            plVar42 = (long *)(uVar41 & 0xffffffff);
            goto LAB_00161ab8;
          }
          piVar20 = (int *)((long)local_1e8 + lVar37 * 4 + *local_1b0 * lVar35 + 0xc);
          *piVar20 = *piVar20 + 1;
          if (*(char *)(local_260._24_8_ + lVar37 + 3 + *local_210 * lVar35) == '\0') {
            piVar20 = (int *)((long)local_1e8 + lVar37 * 4 + *local_1b0 * lVar27 + 8);
            *piVar20 = *piVar20 + 1;
            if (*(char *)(local_260._24_8_ + lVar37 + 2 + *local_210 * lVar27) == '\0') {
              piVar20 = (int *)((long)local_1e8 + lVar37 * 4 + *local_1b0 * lVar27 + 4);
              *piVar20 = *piVar20 + 1;
              uVar12 = RemSP::length_;
              if (*(char *)(local_260._24_8_ + lVar37 + 1 + *local_210 * lVar27) != '\0') {
                piVar20 = (int *)((long)local_2b8 + lVar37 * 4 + *local_280 * lVar30);
                *piVar20 = *piVar20 + 1;
                uVar12 = *(uint *)(local_330._24_8_ + lVar37 * 4 + *local_2e0 * lVar30);
                goto LAB_001605ba;
              }
              lVar37 = (long)(int)RemSP::length_;
              RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar37] =
                   RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar37] + 1;
              RemSP::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar37] = uVar12;
              lVar37 = *local_280;
              uVar12 = RemSP::length_;
              RemSP::length_ = RemSP::length_ + 1;
            }
            else {
              piVar20 = (int *)((long)local_2b8 + lVar37 * 4 + *local_280 * lVar30 + 8);
              *piVar20 = *piVar20 + 1;
              uVar12 = *(uint *)(local_330._24_8_ + lVar37 * 4 + *local_2e0 * lVar30 + 8);
LAB_001605ba:
              lVar37 = *local_280;
            }
            piVar20 = (int *)((long)local_2b8 + uVar41 * 4 + lVar37 * lVar35);
            plVar42 = (long *)(uVar41 & 0xffffffff);
            goto LAB_00162502;
          }
          piVar20 = (int *)((long)local_1e8 + lVar37 * 4 + *local_1b0 * lVar27 + 0x10);
          *piVar20 = *piVar20 + 1;
          cVar15 = *(char *)(local_260._24_8_ + lVar37 + 4 + *local_210 * lVar27);
          piVar20 = (int *)((long)local_1e8 + lVar37 * 4 + *local_1b0 * lVar27 + 8);
          *piVar20 = *piVar20 + 1;
          cVar1 = *(char *)(local_260._24_8_ + lVar37 + 2 + *local_210 * lVar27);
          if (cVar15 != '\0') {
            if (cVar1 != '\0') {
              plVar42 = (long *)(uVar41 & 0xffffffff);
              goto LAB_0015fc73;
            }
            piVar20 = (int *)((long)local_1e8 + lVar37 * 4 + *local_1b0 * lVar27 + 4);
            *piVar20 = *piVar20 + 1;
            if (*(char *)(local_260._24_8_ + lVar37 + 1 + *local_210 * lVar27) != '\0') {
              plVar42 = (long *)(uVar41 & 0xffffffff);
              goto LAB_00162024;
            }
            piVar20 = (int *)((long)local_2b8 + lVar37 * 4 + *local_280 * (long)local_198 + 0x10);
            *piVar20 = *piVar20 + 1;
            uVar12 = *(uint *)(local_330._24_8_ + lVar37 * 4 + *local_2e0 * (long)local_198 + 0x10);
            piVar20 = (int *)((long)local_2b8 + uVar41 * 4 + *local_280 * lVar35);
            plVar42 = (long *)(uVar41 & 0xffffffff);
            goto LAB_00160bfd;
          }
          if (cVar1 != '\0') {
            plVar42 = (long *)(uVar41 & 0xffffffff);
            goto LAB_0015fce9;
          }
          piVar20 = (int *)((long)local_1e8 + lVar37 * 4 + *local_1b0 * lVar27 + 4);
          *piVar20 = *piVar20 + 1;
          uVar12 = RemSP::length_;
          if (*(char *)(local_260._24_8_ + lVar37 + 1 + *local_210 * lVar27) == '\0') {
            lVar37 = (long)(int)RemSP::length_;
            RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[lVar37] =
                 RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar37] + 1;
            RemSP::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start[lVar37] = uVar12;
            lVar34 = *local_280;
            uVar12 = RemSP::length_;
            RemSP::length_ = RemSP::length_ + 1;
          }
          else {
            piVar20 = (int *)((long)local_2b8 + lVar37 * 4 + *local_280 * (long)local_198);
            *piVar20 = *piVar20 + 1;
            lVar34 = *local_280;
            uVar12 = *(uint *)(local_330._24_8_ + lVar37 * 4 + *local_2e0 * (long)local_198);
          }
          piVar20 = (int *)((long)local_2b8 + uVar41 * 4 + lVar34 * lVar35);
          plVar42 = (long *)(uVar41 & 0xffffffff);
          goto LAB_00160731;
        }
        plVar42 = (long *)(uVar41 & 0xffffffff);
      }
      piVar20 = (int *)((long)local_1e8 + uVar41 * 4 + *local_1b0 * lVar27 + 4);
      *piVar20 = *piVar20 + 1;
      if (*(char *)(local_260._24_8_ + uVar41 + 1 + *local_210 * lVar27) == '\0') goto LAB_0015fbee;
      lVar37 = *local_280;
      piVar25 = local_190;
    }
    if ((int)plVar43 < (int)uVar12) {
      uVar41 = (ulong)uVar12;
      goto LAB_001626a4;
    }
    piVar20 = (int *)((long)local_1e8 + lVar37 * 4 + *local_1b0 * lVar35 + 8);
    *piVar20 = *piVar20 + 1;
    if (*(char *)(local_260._24_8_ + lVar37 + 2 + *local_210 * lVar35) == '\0') goto LAB_001634eb;
    goto LAB_00162a5a;
  }
  uVar41 = (ulong)iVar17;
  piVar20 = (int *)((long)local_1e8 + uVar41 * 4 + *local_1b0 * lVar27 + 8);
  *piVar20 = *piVar20 + 1;
  uVar12 = RemSP::length_;
  if (*(char *)(local_260._24_8_ + uVar41 + 2 + *local_210 * lVar27) != '\0') goto LAB_00160bad;
  lVar37 = (long)(int)RemSP::length_;
  RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[lVar37] =
       RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start[lVar37] + 1;
  RemSP::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start[lVar37] = uVar12;
  piVar25 = (pointer)(*local_280 * lVar35 + (long)local_2b8);
  uVar41 = (ulong)iVar17;
  uVar12 = RemSP::length_;
LAB_0016113d:
  RemSP::length_ = uVar12 + 1;
  piVar20 = piVar25 + uVar41;
  goto LAB_00160731;
LAB_0015fc73:
  uVar41 = (ulong)(int)plVar42;
  piVar20 = (int *)((long)local_1e8 + uVar41 * 4 + *local_1b0 * (long)local_150 + 4);
  *piVar20 = *piVar20 + 1;
  if (*(char *)(local_260._24_8_ + uVar41 + 1 + *local_210 * (long)local_150) == '\0') {
    uVar41 = (ulong)(int)plVar42;
    piVar20 = (int *)((long)local_2b8 + uVar41 * 4 + *local_280 * (long)local_150);
    *piVar20 = *piVar20 + 1;
    uVar11 = *(uint *)(local_330._24_8_ + uVar41 * 4 + *local_2e0 * (long)local_150);
    piVar20 = (int *)((long)local_2b8 + uVar41 * 4 + *local_280 * (long)local_150 + 8);
    *piVar20 = *piVar20 + 1;
    lVar37 = *local_2e0 * (long)local_150;
LAB_0015fff4:
    uVar12 = *(uint *)(local_330._24_8_ + uVar41 * 4 + lVar37 + 8);
LAB_0015fffe:
    uVar12 = RemSP::MemMerge(uVar11,uVar12);
  }
  else {
    piVar20 = (int *)((long)local_2b8 + uVar41 * 4 + *local_280 * (long)local_150 + 8);
    *piVar20 = *piVar20 + 1;
    piVar25 = local_150;
LAB_0015fe78:
    lVar37 = *local_2e0 * (long)piVar25;
LAB_00160be0:
    uVar12 = *(uint *)(local_330._24_8_ + uVar41 * 4 + lVar37 + 8);
  }
  lVar37 = *local_280;
  goto LAB_00160bed;
LAB_00162024:
  uVar41 = (ulong)(int)plVar42;
  piVar20 = (int *)((long)local_1e8 + uVar41 * 4 + *local_1b0 * lVar30 + 4);
  *piVar20 = *piVar20 + 1;
  if (*(char *)(local_260._24_8_ + uVar41 + 1 + *local_210 * lVar30) == '\0') {
    lVar37 = *local_280;
  }
  else {
    piVar20 = (int *)((long)local_1e8 + uVar41 * 4 + *local_1b0 * lVar30);
    *piVar20 = *piVar20 + 1;
    if (*(char *)(local_260._24_8_ + uVar41 + *local_210 * lVar30) != '\0') {
LAB_00160bad:
      piVar20 = (int *)((long)local_2b8 + uVar41 * 4 + *local_280 * lVar30 + 8);
      *piVar20 = *piVar20 + 1;
      lVar37 = *local_2e0 * lVar30;
      goto LAB_00160be0;
    }
    lVar37 = *local_280;
  }
  uVar41 = (ulong)(int)plVar42;
  piVar20 = (int *)((long)local_2b8 + uVar41 * 4 + lVar37 * lVar30 + -8);
  *piVar20 = *piVar20 + 1;
  uVar11 = *(uint *)(local_330._24_8_ + uVar41 * 4 + *local_2e0 * lVar30 + -8);
  piVar20 = (int *)((long)local_2b8 + uVar41 * 4 + *local_280 * lVar30 + 8);
  *piVar20 = *piVar20 + 1;
  lVar37 = *local_2e0 * lVar30;
  goto LAB_0015fff4;
code_r0x00161c2e:
  piVar20 = (int *)((long)local_2b8 + lVar32 * 4 + *local_280 * lVar30 + lVar40);
  *piVar20 = *piVar20 + 1;
  uVar18 = *(undefined4 *)(local_330._24_8_ + lVar32 * 4 + *local_2e0 * lVar30 + lVar34);
  piVar20 = (int *)((long)local_2b8 + lVar32 * 4 + *local_280 * lVar35 + lVar40);
  *piVar20 = *piVar20 + 1;
  *(undefined4 *)(local_330._24_8_ + lVar32 * 4 + *local_2e0 * lVar35 + lVar34) = uVar18;
  lVar28 = lVar28 + 0x200000000;
  lVar23 = lVar32 + 4;
  lVar32 = lVar32 + 2;
  lVar24 = lVar24 + 8;
  if (lVar14 <= (long)local_188 + lVar23) {
    uVar12 = iVar10 + (int)lVar32 + 2;
    plVar42 = (long *)(ulong)(uint)(iVar10 + (int)lVar32);
    iVar17 = (int)local_268;
    goto LAB_00162760;
  }
  goto LAB_00161ba2;
LAB_001567eb:
  iVar10 = 0;
LAB_0015683c:
  local_2b8[lVar27] = local_2b8[lVar27] + 1;
  *(int *)(local_330._24_8_ + lVar27 * 4) = iVar10;
  iVar10 = iVar16;
LAB_0015684f:
  iVar16 = iVar10 + 2;
  if (iVar17 <= iVar16) goto code_r0x0015685b;
  goto LAB_001566c7;
code_r0x0015685b:
  lVar27 = (long)(iVar10 + 3);
LAB_00156dc5:
  lVar30 = (long)iVar16;
  piVar20 = (int *)((long)local_1e8 + lVar30 * 4);
  *piVar20 = *piVar20 + 1;
  cVar15 = *(char *)(local_260._24_8_ + lVar30);
  if (iVar17 < iVar16) {
joined_r0x00156fdb:
    if (cVar15 == '\0') {
      local_2b8[lVar30] = local_2b8[lVar30] + 1;
      *(int *)(local_330._24_8_ + lVar30 * 4) = 0;
      goto LAB_00163954;
    }
  }
  else {
    if (cVar15 == '\0') {
LAB_00156fbf:
      lVar30 = (long)iVar16;
      piVar20 = (int *)((long)local_1e8 + lVar30 * 4 + 4);
      *piVar20 = *piVar20 + 1;
      cVar15 = *(char *)(local_260._24_8_ + lVar30 + 1);
      goto joined_r0x00156fdb;
    }
    piVar20 = (int *)((long)local_1e8 + lVar27 * 4);
    *piVar20 = *piVar20 + 1;
  }
  uVar12 = RemSP::length_;
  lVar27 = (long)(int)RemSP::length_;
  RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[lVar27] =
       RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start[lVar27] + 1;
  RemSP::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start[lVar27] = uVar12;
  uVar12 = RemSP::length_;
  RemSP::length_ = RemSP::length_ + 1;
  local_2b8[lVar30] = local_2b8[lVar30] + 1;
  *(uint *)(local_330._24_8_ + lVar30 * 4) = uVar12;
LAB_00163954:
  uVar12 = RemSP::MemFlatten();
  (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar12;
  if (0 < iVar2) {
    local_188 = local_2b8;
    local_158 = local_280;
    local_180 = (pointer)local_330._24_8_;
    local_160 = local_2e0;
    local_178 = (pointer)0x1;
    uVar41 = 0;
    do {
      piVar25 = RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      puVar6 = RemSP::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (0 < iVar3) {
        uVar21 = uVar41 | 1;
        local_268 = local_1b0;
        lVar30 = *local_280 * (long)local_178;
        lVar14 = *local_2e0 * (long)local_178;
        lVar37 = *local_2e0 * uVar41;
        lVar35 = *local_280 * uVar41;
        lVar27 = 1;
        do {
          iVar2 = *(int *)((long)local_2b8 + lVar27 * 4 + lVar35 + -4);
          *(int *)((long)local_2b8 + lVar27 * 4 + lVar35 + -4) = iVar2 + 1;
          lVar34 = (long)*(int *)(local_330._24_8_ + lVar27 * 4 + lVar37 + -4);
          if (lVar34 < 1) {
            *(int *)((long)local_2b8 + lVar27 * 4 + lVar35 + -4) = iVar2 + 2;
            *(undefined4 *)(local_330._24_8_ + lVar27 * 4 + lVar37 + -4) = 0;
            if (lVar27 < lVar22) {
              piVar20 = (int *)((long)local_2b8 + lVar27 * 4 + lVar35);
              *piVar20 = *piVar20 + 1;
              *(undefined4 *)(local_330._24_8_ + lVar27 * 4 + lVar37) = 0;
              if (uVar21 < uVar26) {
                piVar20 = (int *)((long)local_2b8 + lVar27 * 4 + lVar30 + -4);
                *piVar20 = *piVar20 + 1;
                *(undefined4 *)(local_330._24_8_ + lVar27 * 4 + lVar14 + -4) = 0;
                piVar20 = (int *)((long)local_2b8 + lVar27 * 4 + lVar30);
                *piVar20 = *piVar20 + 1;
                *(undefined4 *)(local_330._24_8_ + lVar27 * 4 + lVar14) = 0;
              }
            }
            else if (uVar21 < uVar26) {
LAB_00163bf0:
              piVar20 = (int *)((long)local_2b8 + lVar27 * 4 + lVar30 + -4);
              *piVar20 = *piVar20 + 1;
              *(undefined4 *)(local_330._24_8_ + lVar27 * 4 + lVar14 + -4) = 0;
            }
          }
          else {
            piVar25[lVar34] = piVar25[lVar34] + 1;
            uVar12 = puVar6[lVar34];
            lVar34 = *local_1b0;
            piVar20 = (int *)((long)local_1e8 + lVar27 * 4 + uVar41 * lVar34 + -4);
            *piVar20 = *piVar20 + 1;
            lVar40 = *local_210;
            uVar11 = uVar12;
            if (*(char *)(local_260._24_8_ + lVar27 + -1 + uVar41 * lVar40) == '\0') {
              uVar11 = 0;
            }
            piVar20 = (int *)((long)local_2b8 + lVar27 * 4 + lVar35 + -4);
            *piVar20 = *piVar20 + 1;
            *(uint *)(local_330._24_8_ + lVar27 * 4 + lVar37 + -4) = uVar11;
            if (lVar27 < lVar22) {
              piVar20 = (int *)((long)local_1e8 + lVar27 * 4 + uVar41 * lVar34);
              *piVar20 = *piVar20 + 1;
              uVar11 = uVar12;
              if (*(char *)(local_260._24_8_ + lVar27 + uVar41 * lVar40) == '\0') {
                uVar11 = 0;
              }
              piVar20 = (int *)((long)local_2b8 + lVar27 * 4 + lVar35);
              *piVar20 = *piVar20 + 1;
              *(uint *)(local_330._24_8_ + lVar27 * 4 + lVar37) = uVar11;
              if (uVar21 < uVar26) {
                piVar20 = (int *)((long)local_1e8 + lVar27 * 4 + lVar34 * (long)local_178 + -4);
                *piVar20 = *piVar20 + 1;
                uVar11 = uVar12;
                if (*(char *)(local_260._24_8_ + lVar27 + -1 + lVar40 * (long)local_178) == '\0') {
                  uVar11 = 0;
                }
                piVar20 = (int *)((long)local_2b8 + lVar27 * 4 + lVar30 + -4);
                *piVar20 = *piVar20 + 1;
                *(uint *)(local_330._24_8_ + lVar27 * 4 + lVar14 + -4) = uVar11;
                piVar20 = (int *)((long)local_1e8 + lVar27 * 4 + lVar34 * (long)local_178);
                *piVar20 = *piVar20 + 1;
                if (*(char *)(local_260._24_8_ + lVar27 + lVar40 * (long)local_178) == '\0') {
                  piVar20 = (int *)((long)local_2b8 + lVar27 * 4 + lVar30);
                  *piVar20 = *piVar20 + 1;
                  *(undefined4 *)(local_330._24_8_ + lVar27 * 4 + lVar14) = 0;
                }
                else {
                  piVar20 = (int *)((long)local_2b8 + lVar27 * 4 + lVar30);
                  *piVar20 = *piVar20 + 1;
                  *(uint *)(local_330._24_8_ + lVar27 * 4 + lVar14) = uVar12;
                }
              }
            }
            else if (uVar21 < uVar26) {
              piVar20 = (int *)((long)local_1e8 + lVar27 * 4 + lVar34 * (long)local_178 + -4);
              *piVar20 = *piVar20 + 1;
              if (*(char *)(local_260._24_8_ + lVar27 + -1 + lVar40 * (long)local_178) == '\0')
              goto LAB_00163bf0;
              piVar20 = (int *)((long)local_2b8 + lVar27 * 4 + lVar30 + -4);
              *piVar20 = *piVar20 + 1;
              *(uint *)(local_330._24_8_ + lVar27 * 4 + lVar14 + -4) = uVar12;
            }
          }
          lVar34 = lVar27 + 1;
          lVar27 = lVar27 + 2;
        } while (lVar34 < lVar22);
      }
      uVar41 = uVar41 + 2;
      local_178 = (pointer)((long)local_178 + 2);
    } while (uVar41 < uVar26);
  }
  local_108 = (undefined1  [8])0x0;
  pvStack_100 = (void *)0x0;
  local_f8.width = 0;
  local_f8.height = 0;
  local_108 = (undefined1  [8])operator_new(0x20);
  pvVar9 = local_118;
  pvStack_100 = (void *)((long)local_108 + 0x20);
  *(undefined8 *)((long)local_108 + 0x10) = 0;
  *(undefined8 *)((long)local_108 + 0x18) = 0;
  *(undefined8 *)local_108 = 0;
  *(undefined8 *)((long)local_108 + 8) = 0;
  local_f8 = (Size)pvStack_100;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign(local_118,local_108);
  pSVar8 = local_170;
  if (local_108 != (undefined1  [8])0x0) {
    operator_delete((void *)local_108,(long)local_f8 - (long)local_108);
  }
  local_98 = 0;
  local_a8 = 0x81010004;
  local_a0 = local_1f8;
  cv::sum((_InputArray *)local_108);
  *(pvVar9->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
   super__Vector_impl_data._M_start =
       (long)((double)local_108 - 9.223372036854776e+18) & (long)(double)local_108 >> 0x3f |
       (long)(double)local_108;
  local_98 = 0;
  local_a8 = 0x81010004;
  local_a0 = local_2c8;
  cv::sum((_InputArray *)local_108);
  puVar5 = (pvVar9->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar5[1] = (long)((double)local_108 - 9.223372036854776e+18) & (long)(double)local_108 >> 0x3f |
              (long)(double)local_108;
  if ((long)RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start == 0) {
    uVar41 = 0;
  }
  else {
    lVar22 = (long)RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2;
    dVar44 = 0.0;
    lVar27 = 0;
    do {
      dVar44 = dVar44 + (double)RemSP::mem_P_.accesses_.
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start[lVar27];
      lVar27 = lVar27 + 1;
    } while (lVar22 + (ulong)(lVar22 == 0) != lVar27);
    uVar41 = (long)(dVar44 - 9.223372036854776e+18) & (long)dVar44 >> 0x3f | (long)dVar44;
  }
  puVar5[2] = uVar41;
  MemMat<int>::GetImage((Mat_<int> *)local_108,(MemMat<int> *)local_330);
  cv::Mat::operator=(&((pSVar8->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                     (Mat *)local_108);
  cv::Mat::~Mat((Mat *)local_108);
  cv::Mat::~Mat(local_2c8);
  cv::Mat::~Mat((Mat *)(local_330 + 8));
  cv::Mat::~Mat(local_1f8);
  cv::Mat::~Mat((Mat *)(local_260 + 8));
  return;
}

Assistant:

void PerformLabelingMem(std::vector<uint64_t>& accesses)
	{
		const int h = img_.rows;
		const int w = img_.cols;

		LabelsSolver::MemAlloc(UPPER_BOUND_8_CONNECTIVITY);
		LabelsSolver::MemSetup();

		//Data structure for memory test
		MemMat<unsigned char> img(img_);
		MemMat<int> img_labels(img_.size(), 0);

		// We work with 2x2 blocks
		// +-+-+-+
		// |P|Q|R|
		// +-+-+-+
		// |S|X|
		// +-+-+

		// The pixels are named as follows
		// +---+---+---+
		// |a b|c d|e f|
		// |g h|i j|k l|
		// +---+---+---+
		// |m n|o p|
		// |q r|s t|
		// +---+---+

		// Pixels a, f, l, q are not needed, since we need to understand the
		// the connectivity between these blocks and those pixels only metter
		// when considering the outer connectivities

		// A bunch of defines used to check if the pixels are foreground,
		// without going outside the image limits.

#define CONDITION_B img(r-2, c-1)>0
#define CONDITION_C img(r-2, c)>0
#define CONDITION_D img(r-2, c+1)>0
#define CONDITION_E img(r-2, c+2)>0

#define CONDITION_G img(r-1, c-2)>0
#define CONDITION_H img(r-1, c-1)>0
#define CONDITION_I img(r-1, c)>0
#define CONDITION_J img(r-1, c+1)>0
#define CONDITION_K img(r-1, c+2)>0

#define CONDITION_M img(r, c-2)>0
#define CONDITION_N img(r, c-1)>0
#define CONDITION_O img(r,c)>0
#define CONDITION_P img(r,c+1)>0

#define CONDITION_R img(r+1, c-1)>0
#define CONDITION_S img(r+1, c)>0
#define CONDITION_T img(r+1, c+1)>0

				// Action 1: No action
#define ACTION_1 img_labels(r, c) = 0; 
				// Action 2: New label (the block has foreground pixels and is not connected to anything else)
#define ACTION_2 img_labels(r, c) = LabelsSolver::MemNewLabel(); 
				//Action 3: Assign label of block P
#define ACTION_3 img_labels(r, c) = img_labels(r - 2, c - 2);
				// Action 4: Assign label of block Q 
#define ACTION_4 img_labels(r, c) = img_labels(r - 2, c);
				// Action 5: Assign label of block R
#define ACTION_5 img_labels(r, c) = img_labels(r - 2, c + 2);
				// Action 6: Assign label of block S
#define ACTION_6 img_labels(r, c) = img_labels(r, c - 2); 
				// Action 7: Merge labels of block P and Q
#define ACTION_7 img_labels(r, c) = LabelsSolver::MemMerge(img_labels(r - 2, c - 2), img_labels(r - 2, c));
				//Action 8: Merge labels of block P and R
#define ACTION_8 img_labels(r, c) = LabelsSolver::MemMerge(img_labels(r - 2, c - 2), img_labels(r - 2, c + 2));
				// Action 9 Merge labels of block P and S
#define ACTION_9 img_labels(r, c) = LabelsSolver::MemMerge(img_labels(r - 2, c - 2), img_labels(r, c - 2));
				// Action 10 Merge labels of block Q and R
#define ACTION_10 img_labels(r, c) = LabelsSolver::MemMerge(img_labels(r - 2, c), img_labels(r - 2, c + 2));
				// Action 11: Merge labels of block Q and S
#define ACTION_11 img_labels(r, c) = LabelsSolver::MemMerge(img_labels(r - 2, c), img_labels(r, c - 2));
				// Action 12: Merge labels of block R and S
#define ACTION_12 img_labels(r, c) = LabelsSolver::MemMerge(img_labels(r - 2, c + 2), img_labels(r, c - 2));
				// Action 13: not used
#define ACTION_13 
				// Action 14: Merge labels of block P, Q and S
#define ACTION_14 img_labels(r, c) = LabelsSolver::MemMerge(LabelsSolver::MemMerge(img_labels(r - 2, c - 2), img_labels(r - 2, c)), img_labels(r, c - 2));
				//Action 15: Merge labels of block P, R and S
#define ACTION_15 img_labels(r, c) = LabelsSolver::MemMerge(LabelsSolver::MemMerge(img_labels(r - 2, c - 2), img_labels(r - 2, c + 2)), img_labels(r, c - 2));
				//Action 16: labels of block Q, R and S
#define ACTION_16 img_labels(r, c) = LabelsSolver::MemMerge(LabelsSolver::MemMerge(img_labels(r - 2, c), img_labels(r - 2, c + 2)), img_labels(r, c - 2));


		if (h == 1) {
			// Single line
			int r = 0;
			int c = -2;
#include "labeling_bolelli_2019_forest_sl.inc.h"
		}
		else {
			// More than one line

			// First couple of lines
			{
				int r = 0;
				int c = -2;
#include "labeling_bolelli_2019_forest_fl.inc.h"
			}

			// Every other line but the last one if image has an odd number of rows
			for (int r = 2; r < h - (h % 2); r += 2) {
				int c = -2;
				goto tree_0;
#include "labeling_bolelli_2019_forest.inc.h"
			}

			// Last line (in case that the rows are odd)
			if ((h % 2) == 1)
			{
				int r = h - 1;
				int c = -2;
#include "labeling_bolelli_2019_forest_ll.inc.h"
			}
		}

		n_labels_ = LabelsSolver::MemFlatten();

		// Second scan
		for (int r = 0; r < h; r += 2) {
			for (int c = 0; c < w; c += 2) {
				int iLabel = img_labels(r, c);
				if (iLabel > 0) {
					iLabel = LabelsSolver::MemGetLabel(iLabel);
					if (img(r, c) > 0)
						img_labels(r, c) = iLabel;
					else
						img_labels(r, c) = 0;
					if (c + 1 < w) {
						if (img(r, c + 1) > 0)
							img_labels(r, c + 1) = iLabel;
						else
							img_labels(r, c + 1) = 0;
						if (r + 1 < h) {
							if (img(r + 1, c) > 0)
								img_labels(r + 1, c) = iLabel;
							else
								img_labels(r + 1, c) = 0;
							if (img(r + 1, c + 1) > 0)
								img_labels(r + 1, c + 1) = iLabel;
							else
								img_labels(r + 1, c + 1) = 0;
						}
					}
					else if (r + 1 < h) {
						if (img(r + 1, c) > 0)
							img_labels(r + 1, c) = iLabel;
						else
							img_labels(r + 1, c) = 0;
					}
				}
				else {
					img_labels(r, c) = 0;
					if (c + 1 < w) {
						img_labels(r, c + 1) = 0;
						if (r + 1 < h) {
							img_labels(r + 1, c) = 0;
							img_labels(r + 1, c + 1) = 0;
						}
					}
					else if (r + 1 < h) {
						img_labels(r + 1, c) = 0;
					}
				}
			}
		}

		// Store total accesses in the output vector 'accesses'
		accesses = std::vector<uint64_t>((int)MD_SIZE, 0);

		accesses[MD_BINARY_MAT] = (uint64_t)img.GetTotalAccesses();
		accesses[MD_LABELED_MAT] = (uint64_t)img_labels.GetTotalAccesses();
		accesses[MD_EQUIVALENCE_VEC] = (uint64_t)LabelsSolver::MemTotalAccesses();

		img_labels_ = img_labels.GetImage();

		LabelsSolver::MemDealloc();

#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8
#undef ACTION_9
#undef ACTION_10
#undef ACTION_11
#undef ACTION_12
#undef ACTION_13
#undef ACTION_14
#undef ACTION_15
#undef ACTION_16


#undef CONDITION_B
#undef CONDITION_C
#undef CONDITION_D
#undef CONDITION_E

#undef CONDITION_G
#undef CONDITION_H
#undef CONDITION_I
#undef CONDITION_J
#undef CONDITION_K

#undef CONDITION_M
#undef CONDITION_N
#undef CONDITION_O
#undef CONDITION_P

#undef CONDITION_R
#undef CONDITION_S
#undef CONDITION_T
	}